

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O3

void av1_resize_and_extend_frame_ssse3
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase,
               int num_planes)

{
  ushort *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  ushort *puVar4;
  ushort *puVar5;
  ushort *puVar6;
  undefined8 *puVar7;
  undefined4 *puVar8;
  int16_t *piVar9;
  code *pcVar10;
  code *pcVar11;
  char cVar12;
  byte bVar13;
  byte bVar21;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  char cVar60;
  char cVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  long lVar97;
  uint uVar98;
  int iVar99;
  long lVar100;
  ulong uVar101;
  long lVar102;
  uint8_t *puVar103;
  uint uVar104;
  int iVar105;
  int iVar106;
  InterpFilterParams *pIVar107;
  long lVar108;
  long lVar109;
  ulong uVar110;
  uint8_t *puVar111;
  uint uVar112;
  ulong uVar113;
  undefined1 (*pauVar114) [16];
  int iVar115;
  int iVar116;
  int iVar117;
  ulong uVar118;
  uint uVar119;
  undefined1 (*pauVar120) [16];
  uint8_t *puVar121;
  long lVar122;
  long lVar123;
  uint8_t *puVar124;
  uint8_t *puVar125;
  undefined1 (*pauVar126) [16];
  ulong uVar127;
  undefined1 *puVar128;
  ulong *puVar129;
  undefined1 (*pauVar130) [16];
  long lVar131;
  int iVar132;
  undefined1 (*pauVar133) [16];
  bool bVar134;
  undefined2 uVar135;
  ushort uVar136;
  ushort uVar137;
  undefined8 uVar140;
  ushort uVar156;
  ushort uVar157;
  ushort uVar158;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar149 [16];
  ushort uVar159;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ushort uVar165;
  undefined1 auVar155 [16];
  undefined2 uVar166;
  ushort uVar167;
  ushort uVar178;
  ushort uVar179;
  ushort uVar180;
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  ushort uVar184;
  undefined2 uVar185;
  undefined1 auVar190 [12];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined2 uVar202;
  ushort uVar203;
  ushort uVar222;
  ushort uVar223;
  ushort uVar224;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar247 [16];
  undefined1 auVar255 [16];
  undefined1 auVar263 [16];
  undefined1 auVar271 [16];
  undefined1 auVar279 [16];
  undefined1 auVar287 [16];
  undefined1 auVar295 [16];
  undefined1 auVar303 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar315 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [12];
  undefined1 auVar328 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar344 [16];
  undefined1 auVar352 [16];
  undefined1 auVar360 [16];
  undefined1 auVar368 [16];
  undefined1 auVar376 [16];
  undefined1 auVar384 [16];
  undefined1 auVar392 [16];
  undefined1 auVar400 [16];
  undefined1 auVar408 [16];
  undefined1 auVar416 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined4 uVar422;
  undefined1 auVar426 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar433 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar445 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar525 [16];
  undefined1 auVar533 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined4 uVar545;
  undefined1 auVar549 [16];
  undefined1 auVar552 [16];
  undefined1 auVar556 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [12];
  undefined1 auVar657 [12];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar664 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined4 uVar686;
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined4 uVar703;
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  __m128i s [12];
  __m128i f1 [5];
  __m128i f2 [5];
  undefined1 (*local_350) [16];
  undefined1 local_338 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  uint local_2e0;
  undefined1 local_2d8 [16];
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  undefined8 local_288;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  undefined8 local_248;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  undefined8 local_238;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  char *local_110;
  char *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  char acStack_c8 [64];
  undefined1 local_88 [16];
  char acStack_78 [72];
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  undefined4 uVar138;
  undefined1 auVar150 [16];
  undefined6 uVar139;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar173 [16];
  undefined4 uVar168;
  undefined6 uVar169;
  undefined1 auVar170 [12];
  undefined1 auVar171 [14];
  undefined1 auVar176 [16];
  undefined1 auVar194 [16];
  undefined4 uVar186;
  undefined6 uVar187;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined8 uVar188;
  undefined1 auVar189 [12];
  undefined1 auVar191 [14];
  undefined1 auVar201 [16];
  undefined1 auVar200 [16];
  undefined4 uVar204;
  undefined1 auVar218 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined1 auVar321 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar327 [14];
  undefined1 auVar335 [16];
  undefined1 auVar441 [16];
  undefined1 auVar423 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar442 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar424 [16];
  undefined1 auVar443 [16];
  undefined1 auVar425 [16];
  undefined1 auVar444 [16];
  undefined1 auVar546 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar659 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar658 [14];
  undefined1 auVar671 [16];
  undefined1 auVar670 [16];
  undefined1 auVar687 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar704 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  
  iVar116 = (src->field_2).field_0.y_crop_width;
  iVar117 = (src->field_3).field_0.y_crop_height;
  iVar106 = (dst->field_2).field_0.y_crop_width;
  iVar132 = (dst->field_3).field_0.y_crop_height;
  bVar134 = true;
  if (iVar132 * 2 != iVar117 || iVar106 * 2 != iVar116) {
    if ((iVar132 * 4 != iVar117 || iVar106 * 4 != iVar116) &&
       ((iVar106 * 4 + iVar116 * -3 != 0 || (iVar132 * 4 + iVar117 * -3 != 0)))) {
      bVar134 = iVar117 * 2 == iVar132 && iVar116 * 2 == iVar106;
    }
  }
  if (num_planes < 2) {
    if (!bVar134) goto LAB_003eabcd;
    if (num_planes != 1) goto LAB_003eabf6;
  }
  else {
    if (!bVar134) {
LAB_003eabcd:
      av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
      return;
    }
    iVar116 = (src->field_2).field_0.uv_crop_width;
    iVar117 = (src->field_3).field_0.uv_crop_height;
    iVar106 = (dst->field_2).field_0.uv_crop_width;
    iVar132 = (dst->field_3).field_0.uv_crop_height;
    if (iVar132 * 2 != iVar117 || iVar106 * 2 != iVar116) {
      if ((iVar132 * 4 != iVar117 || iVar106 * 4 != iVar116) &&
         (((iVar106 * 4 + iVar116 * -3 != 0 || (iVar132 * 4 + iVar117 * -3 != 0)) &&
          (iVar117 * 2 != iVar132 || iVar116 * 2 != iVar106)))) goto LAB_003eabcd;
    }
  }
  uVar127 = 3;
  if ((uint)num_planes < 3) {
    uVar127 = (ulong)(uint)num_planes;
  }
  pIVar107 = av1_interp_filter_params_list + filter;
  uVar104 = phase + 0x15;
  uVar98 = phase + 0x2a;
  uVar112 = uVar104 >> 4 & 1;
  uVar119 = uVar98 >> 4 & 1;
  local_100 = (ulong)(uVar112 * 8);
  local_108 = acStack_c8 + (uVar112 << 4);
  local_110 = acStack_78 + (uVar119 << 4);
  lVar108 = (long)((int)uVar104 >> 5) * 0x10;
  lVar100 = (long)((int)uVar98 >> 5) * 0x10;
  lVar109 = (long)phase;
  local_e8 = (ulong)((phase & 0xfU) << 4);
  local_f0 = (ulong)((uVar104 & 0xf) << 4);
  local_f8 = (ulong)((uVar98 & 0xf) << 4);
  uVar118 = 0;
  auVar155 = _DAT_0050d570;
  local_e0 = uVar127;
  do {
    bVar134 = uVar118 != 0;
    lVar102 = (ulong)bVar134 * 4;
    iVar116 = *(int *)((long)src->store_buf_adr + lVar102 + -0x38);
    iVar117 = *(int *)((long)src->store_buf_adr + lVar102 + -0x30);
    iVar106 = *(int *)((long)dst->store_buf_adr + lVar102 + -0x38);
    iVar132 = *(int *)((long)dst->store_buf_adr + lVar102 + -0x30);
    uVar101 = (long)(dst->field_2).field_0.y_crop_width + 1U & 0xfffffffffffffffe;
    uVar113 = (long)(dst->field_3).field_0.y_crop_height + 1;
    uVar110 = uVar113 & 0xfffffffffffffffe;
    if ((iVar106 * 2 == iVar116) && (iVar132 * 2 == iVar117)) {
      if (phase == 0) {
        puVar111 = src->store_buf_adr[uVar118 - 4];
        iVar116 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
        puVar125 = dst->store_buf_adr[uVar118 - 4];
        iVar117 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
        uVar98 = iVar106 + 0xfU & 0xfffffff0;
        do {
          lVar122 = 0;
          lVar102 = (long)(int)uVar98 * 2 + (long)iVar116 * -2;
          do {
            puVar1 = (ushort *)(puVar111 + lVar122 * 2);
            uVar62 = puVar1[1];
            uVar63 = puVar1[2];
            uVar64 = puVar1[3];
            uVar65 = puVar1[4];
            uVar66 = puVar1[5];
            uVar67 = puVar1[6];
            uVar68 = puVar1[7];
            puVar4 = (ushort *)(puVar111 + lVar122 * 2 + 0x10);
            uVar137 = *puVar4;
            uVar158 = puVar4[1];
            uVar161 = puVar4[2];
            uVar164 = puVar4[3];
            uVar203 = puVar4[4];
            uVar222 = puVar4[5];
            uVar223 = puVar4[6];
            uVar224 = puVar4[7];
            uVar136 = *puVar1 & 0xff;
            uVar156 = uVar62 & 0xff;
            uVar157 = uVar63 & 0xff;
            uVar159 = uVar64 & 0xff;
            uVar160 = uVar65 & 0xff;
            uVar162 = uVar66 & 0xff;
            uVar163 = uVar67 & 0xff;
            uVar165 = uVar68 & 0xff;
            uVar167 = uVar137 & 0xff;
            uVar178 = uVar158 & 0xff;
            uVar179 = uVar161 & 0xff;
            uVar180 = uVar164 & 0xff;
            uVar181 = uVar203 & 0xff;
            uVar182 = uVar222 & 0xff;
            uVar183 = uVar223 & 0xff;
            uVar184 = uVar224 & 0xff;
            puVar121 = puVar125 + lVar122;
            *puVar121 = (uVar136 != 0) * (uVar136 < 0x100) * (char)*puVar1 - (0xff < uVar136);
            puVar121[1] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar62 - (0xff < uVar156);
            puVar121[2] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar63 - (0xff < uVar157);
            puVar121[3] = (uVar159 != 0) * (uVar159 < 0x100) * (char)uVar64 - (0xff < uVar159);
            puVar121[4] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar65 - (0xff < uVar160);
            puVar121[5] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar66 - (0xff < uVar162);
            puVar121[6] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar67 - (0xff < uVar163);
            puVar121[7] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar68 - (0xff < uVar165);
            puVar121[8] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar137 - (0xff < uVar167);
            puVar121[9] = (uVar178 != 0) * (uVar178 < 0x100) * (char)uVar158 - (0xff < uVar178);
            puVar121[10] = (uVar179 != 0) * (uVar179 < 0x100) * (char)uVar161 - (0xff < uVar179);
            puVar121[0xb] = (uVar180 != 0) * (uVar180 < 0x100) * (char)uVar164 - (0xff < uVar180);
            puVar121[0xc] = (uVar181 != 0) * (uVar181 < 0x100) * (char)uVar203 - (0xff < uVar181);
            puVar121[0xd] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar222 - (0xff < uVar182);
            puVar121[0xe] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar223 - (0xff < uVar183);
            puVar121[0xf] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar224 - (0xff < uVar184);
            lVar122 = lVar122 + 0x10;
            lVar102 = lVar102 + -0x20;
          } while (uVar98 != (uint)lVar122);
          puVar111 = puVar111 + -lVar102;
          puVar125 = puVar125 + lVar122 + ((long)iVar117 - (long)(int)uVar98);
          iVar132 = iVar132 + -1;
        } while (iVar132 != 0);
      }
      else {
        if (filter != BILINEAR) {
          local_350 = (undefined1 (*) [16])
                      malloc((uVar110 * 2 + 0xd & 0x3ffffffffffffff8) *
                             (uVar101 + 3 & 0xfffffffffffffffc));
          if (local_350 == (undefined1 (*) [16])0x0) goto LAB_003eac04;
          iVar116 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          lVar123 = (long)iVar116;
          puVar111 = dst->store_buf_adr[uVar118 - 4];
          iVar105 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          lVar102 = (long)iVar105;
          auVar155 = *(undefined1 (*) [16])(pIVar107->filter_ptr + lVar109 * 8);
          uVar104 = iVar106 + 3U & 0xfffffffc;
          uVar98 = iVar117 + 0xdU & 0xfffffff8;
          auVar144 = pshufb(auVar155,_DAT_0050d5a0);
          auVar192 = pshufb(auVar155,_DAT_0050d5f0);
          auVar193 = pshufb(auVar155,_DAT_0050d5c0);
          auVar155 = pshufb(auVar155,_DAT_0050d600);
          puVar125 = src->store_buf_adr[uVar118 - 4] + (iVar116 * -3 + -5);
          local_338._0_8_ = SEXT48((int)(iVar116 * 8 + uVar104 * -2));
          local_2f8._0_8_ = lVar123 * 3;
          local_308._0_8_ = lVar123 * 4;
          lVar122 = (long)(int)(uVar104 * 2);
          pauVar130 = local_350;
          do {
            uVar127 = *(ulong *)(puVar125 + 2);
            uVar140 = *(undefined8 *)(puVar125 + lVar123 + 2);
            auVar235._8_4_ = 0;
            auVar235._0_8_ = uVar127;
            auVar235._12_2_ = (short)(uVar127 >> 0x30);
            auVar235._14_2_ = (short)((ulong)uVar140 >> 0x30);
            auVar234._12_4_ = auVar235._12_4_;
            auVar234._8_2_ = 0;
            auVar234._0_8_ = uVar127;
            auVar234._10_2_ = (short)((ulong)uVar140 >> 0x20);
            auVar233._10_6_ = auVar234._10_6_;
            auVar233._8_2_ = (short)(uVar127 >> 0x20);
            auVar233._0_8_ = uVar127;
            auVar81._4_8_ = auVar233._8_8_;
            auVar81._2_2_ = (short)((ulong)uVar140 >> 0x10);
            auVar81._0_2_ = (short)(uVar127 >> 0x10);
            auVar232._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
            auVar232._4_12_ = auVar81;
            uVar127 = *(ulong *)(puVar125 + lVar123 * 2 + 2);
            uVar140 = *(undefined8 *)(puVar125 + local_2f8._0_8_ + 2);
            auVar432._8_4_ = 0;
            auVar432._0_8_ = uVar127;
            auVar432._12_2_ = (short)(uVar127 >> 0x30);
            auVar432._14_2_ = (short)((ulong)uVar140 >> 0x30);
            auVar431._12_4_ = auVar432._12_4_;
            auVar431._8_2_ = 0;
            auVar431._0_8_ = uVar127;
            auVar431._10_2_ = (short)((ulong)uVar140 >> 0x20);
            auVar430._10_6_ = auVar431._10_6_;
            auVar430._8_2_ = (short)(uVar127 >> 0x20);
            auVar430._0_8_ = uVar127;
            auVar82._4_8_ = auVar430._8_8_;
            auVar82._2_2_ = (short)((ulong)uVar140 >> 0x10);
            auVar82._0_2_ = (short)(uVar127 >> 0x10);
            auVar707._6_2_ = (short)uVar140;
            auVar707._4_2_ = (short)uVar127;
            lVar131 = lVar123 * 4 + 2;
            uVar127 = *(ulong *)(puVar125 + lVar123 * 4 + 2);
            uVar140 = *(undefined8 *)(puVar125 + lVar123 + lVar131);
            auVar555._8_4_ = 0;
            auVar555._0_8_ = uVar127;
            auVar555._12_2_ = (short)(uVar127 >> 0x30);
            auVar555._14_2_ = (short)((ulong)uVar140 >> 0x30);
            auVar554._12_4_ = auVar555._12_4_;
            auVar554._8_2_ = 0;
            auVar554._0_8_ = uVar127;
            auVar554._10_2_ = (short)((ulong)uVar140 >> 0x20);
            auVar553._10_6_ = auVar554._10_6_;
            auVar553._8_2_ = (short)(uVar127 >> 0x20);
            auVar553._0_8_ = uVar127;
            auVar83._4_8_ = auVar553._8_8_;
            auVar83._2_2_ = (short)((ulong)uVar140 >> 0x10);
            auVar83._0_2_ = (short)(uVar127 >> 0x10);
            auVar552._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
            auVar552._4_12_ = auVar83;
            uVar127 = *(ulong *)(puVar125 + lVar123 * 2 + lVar131);
            uVar140 = *(undefined8 *)(puVar125 + local_2f8._0_8_ + lVar131);
            auVar663._8_4_ = 0;
            auVar663._0_8_ = uVar127;
            auVar663._12_2_ = (short)(uVar127 >> 0x30);
            auVar663._14_2_ = (short)((ulong)uVar140 >> 0x30);
            auVar662._12_4_ = auVar663._12_4_;
            auVar662._8_2_ = 0;
            auVar662._0_8_ = uVar127;
            auVar662._10_2_ = (short)((ulong)uVar140 >> 0x20);
            auVar661._10_6_ = auVar662._10_6_;
            auVar661._8_2_ = (short)(uVar127 >> 0x20);
            auVar661._0_8_ = uVar127;
            auVar84._4_8_ = auVar661._8_8_;
            auVar84._2_2_ = (short)((ulong)uVar140 >> 0x10);
            auVar84._0_2_ = (short)(uVar127 >> 0x10);
            auVar707._14_2_ = (short)uVar140;
            auVar707._12_2_ = (short)uVar127;
            auVar332._0_8_ = auVar232._0_8_;
            auVar332._8_4_ = auVar81._0_4_;
            auVar332._12_4_ = auVar82._0_4_;
            auVar707._0_4_ = auVar232._0_4_;
            auVar691._0_8_ = auVar552._0_8_;
            auVar691._8_4_ = auVar83._0_4_;
            auVar691._12_4_ = auVar84._0_4_;
            auVar707._8_4_ = auVar552._0_4_;
            auVar236._4_4_ = auVar430._8_4_;
            auVar236._0_4_ = auVar233._8_4_;
            auVar236._12_4_ = auVar661._8_4_;
            auVar236._8_4_ = auVar553._8_4_;
            auVar333._8_8_ = auVar691._8_8_;
            auVar333._0_8_ = auVar332._8_8_;
            lVar131 = 0;
            iVar116 = -uVar104;
            do {
              uVar127 = *(ulong *)(puVar125 + lVar131 + 8);
              uVar140 = *(undefined8 *)(puVar125 + lVar123 + lVar131 + 8);
              lVar97 = lVar123 + lVar131 + 8;
              auVar436._8_4_ = 0;
              auVar436._0_8_ = uVar127;
              auVar436._12_2_ = (short)(uVar127 >> 0x30);
              auVar436._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar435._12_4_ = auVar436._12_4_;
              auVar435._8_2_ = 0;
              auVar435._0_8_ = uVar127;
              auVar435._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar434._10_6_ = auVar435._10_6_;
              auVar434._8_2_ = (short)(uVar127 >> 0x20);
              auVar434._0_8_ = uVar127;
              auVar85._4_8_ = auVar434._8_8_;
              auVar85._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar85._0_2_ = (short)(uVar127 >> 0x10);
              auVar433._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
              auVar433._4_12_ = auVar85;
              uVar127 = *(ulong *)(puVar125 + lVar123 + lVar97);
              lVar97 = lVar123 + lVar97;
              uVar140 = *(undefined8 *)(puVar125 + lVar123 + lVar97);
              lVar97 = lVar123 + lVar97;
              auVar558._8_4_ = 0;
              auVar558._0_8_ = uVar127;
              auVar558._12_2_ = (short)(uVar127 >> 0x30);
              auVar558._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar557._12_4_ = auVar558._12_4_;
              auVar557._8_2_ = 0;
              auVar557._0_8_ = uVar127;
              auVar557._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar556._10_6_ = auVar557._10_6_;
              auVar556._8_2_ = (short)(uVar127 >> 0x20);
              auVar556._0_8_ = uVar127;
              auVar86._4_8_ = auVar556._8_8_;
              auVar86._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar86._0_2_ = (short)(uVar127 >> 0x10);
              auVar695._6_2_ = (short)uVar140;
              auVar695._4_2_ = (short)uVar127;
              uVar127 = *(ulong *)(puVar125 + lVar123 + lVar97);
              lVar97 = lVar123 + lVar97;
              uVar140 = *(undefined8 *)(puVar125 + lVar123 + lVar97);
              lVar97 = lVar123 + lVar97;
              auVar667._8_4_ = 0;
              auVar667._0_8_ = uVar127;
              auVar667._12_2_ = (short)(uVar127 >> 0x30);
              auVar667._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar666._12_4_ = auVar667._12_4_;
              auVar666._8_2_ = 0;
              auVar666._0_8_ = uVar127;
              auVar666._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar665._10_6_ = auVar666._10_6_;
              auVar665._8_2_ = (short)(uVar127 >> 0x20);
              auVar665._0_8_ = uVar127;
              auVar87._4_8_ = auVar665._8_8_;
              auVar87._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar87._0_2_ = (short)(uVar127 >> 0x10);
              auVar664._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
              auVar664._4_12_ = auVar87;
              uVar127 = *(ulong *)(puVar125 + lVar123 + lVar97);
              uVar140 = *(undefined8 *)(puVar125 + lVar123 * 2 + lVar97);
              auVar694._8_4_ = 0;
              auVar694._0_8_ = uVar127;
              auVar694._12_2_ = (short)(uVar127 >> 0x30);
              auVar694._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar693._12_4_ = auVar694._12_4_;
              auVar693._8_2_ = 0;
              auVar693._0_8_ = uVar127;
              auVar693._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar692._10_6_ = auVar693._10_6_;
              auVar692._8_2_ = (short)(uVar127 >> 0x20);
              auVar692._0_8_ = uVar127;
              auVar88._4_8_ = auVar692._8_8_;
              auVar88._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar88._0_2_ = (short)(uVar127 >> 0x10);
              auVar695._14_2_ = (short)uVar140;
              auVar695._12_2_ = (short)uVar127;
              auVar719._0_8_ = auVar433._0_8_;
              auVar719._8_4_ = auVar85._0_4_;
              auVar719._12_4_ = auVar86._0_4_;
              auVar695._0_4_ = auVar433._0_4_;
              auVar727._0_8_ = auVar664._0_8_;
              auVar727._8_4_ = auVar87._0_4_;
              auVar727._12_4_ = auVar88._0_4_;
              auVar695._8_4_ = auVar664._0_4_;
              auVar437._0_8_ = CONCAT44(auVar556._8_4_,auVar434._8_4_);
              auVar437._8_4_ = auVar435._12_4_;
              auVar437._12_4_ = auVar557._12_4_;
              auVar668._0_8_ = CONCAT44(auVar692._8_4_,auVar665._8_4_);
              auVar668._8_4_ = auVar666._12_4_;
              auVar668._12_4_ = auVar693._12_4_;
              auVar720._8_8_ = auVar727._8_8_;
              auVar720._0_8_ = auVar719._8_8_;
              auVar559._8_8_ = auVar668._0_8_;
              auVar559._0_8_ = auVar437._0_8_;
              auVar438._8_8_ = auVar668._8_8_;
              auVar438._0_8_ = auVar437._8_8_;
              auVar708 = pmaddubsw(auVar707,auVar144);
              auVar728 = pmaddubsw(auVar333,auVar192);
              auVar205 = pmaddubsw(auVar236,auVar193);
              auVar709 = pmaddubsw(auVar695,auVar155);
              auVar710._0_2_ = auVar709._0_2_ + auVar728._0_2_;
              auVar710._2_2_ = auVar709._2_2_ + auVar728._2_2_;
              auVar710._4_2_ = auVar709._4_2_ + auVar728._4_2_;
              auVar710._6_2_ = auVar709._6_2_ + auVar728._6_2_;
              auVar710._8_2_ = auVar709._8_2_ + auVar728._8_2_;
              auVar710._10_2_ = auVar709._10_2_ + auVar728._10_2_;
              auVar710._12_2_ = auVar709._12_2_ + auVar728._12_2_;
              auVar710._14_2_ = auVar709._14_2_ + auVar728._14_2_;
              auVar669._0_2_ = auVar205._0_2_ + auVar708._0_2_ + 0x40;
              auVar669._2_2_ = auVar205._2_2_ + auVar708._2_2_ + 0x40;
              auVar669._4_2_ = auVar205._4_2_ + auVar708._4_2_ + 0x40;
              auVar669._6_2_ = auVar205._6_2_ + auVar708._6_2_ + 0x40;
              auVar669._8_2_ = auVar205._8_2_ + auVar708._8_2_ + 0x40;
              auVar669._10_2_ = auVar205._10_2_ + auVar708._10_2_ + 0x40;
              auVar669._12_2_ = auVar205._12_2_ + auVar708._12_2_ + 0x40;
              auVar669._14_2_ = auVar205._14_2_ + auVar708._14_2_ + 0x40;
              auVar708 = paddsw(auVar669,auVar710);
              auVar205 = pmaddubsw(auVar333,auVar144);
              auVar728 = pmaddubsw(auVar236,auVar192);
              auVar709 = pmaddubsw(auVar720,auVar155);
              auVar721._0_2_ = auVar709._0_2_ + auVar728._0_2_;
              auVar721._2_2_ = auVar709._2_2_ + auVar728._2_2_;
              auVar721._4_2_ = auVar709._4_2_ + auVar728._4_2_;
              auVar721._6_2_ = auVar709._6_2_ + auVar728._6_2_;
              auVar721._8_2_ = auVar709._8_2_ + auVar728._8_2_;
              auVar721._10_2_ = auVar709._10_2_ + auVar728._10_2_;
              auVar721._12_2_ = auVar709._12_2_ + auVar728._12_2_;
              auVar721._14_2_ = auVar709._14_2_ + auVar728._14_2_;
              auVar709 = pmaddubsw(auVar695,auVar193);
              auVar334._0_2_ = auVar205._0_2_ + 0x40 + auVar709._0_2_;
              auVar334._2_2_ = auVar205._2_2_ + 0x40 + auVar709._2_2_;
              auVar334._4_2_ = auVar205._4_2_ + 0x40 + auVar709._4_2_;
              auVar334._6_2_ = auVar205._6_2_ + 0x40 + auVar709._6_2_;
              auVar334._8_2_ = auVar205._8_2_ + 0x40 + auVar709._8_2_;
              auVar334._10_2_ = auVar205._10_2_ + 0x40 + auVar709._10_2_;
              auVar334._12_2_ = auVar205._12_2_ + 0x40 + auVar709._12_2_;
              auVar334._14_2_ = auVar205._14_2_ + 0x40 + auVar709._14_2_;
              auVar205 = paddsw(auVar334,auVar721);
              auVar709 = pmaddubsw(auVar695,auVar192);
              auVar728 = pmaddubsw(auVar559,auVar155);
              auVar729._0_2_ = auVar728._0_2_ + auVar709._0_2_;
              auVar729._2_2_ = auVar728._2_2_ + auVar709._2_2_;
              auVar729._4_2_ = auVar728._4_2_ + auVar709._4_2_;
              auVar729._6_2_ = auVar728._6_2_ + auVar709._6_2_;
              auVar729._8_2_ = auVar728._8_2_ + auVar709._8_2_;
              auVar729._10_2_ = auVar728._10_2_ + auVar709._10_2_;
              auVar729._12_2_ = auVar728._12_2_ + auVar709._12_2_;
              auVar729._14_2_ = auVar728._14_2_ + auVar709._14_2_;
              auVar709 = psraw(auVar708,7);
              auVar708 = psraw(auVar205,7);
              auVar205 = pmaddubsw(auVar236,auVar144);
              auVar728 = pmaddubsw(auVar720,auVar193);
              auVar237._0_2_ = auVar205._0_2_ + 0x40 + auVar728._0_2_;
              auVar237._2_2_ = auVar205._2_2_ + 0x40 + auVar728._2_2_;
              auVar237._4_2_ = auVar205._4_2_ + 0x40 + auVar728._4_2_;
              auVar237._6_2_ = auVar205._6_2_ + 0x40 + auVar728._6_2_;
              auVar237._8_2_ = auVar205._8_2_ + 0x40 + auVar728._8_2_;
              auVar237._10_2_ = auVar205._10_2_ + 0x40 + auVar728._10_2_;
              auVar237._12_2_ = auVar205._12_2_ + 0x40 + auVar728._12_2_;
              auVar237._14_2_ = auVar205._14_2_ + 0x40 + auVar728._14_2_;
              auVar205 = paddsw(auVar237,auVar729);
              auVar205 = psraw(auVar205,7);
              sVar29 = auVar709._0_2_;
              sVar42 = auVar709._2_2_;
              uVar166 = CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar709[2] - (0xff < sVar42),
                                 (0 < sVar29) * (sVar29 < 0x100) * auVar709[0] - (0xff < sVar29));
              sVar29 = auVar709._4_2_;
              sVar42 = auVar709._6_2_;
              uVar168 = CONCAT13((0 < sVar42) * (sVar42 < 0x100) * auVar709[6] - (0xff < sVar42),
                                 CONCAT12((0 < sVar29) * (sVar29 < 0x100) * auVar709[4] -
                                          (0xff < sVar29),uVar166));
              sVar29 = auVar709._8_2_;
              sVar42 = auVar709._10_2_;
              uVar169 = CONCAT15((0 < sVar42) * (sVar42 < 0x100) * auVar709[10] - (0xff < sVar42),
                                 CONCAT14((0 < sVar29) * (sVar29 < 0x100) * auVar709[8] -
                                          (0xff < sVar29),uVar168));
              sVar29 = auVar709._12_2_;
              sVar42 = auVar709._14_2_;
              uVar141 = CONCAT17((0 < sVar42) * (sVar42 < 0x100) * auVar709[0xe] - (0xff < sVar42),
                                 CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar709[0xc] -
                                          (0xff < sVar29),uVar169));
              sVar29 = auVar205._0_2_;
              sVar42 = auVar205._2_2_;
              auVar656._0_10_ =
                   CONCAT19((0 < sVar42) * (sVar42 < 0x100) * auVar205[2] - (0xff < sVar42),
                            CONCAT18((0 < sVar29) * (sVar29 < 0x100) * auVar205[0] - (0xff < sVar29)
                                     ,uVar141));
              sVar29 = auVar205._4_2_;
              auVar656[10] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[4] - (0xff < sVar29);
              sVar29 = auVar205._6_2_;
              auVar656[0xb] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[6] - (0xff < sVar29);
              sVar29 = auVar205._8_2_;
              auVar658[0xc] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[8] - (0xff < sVar29);
              auVar658._0_12_ = auVar656;
              sVar29 = auVar205._10_2_;
              auVar658[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[10] - (0xff < sVar29);
              sVar29 = auVar205._12_2_;
              auVar670[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[0xc] - (0xff < sVar29);
              auVar670._0_14_ = auVar658;
              sVar29 = auVar205._14_2_;
              auVar670[0xf] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[0xe] - (0xff < sVar29);
              auVar709 = pmaddubsw(auVar695,auVar144);
              auVar731 = pmaddubsw(auVar720,auVar192);
              auVar728 = pmaddubsw(auVar559,auVar193);
              auVar205 = pmaddubsw(auVar438,auVar155);
              auVar439._0_2_ = auVar205._0_2_ + auVar731._0_2_;
              auVar439._2_2_ = auVar205._2_2_ + auVar731._2_2_;
              auVar439._4_2_ = auVar205._4_2_ + auVar731._4_2_;
              auVar439._6_2_ = auVar205._6_2_ + auVar731._6_2_;
              auVar439._8_2_ = auVar205._8_2_ + auVar731._8_2_;
              auVar439._10_2_ = auVar205._10_2_ + auVar731._10_2_;
              auVar439._12_2_ = auVar205._12_2_ + auVar731._12_2_;
              auVar439._14_2_ = auVar205._14_2_ + auVar731._14_2_;
              auVar722._0_2_ = auVar728._0_2_ + auVar709._0_2_ + 0x40;
              auVar722._2_2_ = auVar728._2_2_ + auVar709._2_2_ + 0x40;
              auVar722._4_2_ = auVar728._4_2_ + auVar709._4_2_ + 0x40;
              auVar722._6_2_ = auVar728._6_2_ + auVar709._6_2_ + 0x40;
              auVar722._8_2_ = auVar728._8_2_ + auVar709._8_2_ + 0x40;
              auVar722._10_2_ = auVar728._10_2_ + auVar709._10_2_ + 0x40;
              auVar722._12_2_ = auVar728._12_2_ + auVar709._12_2_ + 0x40;
              auVar722._14_2_ = auVar728._14_2_ + auVar709._14_2_ + 0x40;
              auVar205 = paddsw(auVar722,auVar439);
              auVar205 = psraw(auVar205,7);
              sVar29 = auVar708._0_2_;
              sVar42 = auVar708._2_2_;
              uVar135 = CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar708[2] - (0xff < sVar42),
                                 (0 < sVar29) * (sVar29 < 0x100) * auVar708[0] - (0xff < sVar29));
              sVar29 = auVar708._4_2_;
              sVar42 = auVar708._6_2_;
              uVar138 = CONCAT13((0 < sVar42) * (sVar42 < 0x100) * auVar708[6] - (0xff < sVar42),
                                 CONCAT12((0 < sVar29) * (sVar29 < 0x100) * auVar708[4] -
                                          (0xff < sVar29),uVar135));
              sVar29 = auVar708._8_2_;
              sVar42 = auVar708._10_2_;
              uVar139 = CONCAT15((0 < sVar42) * (sVar42 < 0x100) * auVar708[10] - (0xff < sVar42),
                                 CONCAT14((0 < sVar29) * (sVar29 < 0x100) * auVar708[8] -
                                          (0xff < sVar29),uVar138));
              sVar29 = auVar708._12_2_;
              sVar42 = auVar708._14_2_;
              uVar140 = CONCAT17((0 < sVar42) * (sVar42 < 0x100) * auVar708[0xe] - (0xff < sVar42),
                                 CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar708[0xc] -
                                          (0xff < sVar29),uVar139));
              sVar29 = auVar205._0_2_;
              sVar42 = auVar205._2_2_;
              auVar326._0_10_ =
                   CONCAT19((0 < sVar42) * (sVar42 < 0x100) * auVar205[2] - (0xff < sVar42),
                            CONCAT18((0 < sVar29) * (sVar29 < 0x100) * auVar205[0] - (0xff < sVar29)
                                     ,uVar140));
              sVar29 = auVar205._4_2_;
              auVar326[10] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[4] - (0xff < sVar29);
              sVar29 = auVar205._6_2_;
              auVar326[0xb] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[6] - (0xff < sVar29);
              sVar29 = auVar205._8_2_;
              auVar327[0xc] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[8] - (0xff < sVar29);
              auVar327._0_12_ = auVar326;
              sVar29 = auVar205._10_2_;
              auVar327[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[10] - (0xff < sVar29);
              sVar29 = auVar205._12_2_;
              auVar335[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[0xc] - (0xff < sVar29);
              auVar335._0_14_ = auVar327;
              sVar29 = auVar205._14_2_;
              auVar335[0xf] = (0 < sVar29) * (sVar29 < 0x100) * auVar205[0xe] - (0xff < sVar29);
              auVar444._12_2_ = (short)((ulong)uVar141 >> 0x30);
              auVar444._0_12_ = auVar656;
              auVar444._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar443._12_4_ = auVar444._12_4_;
              auVar443._10_2_ = (short)((uint6)uVar139 >> 0x20);
              auVar443._0_10_ = auVar656._0_10_;
              auVar442._10_6_ = auVar443._10_6_;
              auVar442._8_2_ = (short)((uint6)uVar169 >> 0x20);
              auVar442._0_8_ = uVar141;
              auVar441._8_8_ = auVar442._8_8_;
              auVar441._6_2_ = (short)((uint)uVar138 >> 0x10);
              auVar441._0_6_ = uVar169;
              auVar440._6_10_ = auVar441._6_10_;
              auVar440._4_2_ = (short)((uint)uVar168 >> 0x10);
              auVar440._0_4_ = uVar168;
              uVar138 = CONCAT22((short)((unkuint10)auVar326._0_10_ >> 0x40),
                                 (short)((unkuint10)auVar656._0_10_ >> 0x40));
              auVar657._0_8_ = CONCAT26(auVar326._10_2_,CONCAT24(auVar656._10_2_,uVar138));
              auVar657._8_2_ = auVar658._12_2_;
              auVar657._10_2_ = auVar327._12_2_;
              auVar671._12_2_ = auVar670._14_2_;
              auVar671._0_12_ = auVar657;
              auVar671._14_2_ = auVar335._14_2_;
              *(ulong *)(*pauVar130 + lVar131) = CONCAT44(uVar138,CONCAT22(uVar135,uVar166));
              *(ulong *)(*pauVar130 + lVar131 + lVar122) =
                   CONCAT44((int)((ulong)auVar657._0_8_ >> 0x20),auVar440._4_4_);
              *(ulong *)(*pauVar130 + lVar131 + lVar122 * 2) =
                   CONCAT44(auVar657._8_4_,auVar442._8_4_);
              *(ulong *)(*pauVar130 + lVar131 + lVar122 * 3) =
                   CONCAT44(auVar671._12_4_,auVar443._12_4_);
              lVar131 = lVar131 + 8;
              iVar116 = iVar116 + 4;
              auVar236 = auVar438;
              auVar333 = auVar559;
              auVar707 = auVar720;
            } while (iVar116 != 0);
            puVar125 = puVar125 + lVar131 + local_338._0_8_;
            pauVar130 = (undefined1 (*) [16])(*pauVar130 + lVar131 + (int)(uVar104 * 6));
            uVar98 = uVar98 - 8;
          } while (uVar98 != 0);
          uVar112 = iVar106 + 7U & 0xfffffff8;
          uVar98 = iVar132 + 3U & 0xfffffffc;
          pauVar130 = local_350;
          do {
            pauVar114 = (undefined1 (*) [16])(*pauVar130 + (int)(uVar104 * 6));
            auVar205 = *(undefined1 (*) [16])(*pauVar130 + lVar122);
            auVar708 = *(undefined1 (*) [16])(*pauVar130 + (long)(int)uVar104 * 4);
            auVar709 = *pauVar130;
            iVar116 = -uVar98;
            do {
              auVar728 = *pauVar114;
              auVar731 = *(undefined1 (*) [16])(*pauVar114 + lVar122);
              auVar718 = *(undefined1 (*) [16])(*pauVar114 + lVar122 * 2);
              auVar711 = pmaddubsw(auVar709,auVar144);
              auVar723 = pmaddubsw(auVar205,auVar192);
              auVar709 = pmaddubsw(auVar708,auVar193);
              auVar712 = pmaddubsw(auVar728,auVar155);
              auVar713._0_2_ = auVar712._0_2_ + auVar723._0_2_;
              auVar713._2_2_ = auVar712._2_2_ + auVar723._2_2_;
              auVar713._4_2_ = auVar712._4_2_ + auVar723._4_2_;
              auVar713._6_2_ = auVar712._6_2_ + auVar723._6_2_;
              auVar713._8_2_ = auVar712._8_2_ + auVar723._8_2_;
              auVar713._10_2_ = auVar712._10_2_ + auVar723._10_2_;
              auVar713._12_2_ = auVar712._12_2_ + auVar723._12_2_;
              auVar713._14_2_ = auVar712._14_2_ + auVar723._14_2_;
              auVar672._0_2_ = auVar709._0_2_ + auVar711._0_2_ + 0x40;
              auVar672._2_2_ = auVar709._2_2_ + auVar711._2_2_ + 0x40;
              auVar672._4_2_ = auVar709._4_2_ + auVar711._4_2_ + 0x40;
              auVar672._6_2_ = auVar709._6_2_ + auVar711._6_2_ + 0x40;
              auVar672._8_2_ = auVar709._8_2_ + auVar711._8_2_ + 0x40;
              auVar672._10_2_ = auVar709._10_2_ + auVar711._10_2_ + 0x40;
              auVar672._12_2_ = auVar709._12_2_ + auVar711._12_2_ + 0x40;
              auVar672._14_2_ = auVar709._14_2_ + auVar711._14_2_ + 0x40;
              auVar711 = paddsw(auVar672,auVar713);
              auVar205 = pmaddubsw(auVar205,auVar144);
              auVar712 = pmaddubsw(auVar708,auVar192);
              auVar709 = pmaddubsw(auVar731,auVar155);
              auVar696._0_2_ = auVar709._0_2_ + auVar712._0_2_;
              auVar696._2_2_ = auVar709._2_2_ + auVar712._2_2_;
              auVar696._4_2_ = auVar709._4_2_ + auVar712._4_2_;
              auVar696._6_2_ = auVar709._6_2_ + auVar712._6_2_;
              auVar696._8_2_ = auVar709._8_2_ + auVar712._8_2_;
              auVar696._10_2_ = auVar709._10_2_ + auVar712._10_2_;
              auVar696._12_2_ = auVar709._12_2_ + auVar712._12_2_;
              auVar696._14_2_ = auVar709._14_2_ + auVar712._14_2_;
              auVar709 = pmaddubsw(auVar728,auVar193);
              auVar238._0_2_ = auVar205._0_2_ + 0x40 + auVar709._0_2_;
              auVar238._2_2_ = auVar205._2_2_ + 0x40 + auVar709._2_2_;
              auVar238._4_2_ = auVar205._4_2_ + 0x40 + auVar709._4_2_;
              auVar238._6_2_ = auVar205._6_2_ + 0x40 + auVar709._6_2_;
              auVar238._8_2_ = auVar205._8_2_ + 0x40 + auVar709._8_2_;
              auVar238._10_2_ = auVar205._10_2_ + 0x40 + auVar709._10_2_;
              auVar238._12_2_ = auVar205._12_2_ + 0x40 + auVar709._12_2_;
              auVar238._14_2_ = auVar205._14_2_ + 0x40 + auVar709._14_2_;
              auVar709 = *(undefined1 (*) [16])(*pauVar114 + lVar122 * 3);
              pauVar114 = (undefined1 (*) [16])(*pauVar114 + (int)(uVar104 << 3));
              auVar711 = psraw(auVar711,7);
              sVar29 = auVar711._0_2_;
              sVar30 = auVar711._2_2_;
              sVar32 = auVar711._4_2_;
              sVar34 = auVar711._6_2_;
              sVar36 = auVar711._8_2_;
              sVar38 = auVar711._10_2_;
              sVar40 = auVar711._12_2_;
              sVar43 = auVar711._14_2_;
              auVar205 = paddsw(auVar238,auVar696);
              auVar205 = psraw(auVar205,7);
              sVar42 = auVar205._0_2_;
              sVar31 = auVar205._2_2_;
              sVar33 = auVar205._4_2_;
              sVar35 = auVar205._6_2_;
              sVar37 = auVar205._8_2_;
              sVar39 = auVar205._10_2_;
              sVar41 = auVar205._12_2_;
              sVar44 = auVar205._14_2_;
              auVar708 = pmaddubsw(auVar708,auVar144);
              auVar712 = pmaddubsw(auVar728,auVar192);
              auVar723 = pmaddubsw(auVar731,auVar193);
              *(ulong *)puVar111 =
                   CONCAT17((0 < sVar43) * (sVar43 < 0x100) * auVar711[0xe] - (0xff < sVar43),
                            CONCAT16((0 < sVar40) * (sVar40 < 0x100) * auVar711[0xc] -
                                     (0xff < sVar40),
                                     CONCAT15((0 < sVar38) * (sVar38 < 0x100) * auVar711[10] -
                                              (0xff < sVar38),
                                              CONCAT14((0 < sVar36) * (sVar36 < 0x100) * auVar711[8]
                                                       - (0xff < sVar36),
                                                       CONCAT13((0 < sVar34) * (sVar34 < 0x100) *
                                                                auVar711[6] - (0xff < sVar34),
                                                                CONCAT12((0 < sVar32) *
                                                                         (sVar32 < 0x100) *
                                                                         auVar711[4] -
                                                                         (0xff < sVar32),
                                                                         CONCAT11((0 < sVar30) *
                                                                                  (sVar30 < 0x100) *
                                                                                  auVar711[2] -
                                                                                  (0xff < sVar30),
                                                                                  (0 < sVar29) *
                                                                                  (sVar29 < 0x100) *
                                                                                  auVar711[0] -
                                                                                  (0xff < sVar29))))
                                                      ))));
              *(ulong *)(puVar111 + lVar102) =
                   CONCAT17((0 < sVar44) * (sVar44 < 0x100) * auVar205[0xe] - (0xff < sVar44),
                            CONCAT16((0 < sVar41) * (sVar41 < 0x100) * auVar205[0xc] -
                                     (0xff < sVar41),
                                     CONCAT15((0 < sVar39) * (sVar39 < 0x100) * auVar205[10] -
                                              (0xff < sVar39),
                                              CONCAT14((0 < sVar37) * (sVar37 < 0x100) * auVar205[8]
                                                       - (0xff < sVar37),
                                                       CONCAT13((0 < sVar35) * (sVar35 < 0x100) *
                                                                auVar205[6] - (0xff < sVar35),
                                                                CONCAT12((0 < sVar33) *
                                                                         (sVar33 < 0x100) *
                                                                         auVar205[4] -
                                                                         (0xff < sVar33),
                                                                         CONCAT11((0 < sVar31) *
                                                                                  (sVar31 < 0x100) *
                                                                                  auVar205[2] -
                                                                                  (0xff < sVar31),
                                                                                  (0 < sVar42) *
                                                                                  (sVar42 < 0x100) *
                                                                                  auVar205[0] -
                                                                                  (0xff < sVar42))))
                                                      ))));
              auVar205 = pmaddubsw(auVar718,auVar155);
              auVar560._0_2_ = auVar205._0_2_ + auVar712._0_2_;
              auVar560._2_2_ = auVar205._2_2_ + auVar712._2_2_;
              auVar560._4_2_ = auVar205._4_2_ + auVar712._4_2_;
              auVar560._6_2_ = auVar205._6_2_ + auVar712._6_2_;
              auVar560._8_2_ = auVar205._8_2_ + auVar712._8_2_;
              auVar560._10_2_ = auVar205._10_2_ + auVar712._10_2_;
              auVar560._12_2_ = auVar205._12_2_ + auVar712._12_2_;
              auVar560._14_2_ = auVar205._14_2_ + auVar712._14_2_;
              auVar336._0_2_ = auVar708._0_2_ + 0x40 + auVar723._0_2_;
              auVar336._2_2_ = auVar708._2_2_ + 0x40 + auVar723._2_2_;
              auVar336._4_2_ = auVar708._4_2_ + 0x40 + auVar723._4_2_;
              auVar336._6_2_ = auVar708._6_2_ + 0x40 + auVar723._6_2_;
              auVar336._8_2_ = auVar708._8_2_ + 0x40 + auVar723._8_2_;
              auVar336._10_2_ = auVar708._10_2_ + 0x40 + auVar723._10_2_;
              auVar336._12_2_ = auVar708._12_2_ + 0x40 + auVar723._12_2_;
              auVar336._14_2_ = auVar708._14_2_ + 0x40 + auVar723._14_2_;
              auVar205 = paddsw(auVar336,auVar560);
              auVar205 = psraw(auVar205,7);
              sVar29 = auVar205._0_2_;
              sVar42 = auVar205._2_2_;
              sVar30 = auVar205._4_2_;
              sVar31 = auVar205._6_2_;
              sVar32 = auVar205._8_2_;
              sVar33 = auVar205._10_2_;
              sVar34 = auVar205._12_2_;
              sVar35 = auVar205._14_2_;
              auVar708 = pmaddubsw(auVar728,auVar144);
              auVar711 = pmaddubsw(auVar731,auVar192);
              auVar728 = pmaddubsw(auVar718,auVar193);
              *(ulong *)(puVar111 + lVar102 * 2) =
                   CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                            CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] -
                                     (0xff < sVar34),
                                     CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                              (0xff < sVar33),
                                              CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                       - (0xff < sVar32),
                                                       CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                auVar205[6] - (0xff < sVar31),
                                                                CONCAT12((0 < sVar30) *
                                                                         (sVar30 < 0x100) *
                                                                         auVar205[4] -
                                                                         (0xff < sVar30),
                                                                         CONCAT11((0 < sVar42) *
                                                                                  (sVar42 < 0x100) *
                                                                                  auVar205[2] -
                                                                                  (0xff < sVar42),
                                                                                  (0 < sVar29) *
                                                                                  (sVar29 < 0x100) *
                                                                                  auVar205[0] -
                                                                                  (0xff < sVar29))))
                                                      ))));
              auVar205 = pmaddubsw(auVar709,auVar155);
              auVar730._0_2_ = auVar205._0_2_ + auVar711._0_2_;
              auVar730._2_2_ = auVar205._2_2_ + auVar711._2_2_;
              auVar730._4_2_ = auVar205._4_2_ + auVar711._4_2_;
              auVar730._6_2_ = auVar205._6_2_ + auVar711._6_2_;
              auVar730._8_2_ = auVar205._8_2_ + auVar711._8_2_;
              auVar730._10_2_ = auVar205._10_2_ + auVar711._10_2_;
              auVar730._12_2_ = auVar205._12_2_ + auVar711._12_2_;
              auVar730._14_2_ = auVar205._14_2_ + auVar711._14_2_;
              auVar673._0_2_ = auVar728._0_2_ + auVar708._0_2_ + 0x40;
              auVar673._2_2_ = auVar728._2_2_ + auVar708._2_2_ + 0x40;
              auVar673._4_2_ = auVar728._4_2_ + auVar708._4_2_ + 0x40;
              auVar673._6_2_ = auVar728._6_2_ + auVar708._6_2_ + 0x40;
              auVar673._8_2_ = auVar728._8_2_ + auVar708._8_2_ + 0x40;
              auVar673._10_2_ = auVar728._10_2_ + auVar708._10_2_ + 0x40;
              auVar673._12_2_ = auVar728._12_2_ + auVar708._12_2_ + 0x40;
              auVar673._14_2_ = auVar728._14_2_ + auVar708._14_2_ + 0x40;
              auVar205 = paddsw(auVar673,auVar730);
              auVar205 = psraw(auVar205,7);
              sVar29 = auVar205._0_2_;
              sVar42 = auVar205._2_2_;
              sVar30 = auVar205._4_2_;
              sVar31 = auVar205._6_2_;
              sVar32 = auVar205._8_2_;
              sVar33 = auVar205._10_2_;
              sVar34 = auVar205._12_2_;
              sVar35 = auVar205._14_2_;
              *(ulong *)(puVar111 + lVar102 * 3) =
                   CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                            CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] -
                                     (0xff < sVar34),
                                     CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                              (0xff < sVar33),
                                              CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                       - (0xff < sVar32),
                                                       CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                auVar205[6] - (0xff < sVar31),
                                                                CONCAT12((0 < sVar30) *
                                                                         (sVar30 < 0x100) *
                                                                         auVar205[4] -
                                                                         (0xff < sVar30),
                                                                         CONCAT11((0 < sVar42) *
                                                                                  (sVar42 < 0x100) *
                                                                                  auVar205[2] -
                                                                                  (0xff < sVar42),
                                                                                  (0 < sVar29) *
                                                                                  (sVar29 < 0x100) *
                                                                                  auVar205[0] -
                                                                                  (0xff < sVar29))))
                                                      ))));
              puVar111 = puVar111 + lVar102 * 4;
              iVar116 = iVar116 + 4;
              auVar205 = auVar718;
              auVar708 = auVar709;
              auVar709 = auVar731;
            } while (iVar116 != 0);
            pauVar130 = (undefined1 (*) [16])
                        ((long)pauVar114 + (0x10 - (long)(int)((iVar132 * 2 + 6U | 6) * uVar104)));
            puVar111 = puVar111 + (8 - (long)(int)(iVar105 * uVar98));
            uVar112 = uVar112 - 8;
          } while (uVar112 != 0);
          goto LAB_003ea65c;
        }
        lVar102 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
        puVar111 = dst->store_buf_adr[uVar118 - 4];
        iVar116 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
        uVar98 = iVar106 + 0xfU & 0xfffffff0;
        auVar144 = ZEXT416(CONCAT22((short)((uint)*(int *)(av1_bilinear_filters[lVar109] + 4) >> 8),
                                    (ushort)(*(int *)(av1_bilinear_filters[lVar109] + 4) << 8) |
                                    av1_bilinear_filters[lVar109][3]));
        auVar144 = pshuflw(auVar144,auVar144,0);
        auVar145._0_4_ = auVar144._0_4_;
        auVar145._4_4_ = auVar145._0_4_;
        auVar145._8_4_ = auVar145._0_4_;
        auVar145._12_4_ = auVar145._0_4_;
        puVar125 = src->store_buf_adr[uVar118 - 4];
        do {
          puVar121 = puVar125 + (lVar102 - (int)uVar98) * 2;
          lVar122 = 0;
          do {
            auVar144 = pmaddubsw(*(undefined1 (*) [16])(puVar125 + lVar122 * 2),auVar145);
            auVar192 = pmaddubsw(*(undefined1 (*) [16])(puVar125 + lVar122 * 2 + 0x10),auVar145);
            auVar144 = paddsw(auVar144,auVar155);
            auVar192 = paddsw(auVar192,auVar155);
            auVar144 = psraw(auVar144,7);
            auVar192 = psraw(auVar192,7);
            sVar29 = auVar144._0_2_;
            sVar30 = auVar144._2_2_;
            sVar32 = auVar144._4_2_;
            sVar34 = auVar144._6_2_;
            sVar36 = auVar144._8_2_;
            sVar38 = auVar144._10_2_;
            sVar40 = auVar144._12_2_;
            sVar42 = auVar144._14_2_;
            cVar12 = (0 < sVar42) * (sVar42 < 0x100) * auVar144[0xe] - (0xff < sVar42);
            sVar44 = auVar192._0_2_;
            sVar46 = auVar192._2_2_;
            sVar48 = auVar192._4_2_;
            sVar50 = auVar192._6_2_;
            sVar52 = auVar192._8_2_;
            sVar54 = auVar192._10_2_;
            sVar56 = auVar192._12_2_;
            sVar58 = auVar192._14_2_;
            auVar193 = pmaddubsw(*(undefined1 (*) [16])(puVar125 + lVar122 * 2 + lVar102),auVar145);
            auVar205 = pmaddubsw(*(undefined1 (*) [16])(puVar125 + lVar122 * 2 + lVar102 + 0x10),
                                 auVar145);
            auVar193 = paddsw(auVar193,auVar155);
            auVar205 = paddsw(auVar205,auVar155);
            auVar193 = psraw(auVar193,7);
            auVar205 = psraw(auVar205,7);
            sVar42 = auVar193._0_2_;
            sVar31 = auVar193._2_2_;
            sVar33 = auVar193._4_2_;
            sVar35 = auVar193._6_2_;
            sVar37 = auVar193._8_2_;
            sVar39 = auVar193._10_2_;
            sVar41 = auVar193._12_2_;
            sVar43 = auVar193._14_2_;
            sVar45 = auVar205._0_2_;
            sVar47 = auVar205._2_2_;
            sVar49 = auVar205._4_2_;
            sVar51 = auVar205._6_2_;
            sVar53 = auVar205._8_2_;
            sVar55 = auVar205._10_2_;
            sVar57 = auVar205._12_2_;
            sVar59 = auVar205._14_2_;
            auVar206._8_8_ =
                 (undefined8)
                 (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((0 < sVar43) *
                                                                                 (sVar43 < 0x100) *
                                                                                 auVar193[0xe] -
                                                                                 (0xff < sVar43),
                                                                                 cVar12),
                                                                        (0 < sVar41) *
                                                                        (sVar41 < 0x100) *
                                                                        auVar193[0xc] -
                                                                        (0xff < sVar41)),
                                                               (0 < sVar40) * (sVar40 < 0x100) *
                                                               auVar144[0xc] - (0xff < sVar40)),
                                                      (0 < sVar39) * (sVar39 < 0x100) * auVar193[10]
                                                      - (0xff < sVar39)),
                                             (0 < sVar38) * (sVar38 < 0x100) * auVar144[10] -
                                             (0xff < sVar38)),
                                    (0 < sVar37) * (sVar37 < 0x100) * auVar193[8] - (0xff < sVar37))
                           ,CONCAT11((0 < sVar36) * (sVar36 < 0x100) * auVar144[8] - (0xff < sVar36)
                                     ,cVar12)) >> 8);
            auVar206[7] = (0 < sVar35) * (sVar35 < 0x100) * auVar193[6] - (0xff < sVar35);
            auVar206[6] = (0 < sVar34) * (sVar34 < 0x100) * auVar144[6] - (0xff < sVar34);
            auVar206[5] = (0 < sVar33) * (sVar33 < 0x100) * auVar193[4] - (0xff < sVar33);
            auVar206[4] = (0 < sVar32) * (sVar32 < 0x100) * auVar144[4] - (0xff < sVar32);
            auVar206[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar193[2] - (0xff < sVar31);
            auVar206[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar144[2] - (0xff < sVar30);
            auVar206[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar193[0] - (0xff < sVar42);
            auVar206[0] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29);
            auVar172[1] = (0 < sVar45) * (sVar45 < 0x100) * auVar205[0] - (0xff < sVar45);
            auVar172[0] = (0 < sVar44) * (sVar44 < 0x100) * auVar192[0] - (0xff < sVar44);
            auVar172[2] = (0 < sVar46) * (sVar46 < 0x100) * auVar192[2] - (0xff < sVar46);
            auVar172[3] = (0 < sVar47) * (sVar47 < 0x100) * auVar205[2] - (0xff < sVar47);
            auVar172[4] = (0 < sVar48) * (sVar48 < 0x100) * auVar192[4] - (0xff < sVar48);
            auVar172[5] = (0 < sVar49) * (sVar49 < 0x100) * auVar205[4] - (0xff < sVar49);
            auVar172[6] = (0 < sVar50) * (sVar50 < 0x100) * auVar192[6] - (0xff < sVar50);
            auVar172[7] = (0 < sVar51) * (sVar51 < 0x100) * auVar205[6] - (0xff < sVar51);
            auVar172[8] = (0 < sVar52) * (sVar52 < 0x100) * auVar192[8] - (0xff < sVar52);
            auVar172[9] = (0 < sVar53) * (sVar53 < 0x100) * auVar205[8] - (0xff < sVar53);
            auVar172[10] = (0 < sVar54) * (sVar54 < 0x100) * auVar192[10] - (0xff < sVar54);
            auVar172[0xb] = (0 < sVar55) * (sVar55 < 0x100) * auVar205[10] - (0xff < sVar55);
            auVar172[0xc] = (0 < sVar56) * (sVar56 < 0x100) * auVar192[0xc] - (0xff < sVar56);
            auVar172[0xd] = (0 < sVar57) * (sVar57 < 0x100) * auVar205[0xc] - (0xff < sVar57);
            auVar172[0xe] = (0 < sVar58) * (sVar58 < 0x100) * auVar192[0xe] - (0xff < sVar58);
            auVar172[0xf] = (0 < sVar59) * (sVar59 < 0x100) * auVar205[0xe] - (0xff < sVar59);
            auVar192 = pmaddubsw(auVar206,auVar145);
            auVar144 = pmaddubsw(auVar172,auVar145);
            auVar192 = paddsw(auVar192,auVar155);
            auVar144 = paddsw(auVar144,auVar155);
            auVar192 = psraw(auVar192,7);
            auVar144 = psraw(auVar144,7);
            sVar29 = auVar192._0_2_;
            sVar42 = auVar192._2_2_;
            sVar30 = auVar192._4_2_;
            sVar31 = auVar192._6_2_;
            sVar32 = auVar192._8_2_;
            sVar33 = auVar192._10_2_;
            sVar34 = auVar192._12_2_;
            sVar35 = auVar192._14_2_;
            sVar36 = auVar144._0_2_;
            sVar37 = auVar144._2_2_;
            sVar38 = auVar144._4_2_;
            sVar39 = auVar144._6_2_;
            sVar40 = auVar144._8_2_;
            sVar41 = auVar144._10_2_;
            sVar43 = auVar144._12_2_;
            sVar44 = auVar144._14_2_;
            puVar103 = puVar111 + lVar122;
            *puVar103 = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0] - (0xff < sVar29);
            puVar103[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar192[2] - (0xff < sVar42);
            puVar103[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar192[4] - (0xff < sVar30);
            puVar103[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar192[6] - (0xff < sVar31);
            puVar103[4] = (0 < sVar32) * (sVar32 < 0x100) * auVar192[8] - (0xff < sVar32);
            puVar103[5] = (0 < sVar33) * (sVar33 < 0x100) * auVar192[10] - (0xff < sVar33);
            puVar103[6] = (0 < sVar34) * (sVar34 < 0x100) * auVar192[0xc] - (0xff < sVar34);
            puVar103[7] = (0 < sVar35) * (sVar35 < 0x100) * auVar192[0xe] - (0xff < sVar35);
            puVar103[8] = (0 < sVar36) * (sVar36 < 0x100) * auVar144[0] - (0xff < sVar36);
            puVar103[9] = (0 < sVar37) * (sVar37 < 0x100) * auVar144[2] - (0xff < sVar37);
            puVar103[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar144[4] - (0xff < sVar38);
            puVar103[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar144[6] - (0xff < sVar39);
            puVar103[0xc] = (0 < sVar40) * (sVar40 < 0x100) * auVar144[8] - (0xff < sVar40);
            puVar103[0xd] = (0 < sVar41) * (sVar41 < 0x100) * auVar144[10] - (0xff < sVar41);
            puVar103[0xe] = (0 < sVar43) * (sVar43 < 0x100) * auVar144[0xc] - (0xff < sVar43);
            puVar103[0xf] = (0 < sVar44) * (sVar44 < 0x100) * auVar144[0xe] - (0xff < sVar44);
            lVar122 = lVar122 + 0x10;
            puVar121 = puVar121 + 0x20;
          } while (uVar98 != (uint)lVar122);
          puVar111 = puVar111 + lVar122 + ((long)iVar116 - (long)(int)uVar98);
          iVar132 = iVar132 + -1;
          puVar125 = puVar121;
        } while (iVar132 != 0);
      }
    }
    else {
      iVar115 = iVar132 * 4;
      iVar105 = (int)uVar101;
      if ((iVar106 * 4 == iVar116) && (iVar115 == iVar117)) {
        if (phase == 0) {
          puVar111 = src->store_buf_adr[uVar118 - 4];
          iVar116 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          puVar125 = dst->store_buf_adr[uVar118 - 4];
          iVar117 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          uVar98 = iVar106 + 0xfU & 0xfffffff0;
          do {
            lVar122 = 0;
            lVar102 = (long)(int)uVar98 * 4 + (long)iVar116 * -4;
            do {
              puVar1 = (ushort *)(puVar111 + lVar122 * 4);
              puVar4 = (ushort *)(puVar111 + lVar122 * 4 + 0x10);
              puVar5 = (ushort *)(puVar111 + lVar122 * 4 + 0x20);
              puVar6 = (ushort *)(puVar111 + lVar122 * 4 + 0x30);
              uVar137 = *puVar1 & 0xff;
              uVar158 = puVar1[2] & 0xff;
              uVar161 = puVar1[4] & 0xff;
              uVar164 = puVar1[6] & 0xff;
              uVar203 = *puVar4 & 0xff;
              uVar222 = puVar4[2] & 0xff;
              uVar223 = puVar4[4] & 0xff;
              uVar224 = puVar4[6] & 0xff;
              bVar13 = (uVar137 != 0) * (uVar137 < 0x100) * (char)*puVar1 - (0xff < uVar137);
              bVar14 = (uVar158 != 0) * (uVar158 < 0x100) * (char)puVar1[2] - (0xff < uVar158);
              bVar15 = (uVar161 != 0) * (uVar161 < 0x100) * (char)puVar1[4] - (0xff < uVar161);
              bVar16 = (uVar164 != 0) * (uVar164 < 0x100) * (char)puVar1[6] - (0xff < uVar164);
              bVar17 = (uVar203 != 0) * (uVar203 < 0x100) * (char)*puVar4 - (0xff < uVar203);
              bVar18 = (uVar222 != 0) * (uVar222 < 0x100) * (char)puVar4[2] - (0xff < uVar222);
              bVar19 = (uVar223 != 0) * (uVar223 < 0x100) * (char)puVar4[4] - (0xff < uVar223);
              bVar20 = (uVar224 != 0) * (uVar224 < 0x100) * (char)puVar4[6] - (0xff < uVar224);
              uVar137 = *puVar5 & 0xff;
              uVar158 = puVar5[2] & 0xff;
              uVar161 = puVar5[4] & 0xff;
              uVar164 = puVar5[6] & 0xff;
              uVar203 = *puVar6 & 0xff;
              uVar222 = puVar6[2] & 0xff;
              uVar223 = puVar6[4] & 0xff;
              uVar224 = puVar6[6] & 0xff;
              bVar21 = (uVar137 != 0) * (uVar137 < 0x100) * (char)*puVar5 - (0xff < uVar137);
              bVar22 = (uVar158 != 0) * (uVar158 < 0x100) * (char)puVar5[2] - (0xff < uVar158);
              bVar23 = (uVar161 != 0) * (uVar161 < 0x100) * (char)puVar5[4] - (0xff < uVar161);
              bVar24 = (uVar164 != 0) * (uVar164 < 0x100) * (char)puVar5[6] - (0xff < uVar164);
              bVar25 = (uVar203 != 0) * (uVar203 < 0x100) * (char)*puVar6 - (0xff < uVar203);
              bVar26 = (uVar222 != 0) * (uVar222 < 0x100) * (char)puVar6[2] - (0xff < uVar222);
              bVar27 = (uVar223 != 0) * (uVar223 < 0x100) * (char)puVar6[4] - (0xff < uVar223);
              bVar28 = (uVar224 != 0) * (uVar224 < 0x100) * (char)puVar6[6] - (0xff < uVar224);
              puVar121 = puVar125 + lVar122;
              *puVar121 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
              puVar121[1] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
              puVar121[2] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
              puVar121[3] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
              puVar121[4] = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
              puVar121[5] = (bVar18 != 0) * (bVar18 < 0x100) * bVar18 - (0xff < bVar18);
              puVar121[6] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
              puVar121[7] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
              puVar121[8] = (bVar21 != 0) * (bVar21 < 0x100) * bVar21 - (0xff < bVar21);
              puVar121[9] = (bVar22 != 0) * (bVar22 < 0x100) * bVar22 - (0xff < bVar22);
              puVar121[10] = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
              puVar121[0xb] = (bVar24 != 0) * (bVar24 < 0x100) * bVar24 - (0xff < bVar24);
              puVar121[0xc] = (bVar25 != 0) * (bVar25 < 0x100) * bVar25 - (0xff < bVar25);
              puVar121[0xd] = (bVar26 != 0) * (bVar26 < 0x100) * bVar26 - (0xff < bVar26);
              puVar121[0xe] = (bVar27 != 0) * (bVar27 < 0x100) * bVar27 - (0xff < bVar27);
              puVar121[0xf] = (bVar28 != 0) * (bVar28 < 0x100) * bVar28 - (0xff < bVar28);
              lVar122 = lVar122 + 0x10;
              lVar102 = lVar102 + -0x40;
            } while (uVar98 != (uint)lVar122);
            puVar111 = puVar111 + -lVar102;
            puVar125 = puVar125 + lVar122 + ((long)iVar117 - (long)(int)uVar98);
            iVar132 = iVar132 + -1;
          } while (iVar132 != 0);
        }
        else {
          if (filter != BILINEAR) {
            local_350 = (undefined1 (*) [16])
                        malloc((long)(int)((((int)uVar113 << 2 | 6U) + 7 & 0xfffffff8) * iVar105 +
                                          0x10));
            if (local_350 == (undefined1 (*) [16])0x0) goto LAB_003eac04;
            iVar116 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
            lVar122 = (long)iVar116;
            puVar111 = dst->store_buf_adr[uVar118 - 4];
            iVar105 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
            auVar155 = *(undefined1 (*) [16])(pIVar107->filter_ptr + lVar109 * 8);
            uVar104 = iVar106 + 1U & 0xfffffffe;
            uVar98 = iVar117 + 0xdU & 0xfffffff8;
            auVar192 = pshufb(auVar155,_DAT_0050d5a0);
            auVar193 = pshufb(auVar155,_DAT_0050d5f0);
            auVar205 = pshufb(auVar155,_DAT_0050d5c0);
            auVar155 = pshufb(auVar155,_DAT_0050d600);
            puVar125 = src->store_buf_adr[uVar118 - 4] + (iVar116 * -3 + -7);
            local_2f8._0_8_ = lVar122 * 3;
            local_308._0_8_ = lVar122 * 4;
            lVar102 = (long)(int)(uVar104 * 2);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = local_2d8._8_8_;
            local_2d8 = auVar144 << 0x40;
            local_338._0_8_ = SEXT48((int)(uVar104 * 4));
            pauVar130 = local_350;
            do {
              uVar127 = *(ulong *)(puVar125 + 4);
              uVar140 = *(undefined8 *)(puVar125 + lVar122 + 4);
              auVar419._8_4_ = 0;
              auVar419._0_8_ = uVar127;
              auVar419._12_2_ = (short)(uVar127 >> 0x30);
              auVar419._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar418._12_4_ = auVar419._12_4_;
              auVar418._8_2_ = 0;
              auVar418._0_8_ = uVar127;
              auVar418._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar417._10_6_ = auVar418._10_6_;
              auVar417._8_2_ = (short)(uVar127 >> 0x20);
              auVar417._0_8_ = uVar127;
              auVar89._4_8_ = auVar417._8_8_;
              auVar89._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar89._0_2_ = (short)(uVar127 >> 0x10);
              auVar416._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
              auVar416._4_12_ = auVar89;
              uVar127 = *(ulong *)(puVar125 + lVar122 * 2 + 4);
              uVar140 = *(undefined8 *)(puVar125 + local_2f8._0_8_ + 4);
              auVar314._8_4_ = 0;
              auVar314._0_8_ = uVar127;
              auVar314._12_2_ = (short)(uVar127 >> 0x30);
              auVar314._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar313._12_4_ = auVar314._12_4_;
              auVar313._8_2_ = 0;
              auVar313._0_8_ = uVar127;
              auVar313._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar312._10_6_ = auVar313._10_6_;
              auVar312._8_2_ = (short)(uVar127 >> 0x20);
              auVar312._0_8_ = uVar127;
              auVar90._4_8_ = auVar312._8_8_;
              auVar90._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar90._0_2_ = (short)(uVar127 >> 0x10);
              auVar318._6_2_ = (short)uVar140;
              auVar318._4_2_ = (short)uVar127;
              auVar420._0_8_ = auVar416._0_8_;
              auVar420._8_4_ = auVar89._0_4_;
              auVar420._12_4_ = auVar90._0_4_;
              auVar318._0_4_ = auVar416._0_4_;
              lVar123 = lVar122 * 4 + 4;
              uVar127 = *(ulong *)(puVar125 + lVar122 * 4 + 4);
              uVar140 = *(undefined8 *)(puVar125 + lVar122 + lVar123);
              auVar536._8_4_ = 0;
              auVar536._0_8_ = uVar127;
              auVar536._12_2_ = (short)(uVar127 >> 0x30);
              auVar536._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar535._12_4_ = auVar536._12_4_;
              auVar535._8_2_ = 0;
              auVar535._0_8_ = uVar127;
              auVar535._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar534._10_6_ = auVar535._10_6_;
              auVar534._8_2_ = (short)(uVar127 >> 0x20);
              auVar534._0_8_ = uVar127;
              auVar91._4_8_ = auVar534._8_8_;
              auVar91._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar91._0_2_ = (short)(uVar127 >> 0x10);
              auVar533._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
              auVar533._4_12_ = auVar91;
              uVar127 = *(ulong *)(puVar125 + lVar122 * 2 + lVar123);
              uVar140 = *(undefined8 *)(puVar125 + local_2f8._0_8_ + lVar123);
              auVar317._8_4_ = 0;
              auVar317._0_8_ = uVar127;
              auVar317._12_2_ = (short)(uVar127 >> 0x30);
              auVar317._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar316._12_4_ = auVar317._12_4_;
              auVar316._8_2_ = 0;
              auVar316._0_8_ = uVar127;
              auVar316._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar315._10_6_ = auVar316._10_6_;
              auVar315._8_2_ = (short)(uVar127 >> 0x20);
              auVar315._0_8_ = uVar127;
              auVar92._4_8_ = auVar315._8_8_;
              auVar92._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar92._0_2_ = (short)(uVar127 >> 0x10);
              auVar318._14_2_ = (short)uVar140;
              auVar318._12_2_ = (short)uVar127;
              auVar537._0_8_ = auVar533._0_8_;
              auVar537._8_4_ = auVar91._0_4_;
              auVar537._12_4_ = auVar92._0_4_;
              auVar318._8_4_ = auVar533._0_4_;
              auVar421._8_8_ = auVar537._8_8_;
              auVar421._0_8_ = auVar420._8_8_;
              lVar131 = 0;
              lVar123 = local_338._0_8_ - (long)(iVar116 * 8);
              iVar117 = -uVar104;
              do {
                uVar127 = *(ulong *)(puVar125 + lVar131 * 2 + 8);
                lVar97 = lVar122 + lVar131 * 2 + 8;
                uVar140 = *(undefined8 *)(puVar125 + lVar122 + 8 + lVar131 * 2);
                auVar541._8_4_ = 0;
                auVar541._0_8_ = uVar127;
                auVar541._12_2_ = (short)(uVar127 >> 0x30);
                auVar541._14_2_ = (short)((ulong)uVar140 >> 0x30);
                auVar540._12_4_ = auVar541._12_4_;
                auVar540._8_2_ = 0;
                auVar540._0_8_ = uVar127;
                auVar540._10_2_ = (short)((ulong)uVar140 >> 0x20);
                auVar539._10_6_ = auVar540._10_6_;
                auVar539._8_2_ = (short)(uVar127 >> 0x20);
                auVar539._0_8_ = uVar127;
                auVar93._4_8_ = auVar539._8_8_;
                auVar93._2_2_ = (short)((ulong)uVar140 >> 0x10);
                auVar93._0_2_ = (short)(uVar127 >> 0x10);
                auVar538._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
                auVar538._4_12_ = auVar93;
                uVar127 = *(ulong *)(puVar125 + lVar122 + lVar97);
                lVar97 = lVar122 + lVar97;
                uVar140 = *(undefined8 *)(puVar125 + lVar122 + lVar97);
                lVar97 = lVar122 + lVar97;
                auVar653._8_4_ = 0;
                auVar653._0_8_ = uVar127;
                auVar653._12_2_ = (short)(uVar127 >> 0x30);
                auVar653._14_2_ = (short)((ulong)uVar140 >> 0x30);
                auVar652._12_4_ = auVar653._12_4_;
                auVar652._8_2_ = 0;
                auVar652._0_8_ = uVar127;
                auVar652._10_2_ = (short)((ulong)uVar140 >> 0x20);
                auVar651._10_6_ = auVar652._10_6_;
                auVar651._8_2_ = (short)(uVar127 >> 0x20);
                auVar651._0_8_ = uVar127;
                auVar94._4_8_ = auVar651._8_8_;
                auVar94._2_2_ = (short)((ulong)uVar140 >> 0x10);
                auVar94._0_2_ = (short)(uVar127 >> 0x10);
                auVar717._6_2_ = (short)uVar140;
                auVar717._4_2_ = (short)uVar127;
                uVar127 = *(ulong *)(puVar125 + lVar122 + lVar97);
                lVar97 = lVar122 + lVar97;
                uVar140 = *(undefined8 *)(puVar125 + lVar122 + lVar97);
                lVar97 = lVar122 + lVar97;
                auVar700._8_4_ = 0;
                auVar700._0_8_ = uVar127;
                auVar700._12_2_ = (short)(uVar127 >> 0x30);
                auVar700._14_2_ = (short)((ulong)uVar140 >> 0x30);
                auVar699._12_4_ = auVar700._12_4_;
                auVar699._8_2_ = 0;
                auVar699._0_8_ = uVar127;
                auVar699._10_2_ = (short)((ulong)uVar140 >> 0x20);
                auVar698._10_6_ = auVar699._10_6_;
                auVar698._8_2_ = (short)(uVar127 >> 0x20);
                auVar698._0_8_ = uVar127;
                auVar95._4_8_ = auVar698._8_8_;
                auVar95._2_2_ = (short)((ulong)uVar140 >> 0x10);
                auVar95._0_2_ = (short)(uVar127 >> 0x10);
                auVar697._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
                auVar697._4_12_ = auVar95;
                uVar127 = *(ulong *)(puVar125 + lVar122 + lVar97);
                uVar140 = *(undefined8 *)(puVar125 + lVar122 * 2 + lVar97);
                auVar716._8_4_ = 0;
                auVar716._0_8_ = uVar127;
                auVar716._12_2_ = (short)(uVar127 >> 0x30);
                auVar716._14_2_ = (short)((ulong)uVar140 >> 0x30);
                auVar715._12_4_ = auVar716._12_4_;
                auVar715._8_2_ = 0;
                auVar715._0_8_ = uVar127;
                auVar715._10_2_ = (short)((ulong)uVar140 >> 0x20);
                auVar714._10_6_ = auVar715._10_6_;
                auVar714._8_2_ = (short)(uVar127 >> 0x20);
                auVar714._0_8_ = uVar127;
                auVar96._4_8_ = auVar714._8_8_;
                auVar96._2_2_ = (short)((ulong)uVar140 >> 0x10);
                auVar96._0_2_ = (short)(uVar127 >> 0x10);
                auVar717._14_2_ = (short)uVar140;
                auVar717._12_2_ = (short)uVar127;
                auVar683._0_8_ = auVar538._0_8_;
                auVar683._8_4_ = auVar93._0_4_;
                auVar683._12_4_ = auVar94._0_4_;
                auVar717._0_4_ = auVar538._0_4_;
                auVar724._0_8_ = auVar697._0_8_;
                auVar724._8_4_ = auVar95._0_4_;
                auVar724._12_4_ = auVar96._0_4_;
                auVar717._8_4_ = auVar697._0_4_;
                auVar542._0_8_ = CONCAT44(auVar651._8_4_,auVar539._8_4_);
                auVar542._8_4_ = auVar540._12_4_;
                auVar542._12_4_ = auVar652._12_4_;
                auVar701._0_8_ = CONCAT44(auVar714._8_4_,auVar698._8_4_);
                auVar701._8_4_ = auVar699._12_4_;
                auVar701._12_4_ = auVar715._12_4_;
                auVar684._8_8_ = auVar724._8_8_;
                auVar684._0_8_ = auVar683._8_8_;
                auVar654._8_8_ = auVar701._0_8_;
                auVar654._0_8_ = auVar542._0_8_;
                auVar543._8_8_ = auVar701._8_8_;
                auVar543._0_8_ = auVar542._8_8_;
                auVar144 = pmaddubsw(auVar318,auVar192);
                auVar708 = pmaddubsw(auVar421,auVar193);
                auVar709 = pmaddubsw(auVar717,auVar205);
                auVar728 = pmaddubsw(auVar684,auVar155);
                auVar725._0_2_ = auVar728._0_2_ + auVar708._0_2_;
                auVar725._2_2_ = auVar728._2_2_ + auVar708._2_2_;
                auVar725._4_2_ = auVar728._4_2_ + auVar708._4_2_;
                auVar725._6_2_ = auVar728._6_2_ + auVar708._6_2_;
                auVar725._8_2_ = auVar728._8_2_ + auVar708._8_2_;
                auVar725._10_2_ = auVar728._10_2_ + auVar708._10_2_;
                auVar725._12_2_ = auVar728._12_2_ + auVar708._12_2_;
                auVar725._14_2_ = auVar728._14_2_ + auVar708._14_2_;
                auVar319._0_2_ = auVar144._0_2_ + 0x40 + auVar709._0_2_;
                auVar319._2_2_ = auVar144._2_2_ + 0x40 + auVar709._2_2_;
                auVar319._4_2_ = auVar144._4_2_ + 0x40 + auVar709._4_2_;
                auVar319._6_2_ = auVar144._6_2_ + 0x40 + auVar709._6_2_;
                auVar319._8_2_ = auVar144._8_2_ + 0x40 + auVar709._8_2_;
                auVar319._10_2_ = auVar144._10_2_ + 0x40 + auVar709._10_2_;
                auVar319._12_2_ = auVar144._12_2_ + 0x40 + auVar709._12_2_;
                auVar319._14_2_ = auVar144._14_2_ + 0x40 + auVar709._14_2_;
                auVar144 = paddsw(auVar319,auVar725);
                auVar144 = psraw(auVar144,7);
                sVar29 = auVar144._0_2_;
                sVar42 = auVar144._2_2_;
                uVar135 = CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42),
                                   (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29));
                sVar30 = auVar144._4_2_;
                sVar31 = auVar144._6_2_;
                auVar320._0_4_ =
                     CONCAT13((0 < sVar31) * (sVar31 < 0x100) * auVar144[6] - (0xff < sVar31),
                              CONCAT12((0 < sVar30) * (sVar30 < 0x100) * auVar144[4] -
                                       (0xff < sVar30),uVar135));
                sVar32 = auVar144._8_2_;
                sVar33 = auVar144._10_2_;
                auVar321._0_6_ =
                     CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar144[10] - (0xff < sVar33),
                              CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar144[8] -
                                       (0xff < sVar32),auVar320._0_4_));
                sVar32 = auVar144._12_2_;
                sVar33 = auVar144._14_2_;
                auVar322._0_8_ =
                     CONCAT17((0 < sVar33) * (sVar33 < 0x100) * auVar144[0xe] - (0xff < sVar33),
                              CONCAT16((0 < sVar32) * (sVar32 < 0x100) * auVar144[0xc] -
                                       (0xff < sVar32),auVar321._0_6_));
                auVar323._0_10_ =
                     CONCAT19((0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42),
                              CONCAT18((0 < sVar29) * (sVar29 < 0x100) * auVar144[0] -
                                       (0xff < sVar29),auVar322._0_8_));
                auVar324[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar144[4] - (0xff < sVar30);
                auVar324._0_10_ = auVar323._0_10_;
                auVar324[0xb] = (0 < sVar31) * (sVar31 < 0x100) * auVar144[6] - (0xff < sVar31);
                auVar728 = pmaddubsw(auVar717,auVar192);
                auVar708 = pmaddubsw(auVar684,auVar193);
                auVar709 = pmaddubsw(auVar654,auVar205);
                auVar144 = pmaddubsw(auVar543,auVar155);
                auVar544._0_2_ = auVar144._0_2_ + auVar708._0_2_;
                auVar544._2_2_ = auVar144._2_2_ + auVar708._2_2_;
                auVar544._4_2_ = auVar144._4_2_ + auVar708._4_2_;
                auVar544._6_2_ = auVar144._6_2_ + auVar708._6_2_;
                auVar544._8_2_ = auVar144._8_2_ + auVar708._8_2_;
                auVar544._10_2_ = auVar144._10_2_ + auVar708._10_2_;
                auVar544._12_2_ = auVar144._12_2_ + auVar708._12_2_;
                auVar544._14_2_ = auVar144._14_2_ + auVar708._14_2_;
                auVar702._0_2_ = auVar709._0_2_ + auVar728._0_2_ + 0x40;
                auVar702._2_2_ = auVar709._2_2_ + auVar728._2_2_ + 0x40;
                auVar702._4_2_ = auVar709._4_2_ + auVar728._4_2_ + 0x40;
                auVar702._6_2_ = auVar709._6_2_ + auVar728._6_2_ + 0x40;
                auVar702._8_2_ = auVar709._8_2_ + auVar728._8_2_ + 0x40;
                auVar702._10_2_ = auVar709._10_2_ + auVar728._10_2_ + 0x40;
                auVar702._12_2_ = auVar709._12_2_ + auVar728._12_2_ + 0x40;
                auVar702._14_2_ = auVar709._14_2_ + auVar728._14_2_ + 0x40;
                auVar144 = paddsw(auVar702,auVar544);
                auVar144 = psraw(auVar144,7);
                sVar29 = auVar144._0_2_;
                sVar42 = auVar144._2_2_;
                uVar166 = CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42),
                                   (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29));
                sVar29 = auVar144._4_2_;
                sVar42 = auVar144._6_2_;
                uVar138 = CONCAT13((0 < sVar42) * (sVar42 < 0x100) * auVar144[6] - (0xff < sVar42),
                                   CONCAT12((0 < sVar29) * (sVar29 < 0x100) * auVar144[4] -
                                            (0xff < sVar29),uVar166));
                sVar29 = auVar144._8_2_;
                sVar42 = auVar144._10_2_;
                uVar139 = CONCAT15((0 < sVar42) * (sVar42 < 0x100) * auVar144[10] - (0xff < sVar42),
                                   CONCAT14((0 < sVar29) * (sVar29 < 0x100) * auVar144[8] -
                                            (0xff < sVar29),uVar138));
                sVar29 = auVar144._12_2_;
                sVar42 = auVar144._14_2_;
                auVar324._12_2_ = (short)((ulong)auVar322._0_8_ >> 0x30);
                auVar324._14_2_ =
                     (short)(CONCAT17((0 < sVar42) * (sVar42 < 0x100) * auVar144[0xe] -
                                      (0xff < sVar42),
                                      CONCAT16((0 < sVar29) * (sVar29 < 0x100) * auVar144[0xc] -
                                               (0xff < sVar29),uVar139)) >> 0x30);
                auVar323._12_4_ = auVar324._12_4_;
                auVar323._10_2_ = (short)((uint6)uVar139 >> 0x20);
                auVar322._10_6_ = auVar323._10_6_;
                auVar322._8_2_ = (short)((uint6)auVar321._0_6_ >> 0x20);
                auVar321._8_8_ = auVar322._8_8_;
                auVar321._6_2_ = (short)((uint)uVar138 >> 0x10);
                auVar320._6_10_ = auVar321._6_10_;
                auVar320._4_2_ = (short)((uint)auVar320._0_4_ >> 0x10);
                *(uint *)(*pauVar130 + lVar131) = CONCAT22(uVar166,uVar135);
                *(int *)(*pauVar130 + lVar131 + lVar102) = auVar320._4_4_;
                *(int *)(*pauVar130 + lVar131 + lVar102 * 2) = auVar322._8_4_;
                *(undefined4 *)(*pauVar130 + lVar131 + lVar102 * 3) = auVar323._12_4_;
                lVar131 = lVar131 + 4;
                lVar123 = lVar123 + -8;
                iVar117 = iVar117 + 2;
                auVar318 = auVar654;
                auVar421 = auVar543;
              } while (iVar117 != 0);
              puVar125 = puVar125 + -lVar123;
              pauVar130 = (undefined1 (*) [16])(*pauVar130 + lVar131 + (int)(uVar104 * 6));
              uVar98 = uVar98 - 8;
            } while (uVar98 != 0);
            uVar112 = iVar106 + 7U & 0xfffffff8;
            uVar98 = iVar132 + 1U & 0xfffffffe;
            pauVar130 = local_350;
            do {
              pauVar114 = (undefined1 (*) [16])(*pauVar130 + local_338._0_8_);
              auVar144 = *pauVar130;
              auVar708 = *(undefined1 (*) [16])(*pauVar130 + lVar102);
              iVar116 = -uVar98;
              do {
                auVar709 = *pauVar114;
                puVar128 = *pauVar114;
                auVar728 = *(undefined1 (*) [16])(*pauVar114 + lVar102 * 2);
                auVar731 = *(undefined1 (*) [16])(*pauVar114 + lVar102 * 3);
                pauVar114 = (undefined1 (*) [16])(*pauVar114 + (int)(uVar104 << 3));
                auVar144 = pmaddubsw(auVar144,auVar192);
                auVar708 = pmaddubsw(auVar708,auVar193);
                auVar718 = pmaddubsw(auVar709,auVar205);
                auVar711 = pmaddubsw(*(undefined1 (*) [16])(puVar128 + lVar102),auVar155);
                auVar726._0_2_ = auVar711._0_2_ + auVar708._0_2_;
                auVar726._2_2_ = auVar711._2_2_ + auVar708._2_2_;
                auVar726._4_2_ = auVar711._4_2_ + auVar708._4_2_;
                auVar726._6_2_ = auVar711._6_2_ + auVar708._6_2_;
                auVar726._8_2_ = auVar711._8_2_ + auVar708._8_2_;
                auVar726._10_2_ = auVar711._10_2_ + auVar708._10_2_;
                auVar726._12_2_ = auVar711._12_2_ + auVar708._12_2_;
                auVar726._14_2_ = auVar711._14_2_ + auVar708._14_2_;
                auVar325._0_2_ = auVar144._0_2_ + 0x40 + auVar718._0_2_;
                auVar325._2_2_ = auVar144._2_2_ + 0x40 + auVar718._2_2_;
                auVar325._4_2_ = auVar144._4_2_ + 0x40 + auVar718._4_2_;
                auVar325._6_2_ = auVar144._6_2_ + 0x40 + auVar718._6_2_;
                auVar325._8_2_ = auVar144._8_2_ + 0x40 + auVar718._8_2_;
                auVar325._10_2_ = auVar144._10_2_ + 0x40 + auVar718._10_2_;
                auVar325._12_2_ = auVar144._12_2_ + 0x40 + auVar718._12_2_;
                auVar325._14_2_ = auVar144._14_2_ + 0x40 + auVar718._14_2_;
                auVar144 = paddsw(auVar325,auVar726);
                auVar144 = psraw(auVar144,7);
                sVar29 = auVar144._0_2_;
                sVar42 = auVar144._2_2_;
                sVar30 = auVar144._4_2_;
                sVar31 = auVar144._6_2_;
                sVar32 = auVar144._8_2_;
                sVar33 = auVar144._10_2_;
                sVar34 = auVar144._12_2_;
                sVar35 = auVar144._14_2_;
                auVar709 = pmaddubsw(auVar709,auVar192);
                auVar708 = pmaddubsw(*(undefined1 (*) [16])(puVar128 + lVar102),auVar193);
                *(ulong *)puVar111 =
                     CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar144[0xe] - (0xff < sVar35),
                              CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar144[0xc] -
                                       (0xff < sVar34),
                                       CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar144[10] -
                                                (0xff < sVar33),
                                                CONCAT14((0 < sVar32) * (sVar32 < 0x100) *
                                                         auVar144[8] - (0xff < sVar32),
                                                         CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                  auVar144[6] - (0xff < sVar31),
                                                                  CONCAT12((0 < sVar30) *
                                                                           (sVar30 < 0x100) *
                                                                           auVar144[4] -
                                                                           (0xff < sVar30),
                                                                           CONCAT11((0 < sVar42) *
                                                                                    (sVar42 < 0x100)
                                                                                    * auVar144[2] -
                                                                                    (0xff < sVar42),
                                                                                    (0 < sVar29) *
                                                                                    (sVar29 < 0x100)
                                                                                    * auVar144[0] -
                                                                                    (0xff < sVar29))
                                                                          ))))));
                auVar718 = pmaddubsw(auVar728,auVar205);
                auVar144 = pmaddubsw(auVar731,auVar155);
                auVar655._0_2_ = auVar144._0_2_ + auVar708._0_2_;
                auVar655._2_2_ = auVar144._2_2_ + auVar708._2_2_;
                auVar655._4_2_ = auVar144._4_2_ + auVar708._4_2_;
                auVar655._6_2_ = auVar144._6_2_ + auVar708._6_2_;
                auVar655._8_2_ = auVar144._8_2_ + auVar708._8_2_;
                auVar655._10_2_ = auVar144._10_2_ + auVar708._10_2_;
                auVar655._12_2_ = auVar144._12_2_ + auVar708._12_2_;
                auVar655._14_2_ = auVar144._14_2_ + auVar708._14_2_;
                auVar685._0_2_ = auVar718._0_2_ + auVar709._0_2_ + 0x40;
                auVar685._2_2_ = auVar718._2_2_ + auVar709._2_2_ + 0x40;
                auVar685._4_2_ = auVar718._4_2_ + auVar709._4_2_ + 0x40;
                auVar685._6_2_ = auVar718._6_2_ + auVar709._6_2_ + 0x40;
                auVar685._8_2_ = auVar718._8_2_ + auVar709._8_2_ + 0x40;
                auVar685._10_2_ = auVar718._10_2_ + auVar709._10_2_ + 0x40;
                auVar685._12_2_ = auVar718._12_2_ + auVar709._12_2_ + 0x40;
                auVar685._14_2_ = auVar718._14_2_ + auVar709._14_2_ + 0x40;
                auVar144 = paddsw(auVar685,auVar655);
                auVar144 = psraw(auVar144,7);
                sVar29 = auVar144._0_2_;
                sVar42 = auVar144._2_2_;
                sVar30 = auVar144._4_2_;
                sVar31 = auVar144._6_2_;
                sVar32 = auVar144._8_2_;
                sVar33 = auVar144._10_2_;
                sVar34 = auVar144._12_2_;
                sVar35 = auVar144._14_2_;
                *(ulong *)(puVar111 + iVar105) =
                     CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar144[0xe] - (0xff < sVar35),
                              CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar144[0xc] -
                                       (0xff < sVar34),
                                       CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar144[10] -
                                                (0xff < sVar33),
                                                CONCAT14((0 < sVar32) * (sVar32 < 0x100) *
                                                         auVar144[8] - (0xff < sVar32),
                                                         CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                  auVar144[6] - (0xff < sVar31),
                                                                  CONCAT12((0 < sVar30) *
                                                                           (sVar30 < 0x100) *
                                                                           auVar144[4] -
                                                                           (0xff < sVar30),
                                                                           CONCAT11((0 < sVar42) *
                                                                                    (sVar42 < 0x100)
                                                                                    * auVar144[2] -
                                                                                    (0xff < sVar42),
                                                                                    (0 < sVar29) *
                                                                                    (sVar29 < 0x100)
                                                                                    * auVar144[0] -
                                                                                    (0xff < sVar29))
                                                                          ))))));
                puVar111 = puVar111 + (long)iVar105 * 2;
                iVar116 = iVar116 + 2;
                auVar144 = auVar728;
                auVar708 = auVar731;
              } while (iVar116 != 0);
              pauVar130 = (undefined1 (*) [16])
                          ((long)pauVar114 + (0x10 - (long)(int)((iVar132 * 4 + 4U | 4) * uVar104)))
              ;
              puVar111 = puVar111 + (8 - (long)(int)(iVar105 * uVar98));
              uVar112 = uVar112 - 8;
            } while (uVar112 != 0);
            goto LAB_003ea65c;
          }
          lVar102 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          puVar111 = dst->store_buf_adr[uVar118 - 4];
          iVar116 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          uVar98 = iVar106 + 0xfU & 0xfffffff0;
          auVar144 = ZEXT416(CONCAT22((short)((uint)*(int *)(av1_bilinear_filters[lVar109] + 4) >> 8
                                             ),(ushort)(*(int *)(av1_bilinear_filters[lVar109] + 4)
                                                       << 8) | av1_bilinear_filters[lVar109][3]));
          auVar144 = pshuflw(auVar144,auVar144,0);
          auVar146._0_4_ = auVar144._0_4_;
          auVar146._4_4_ = auVar146._0_4_;
          auVar146._8_4_ = auVar146._0_4_;
          auVar146._12_4_ = auVar146._0_4_;
          puVar125 = src->store_buf_adr[uVar118 - 4];
          do {
            puVar121 = puVar125 + (lVar102 - (int)uVar98) * 4;
            lVar122 = 0;
            do {
              auVar144 = *(undefined1 (*) [16])(puVar125 + lVar122 * 4);
              auVar192 = *(undefined1 (*) [16])(puVar125 + lVar122 * 4 + 0x10);
              auVar193 = *(undefined1 (*) [16])(puVar125 + lVar122 * 4 + 0x20);
              auVar205 = *(undefined1 (*) [16])(puVar125 + lVar122 * 4 + 0x30);
              puVar124 = puVar125 + lVar122 * 4 + lVar102;
              puVar2 = puVar125 + lVar122 * 4 + lVar102 + 0x10;
              puVar3 = puVar125 + lVar122 * 4 + lVar102 + 0x20;
              puVar103 = puVar125 + lVar122 * 4 + lVar102 + 0x30;
              auVar689._0_12_ = auVar144._0_12_;
              auVar689._12_2_ = auVar144._6_2_;
              auVar689._14_2_ = *(undefined2 *)(puVar124 + 6);
              auVar688._12_4_ = auVar689._12_4_;
              auVar688._0_10_ = auVar144._0_10_;
              auVar688._10_2_ = *(undefined2 *)(puVar124 + 4);
              auVar687._10_6_ = auVar688._10_6_;
              auVar687._0_8_ = auVar144._0_8_;
              auVar687._8_2_ = auVar144._4_2_;
              uVar686 = CONCAT22(*(undefined2 *)puVar124,auVar144._0_2_);
              uVar138 = CONCAT22(*(undefined2 *)(puVar124 + 8),auVar144._8_2_);
              auVar174._14_2_ = *(undefined2 *)(puVar124 + 0xc);
              auVar174._12_2_ = auVar144._12_2_;
              auVar706._0_12_ = auVar192._0_12_;
              auVar706._12_2_ = auVar192._6_2_;
              auVar706._14_2_ = *(undefined2 *)(puVar2 + 6);
              auVar705._12_4_ = auVar706._12_4_;
              auVar705._0_10_ = auVar192._0_10_;
              auVar705._10_2_ = *(undefined2 *)(puVar2 + 4);
              auVar704._10_6_ = auVar705._10_6_;
              auVar704._0_8_ = auVar192._0_8_;
              auVar704._8_2_ = auVar192._4_2_;
              uVar703 = CONCAT22(*(undefined2 *)puVar2,auVar192._0_2_);
              uVar204 = CONCAT22(*(undefined2 *)(puVar2 + 8),auVar192._8_2_);
              auVar660._14_2_ = *(undefined2 *)(puVar2 + 0xc);
              auVar660._12_2_ = auVar192._12_2_;
              auVar425._0_12_ = auVar193._0_12_;
              auVar425._12_2_ = auVar193._6_2_;
              auVar425._14_2_ = *(undefined2 *)(puVar3 + 6);
              auVar424._12_4_ = auVar425._12_4_;
              auVar424._0_10_ = auVar193._0_10_;
              auVar424._10_2_ = *(undefined2 *)(puVar3 + 4);
              auVar423._10_6_ = auVar424._10_6_;
              auVar423._0_8_ = auVar193._0_8_;
              auVar423._8_2_ = auVar193._4_2_;
              uVar422 = CONCAT22(*(undefined2 *)puVar3,auVar193._0_2_);
              uVar186 = CONCAT22(*(undefined2 *)(puVar3 + 8),auVar193._8_2_);
              auVar195._14_2_ = *(undefined2 *)(puVar3 + 0xc);
              auVar195._12_2_ = auVar193._12_2_;
              auVar548._0_12_ = auVar205._0_12_;
              auVar548._12_2_ = auVar205._6_2_;
              auVar548._14_2_ = *(undefined2 *)(puVar103 + 6);
              auVar547._12_4_ = auVar548._12_4_;
              auVar547._0_10_ = auVar205._0_10_;
              auVar547._10_2_ = *(undefined2 *)(puVar103 + 4);
              auVar546._10_6_ = auVar547._10_6_;
              auVar546._0_8_ = auVar205._0_8_;
              auVar546._8_2_ = auVar205._4_2_;
              uVar545 = CONCAT22(*(undefined2 *)puVar103,auVar205._0_2_);
              uVar168 = CONCAT22(*(undefined2 *)(puVar103 + 8),auVar205._8_2_);
              auVar226._14_2_ = *(undefined2 *)(puVar103 + 0xc);
              auVar226._12_2_ = auVar205._12_2_;
              auVar174._4_4_ = uVar138;
              auVar174._0_4_ = uVar686;
              auVar174._8_4_ = uVar138;
              auVar173._8_8_ = auVar174._8_8_;
              auVar173._4_4_ = auVar687._8_4_;
              auVar173._0_4_ = uVar686;
              auVar660._4_4_ = uVar204;
              auVar660._0_4_ = uVar703;
              auVar660._8_4_ = uVar204;
              auVar659._8_8_ = auVar660._8_8_;
              auVar659._4_4_ = auVar704._8_4_;
              auVar659._0_4_ = uVar703;
              auVar195._4_4_ = uVar186;
              auVar195._0_4_ = uVar422;
              auVar195._8_4_ = uVar186;
              auVar194._8_8_ = auVar195._8_8_;
              auVar194._4_4_ = auVar423._8_4_;
              auVar194._0_4_ = uVar422;
              auVar226._4_4_ = uVar168;
              auVar226._0_4_ = uVar545;
              auVar226._8_4_ = uVar168;
              auVar225._8_8_ = auVar226._8_8_;
              auVar225._4_4_ = auVar546._8_4_;
              auVar225._0_4_ = uVar545;
              auVar144 = pmaddubsw(auVar173,auVar146);
              auVar192 = pmaddubsw(auVar659,auVar146);
              auVar144 = paddsw(auVar144,auVar155);
              auVar192 = paddsw(auVar192,auVar155);
              auVar144 = psraw(auVar144,7);
              auVar192 = psraw(auVar192,7);
              sVar29 = auVar144._0_2_;
              sVar42 = auVar144._2_2_;
              auVar175[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42);
              auVar175[0] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29);
              sVar29 = auVar144._4_2_;
              auVar175[2] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[4] - (0xff < sVar29);
              sVar29 = auVar144._6_2_;
              auVar175[3] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[6] - (0xff < sVar29);
              sVar29 = auVar144._8_2_;
              auVar175[4] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[8] - (0xff < sVar29);
              sVar29 = auVar144._10_2_;
              auVar175[5] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[10] - (0xff < sVar29);
              sVar29 = auVar144._12_2_;
              auVar175[6] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0xc] - (0xff < sVar29);
              sVar29 = auVar144._14_2_;
              auVar175[7] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0xe] - (0xff < sVar29);
              sVar29 = auVar192._0_2_;
              auVar175[8] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0] - (0xff < sVar29);
              sVar29 = auVar192._2_2_;
              auVar175[9] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[2] - (0xff < sVar29);
              sVar29 = auVar192._4_2_;
              auVar175[10] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[4] - (0xff < sVar29);
              sVar29 = auVar192._6_2_;
              auVar175[0xb] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[6] - (0xff < sVar29);
              sVar29 = auVar192._8_2_;
              auVar175[0xc] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[8] - (0xff < sVar29);
              sVar29 = auVar192._10_2_;
              auVar175[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[10] - (0xff < sVar29);
              sVar29 = auVar192._12_2_;
              auVar175[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0xc] - (0xff < sVar29);
              sVar29 = auVar192._14_2_;
              auVar175[0xf] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0xe] - (0xff < sVar29);
              auVar144 = pmaddubsw(auVar194,auVar146);
              auVar192 = pmaddubsw(auVar225,auVar146);
              auVar144 = paddsw(auVar144,auVar155);
              auVar192 = paddsw(auVar192,auVar155);
              auVar144 = psraw(auVar144,7);
              auVar192 = psraw(auVar192,7);
              sVar29 = auVar144._0_2_;
              sVar42 = auVar144._2_2_;
              auVar196[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42);
              auVar196[0] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29);
              sVar29 = auVar144._4_2_;
              auVar196[2] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[4] - (0xff < sVar29);
              sVar29 = auVar144._6_2_;
              auVar196[3] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[6] - (0xff < sVar29);
              sVar29 = auVar144._8_2_;
              auVar196[4] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[8] - (0xff < sVar29);
              sVar29 = auVar144._10_2_;
              auVar196[5] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[10] - (0xff < sVar29);
              sVar29 = auVar144._12_2_;
              auVar196[6] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0xc] - (0xff < sVar29);
              sVar29 = auVar144._14_2_;
              auVar196[7] = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0xe] - (0xff < sVar29);
              sVar29 = auVar192._0_2_;
              auVar196[8] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0] - (0xff < sVar29);
              sVar29 = auVar192._2_2_;
              auVar196[9] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[2] - (0xff < sVar29);
              sVar29 = auVar192._4_2_;
              auVar196[10] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[4] - (0xff < sVar29);
              sVar29 = auVar192._6_2_;
              auVar196[0xb] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[6] - (0xff < sVar29);
              sVar29 = auVar192._8_2_;
              auVar196[0xc] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[8] - (0xff < sVar29);
              sVar29 = auVar192._10_2_;
              auVar196[0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[10] - (0xff < sVar29);
              sVar29 = auVar192._12_2_;
              auVar196[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0xc] - (0xff < sVar29);
              sVar29 = auVar192._14_2_;
              auVar196[0xf] = (0 < sVar29) * (sVar29 < 0x100) * auVar192[0xe] - (0xff < sVar29);
              auVar144 = pmaddubsw(auVar175,auVar146);
              auVar192 = pmaddubsw(auVar196,auVar146);
              auVar144 = paddsw(auVar144,auVar155);
              auVar192 = paddsw(auVar192,auVar155);
              auVar144 = psraw(auVar144,7);
              auVar192 = psraw(auVar192,7);
              sVar29 = auVar144._0_2_;
              sVar42 = auVar144._2_2_;
              sVar30 = auVar144._4_2_;
              sVar31 = auVar144._6_2_;
              sVar32 = auVar144._8_2_;
              sVar33 = auVar144._10_2_;
              sVar34 = auVar144._12_2_;
              sVar35 = auVar144._14_2_;
              sVar36 = auVar192._0_2_;
              sVar37 = auVar192._2_2_;
              sVar38 = auVar192._4_2_;
              sVar39 = auVar192._6_2_;
              sVar40 = auVar192._8_2_;
              sVar41 = auVar192._10_2_;
              sVar43 = auVar192._12_2_;
              sVar44 = auVar192._14_2_;
              puVar103 = puVar111 + lVar122;
              *puVar103 = (0 < sVar29) * (sVar29 < 0x100) * auVar144[0] - (0xff < sVar29);
              puVar103[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar144[2] - (0xff < sVar42);
              puVar103[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar144[4] - (0xff < sVar30);
              puVar103[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar144[6] - (0xff < sVar31);
              puVar103[4] = (0 < sVar32) * (sVar32 < 0x100) * auVar144[8] - (0xff < sVar32);
              puVar103[5] = (0 < sVar33) * (sVar33 < 0x100) * auVar144[10] - (0xff < sVar33);
              puVar103[6] = (0 < sVar34) * (sVar34 < 0x100) * auVar144[0xc] - (0xff < sVar34);
              puVar103[7] = (0 < sVar35) * (sVar35 < 0x100) * auVar144[0xe] - (0xff < sVar35);
              puVar103[8] = (0 < sVar36) * (sVar36 < 0x100) * auVar192[0] - (0xff < sVar36);
              puVar103[9] = (0 < sVar37) * (sVar37 < 0x100) * auVar192[2] - (0xff < sVar37);
              puVar103[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar192[4] - (0xff < sVar38);
              puVar103[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar192[6] - (0xff < sVar39);
              puVar103[0xc] = (0 < sVar40) * (sVar40 < 0x100) * auVar192[8] - (0xff < sVar40);
              puVar103[0xd] = (0 < sVar41) * (sVar41 < 0x100) * auVar192[10] - (0xff < sVar41);
              puVar103[0xe] = (0 < sVar43) * (sVar43 < 0x100) * auVar192[0xc] - (0xff < sVar43);
              puVar103[0xf] = (0 < sVar44) * (sVar44 < 0x100) * auVar192[0xe] - (0xff < sVar44);
              lVar122 = lVar122 + 0x10;
              puVar121 = puVar121 + 0x40;
            } while (uVar98 != (uint)lVar122);
            puVar111 = puVar111 + lVar122 + ((long)iVar116 - (long)(int)uVar98);
            iVar132 = iVar132 + -1;
            puVar125 = puVar121;
          } while (iVar132 != 0);
        }
      }
      else {
        if ((iVar106 * 4 == iVar116 * 3) && (iVar115 == iVar117 * 3)) {
          iVar117 = ((iVar105 + 5) / 6) * 6 + 2;
          uVar98 = iVar105 + 7U & 0xfffffff8;
          iVar116 = (uVar98 - iVar117) * 2;
          if ((int)uVar98 <= iVar117) {
            iVar116 = 0;
          }
          local_350 = (undefined1 (*) [16])
                      malloc((long)(int)((((int)uVar110 << 2) / 3 + 0xeU & 0x7ffffff8) * iVar117 +
                                        iVar116));
          uVar127 = local_100;
          if (local_350 == (undefined1 (*) [16])0x0) {
LAB_003eac04:
            av1_resize_and_extend_frame_c(src,dst,filter,phase,num_planes);
            return;
          }
          piVar9 = pIVar107->filter_ptr;
          iVar116 = *(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          lVar123 = (long)iVar116;
          puVar111 = dst->store_buf_adr[uVar118 - 4];
          iVar117 = *(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          iVar105 = (iVar106 + 5) / 6;
          iVar99 = iVar105 * 0xc + 4;
          local_2e0 = iVar115 / 3 + 0xeU & 0xfffffff8;
          puVar129 = (ulong *)(src->store_buf_adr[uVar118 - 4] + (iVar116 * -3 + -3));
          auVar155 = *(undefined1 (*) [16])((long)piVar9 + local_e8);
          local_2f8 = pshufb(auVar155,_DAT_0050d5a0);
          local_308 = pshufb(auVar155,_DAT_0050d5c0);
          auVar144 = pshufb(auVar155,_DAT_0050d600);
          (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + local_100))
                    ((long)piVar9 + local_f0,local_d8);
          (**(code **)(scale_plane_4_to_3_general_shuffle_filter_func_list + (ulong)uVar119 * 8))
                    ((long)piVar9 + local_f8,local_88);
          auVar155 = pshufb(auVar155,_DAT_0050d5f0);
          local_338[0] = auVar155[0] + -0x40;
          local_338[1] = auVar155[1] + -0x40;
          local_338[2] = auVar155[2] + -0x40;
          local_338[3] = auVar155[3] + -0x40;
          local_338[4] = auVar155[4] + -0x40;
          local_338[5] = auVar155[5] + -0x40;
          local_338[6] = auVar155[6] + -0x40;
          local_338[7] = auVar155[7] + -0x40;
          local_338[8] = auVar155[8] + -0x40;
          local_338[9] = auVar155[9] + -0x40;
          local_338[10] = auVar155[10] + -0x40;
          local_338[0xb] = auVar155[0xb] + -0x40;
          local_338[0xc] = auVar155[0xc] + -0x40;
          local_338[0xd] = auVar155[0xd] + -0x40;
          local_338[0xe] = auVar155[0xe] + -0x40;
          local_338[0xf] = auVar155[0xf] + -0x40;
          *local_108 = *local_108 + -0x40;
          local_108[1] = local_108[1] + -0x40;
          local_108[2] = local_108[2] + -0x40;
          local_108[3] = local_108[3] + -0x40;
          local_108[4] = local_108[4] + -0x40;
          local_108[5] = local_108[5] + -0x40;
          local_108[6] = local_108[6] + -0x40;
          local_108[7] = local_108[7] + -0x40;
          local_108[8] = local_108[8] + -0x40;
          local_108[9] = local_108[9] + -0x40;
          local_108[10] = local_108[10] + -0x40;
          local_108[0xb] = local_108[0xb] + -0x40;
          local_108[0xc] = local_108[0xc] + -0x40;
          local_108[0xd] = local_108[0xd] + -0x40;
          local_108[0xe] = local_108[0xe] + -0x40;
          local_108[0xf] = local_108[0xf] + -0x40;
          *local_110 = *local_110 + -0x40;
          local_110[1] = local_110[1] + -0x40;
          local_110[2] = local_110[2] + -0x40;
          local_110[3] = local_110[3] + -0x40;
          local_110[4] = local_110[4] + -0x40;
          local_110[5] = local_110[5] + -0x40;
          local_110[6] = local_110[6] + -0x40;
          local_110[7] = local_110[7] + -0x40;
          local_110[8] = local_110[8] + -0x40;
          local_110[9] = local_110[9] + -0x40;
          local_110[10] = local_110[10] + -0x40;
          local_110[0xb] = local_110[0xb] + -0x40;
          local_110[0xc] = local_110[0xc] + -0x40;
          local_110[0xd] = local_110[0xd] + -0x40;
          local_110[0xe] = local_110[0xe] + -0x40;
          local_110[0xf] = local_110[0xf] + -0x40;
          iVar105 = (int)((ulong)((long)(iVar105 * 0x18) * 0x55555555) >> 0x20) + iVar105 * -0x18;
          pcVar10 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list + uVar127);
          lVar122 = (long)iVar99;
          lVar102 = lVar122 * 3;
          pauVar130 = local_350;
          do {
            uVar127 = *puVar129;
            uVar140 = *(undefined8 *)((long)puVar129 + lVar123);
            uVar101 = *(ulong *)((long)puVar129 + lVar123 * 2);
            uVar141 = *(undefined8 *)((long)puVar129 + lVar123 * 3);
            uVar110 = *(ulong *)((long)puVar129 + lVar123 * 4);
            uVar142 = *(undefined8 *)((long)puVar129 + lVar123 * 5);
            uVar113 = *(ulong *)((long)puVar129 + lVar123 * 6);
            uVar143 = *(undefined8 *)((long)puVar129 + lVar123 * 7);
            auVar193._8_4_ = 0;
            auVar193._0_8_ = uVar127;
            auVar193._12_2_ = (short)(uVar127 >> 0x30);
            auVar193._14_2_ = (short)((ulong)uVar140 >> 0x30);
            auVar192._12_4_ = auVar193._12_4_;
            auVar192._8_2_ = 0;
            auVar192._0_8_ = uVar127;
            auVar192._10_2_ = (short)((ulong)uVar140 >> 0x20);
            auVar155._10_6_ = auVar192._10_6_;
            auVar155._8_2_ = (short)(uVar127 >> 0x20);
            auVar155._0_8_ = uVar127;
            auVar73._4_8_ = auVar155._8_8_;
            auVar73._2_2_ = (short)((ulong)uVar140 >> 0x10);
            auVar73._0_2_ = (short)(uVar127 >> 0x10);
            auVar147._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
            auVar147._4_12_ = auVar73;
            auVar199._8_4_ = 0;
            auVar199._0_8_ = uVar101;
            auVar199._12_2_ = (short)(uVar101 >> 0x30);
            auVar199._14_2_ = (short)((ulong)uVar141 >> 0x30);
            auVar198._12_4_ = auVar199._12_4_;
            auVar198._8_2_ = 0;
            auVar198._0_8_ = uVar101;
            auVar198._10_2_ = (short)((ulong)uVar141 >> 0x20);
            auVar197._10_6_ = auVar198._10_6_;
            auVar197._8_2_ = (short)(uVar101 >> 0x20);
            auVar197._0_8_ = uVar101;
            auVar74._4_8_ = auVar197._8_8_;
            auVar74._2_2_ = (short)((ulong)uVar141 >> 0x10);
            auVar74._0_2_ = (short)(uVar101 >> 0x10);
            local_1d8._6_2_ = (short)uVar141;
            local_1d8._4_2_ = (short)uVar101;
            auVar210._8_4_ = 0;
            auVar210._0_8_ = uVar110;
            auVar210._12_2_ = (short)(uVar110 >> 0x30);
            auVar210._14_2_ = (short)((ulong)uVar142 >> 0x30);
            auVar209._12_4_ = auVar210._12_4_;
            auVar209._8_2_ = 0;
            auVar209._0_8_ = uVar110;
            auVar209._10_2_ = (short)((ulong)uVar142 >> 0x20);
            auVar208._10_6_ = auVar209._10_6_;
            auVar208._8_2_ = (short)(uVar110 >> 0x20);
            auVar208._0_8_ = uVar110;
            auVar75._4_8_ = auVar208._8_8_;
            auVar75._2_2_ = (short)((ulong)uVar142 >> 0x10);
            auVar75._0_2_ = (short)(uVar110 >> 0x10);
            auVar207._0_4_ = CONCAT22((short)uVar142,(short)uVar110);
            auVar207._4_12_ = auVar75;
            auVar428._8_4_ = 0;
            auVar428._0_8_ = uVar113;
            auVar428._12_2_ = (short)(uVar113 >> 0x30);
            auVar428._14_2_ = (short)((ulong)uVar143 >> 0x30);
            auVar427._12_4_ = auVar428._12_4_;
            auVar427._8_2_ = 0;
            auVar427._0_8_ = uVar113;
            auVar427._10_2_ = (short)((ulong)uVar143 >> 0x20);
            auVar426._10_6_ = auVar427._10_6_;
            auVar426._8_2_ = (short)(uVar113 >> 0x20);
            auVar426._0_8_ = uVar113;
            auVar76._4_8_ = auVar426._8_8_;
            auVar76._2_2_ = (short)((ulong)uVar143 >> 0x10);
            auVar76._0_2_ = (short)(uVar113 >> 0x10);
            local_1d8._14_2_ = (short)uVar143;
            local_1d8._12_2_ = (short)uVar113;
            auVar690._0_8_ = auVar147._0_8_;
            auVar690._8_4_ = auVar73._0_4_;
            auVar690._12_4_ = auVar74._0_4_;
            local_1d8._0_4_ = auVar147._0_4_;
            auVar227._0_8_ = auVar207._0_8_;
            auVar227._8_4_ = auVar75._0_4_;
            auVar227._12_4_ = auVar76._0_4_;
            local_1d8._8_4_ = auVar207._0_4_;
            auVar148._0_8_ = CONCAT44(auVar197._8_4_,auVar155._8_4_);
            auVar148._8_4_ = auVar192._12_4_;
            auVar148._12_4_ = auVar198._12_4_;
            auVar211._0_8_ = CONCAT44(auVar426._8_4_,auVar208._8_4_);
            auVar211._8_4_ = auVar209._12_4_;
            auVar211._12_4_ = auVar427._12_4_;
            local_1c8._8_8_ = auVar227._8_8_;
            local_1c8._0_8_ = auVar690._8_8_;
            local_1b8._8_8_ = auVar211._0_8_;
            local_1b8._0_8_ = auVar148._0_8_;
            local_1a8._8_8_ = auVar211._8_8_;
            local_1a8._0_8_ = auVar148._8_8_;
            iVar115 = ((iVar106 + 5) % 6 - iVar106) + -5;
            do {
              uVar127 = puVar129[1];
              uVar140 = *(undefined8 *)((long)puVar129 + lVar123 + 8);
              uVar101 = *(ulong *)((long)puVar129 + lVar123 + lVar123 + 8);
              lVar131 = lVar123 + lVar123 + 8;
              uVar141 = *(undefined8 *)((long)puVar129 + lVar123 + lVar131);
              lVar131 = lVar123 + lVar131;
              uStack_160 = 0;
              uVar110 = *(ulong *)((long)puVar129 + lVar123 + lVar131);
              lVar131 = lVar123 + lVar131;
              uStack_150 = 0;
              auVar215._8_4_ = 0;
              auVar215._0_8_ = uVar127;
              auVar215._12_2_ = (short)(uVar127 >> 0x30);
              auVar215._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar214._12_4_ = auVar215._12_4_;
              auVar214._8_2_ = 0;
              auVar214._0_8_ = uVar127;
              auVar214._10_2_ = (short)((ulong)uVar140 >> 0x20);
              auVar213._10_6_ = auVar214._10_6_;
              auVar213._8_2_ = (short)(uVar127 >> 0x20);
              auVar213._0_8_ = uVar127;
              auVar77._4_8_ = auVar213._8_8_;
              auVar77._2_2_ = (short)((ulong)uVar140 >> 0x10);
              auVar77._0_2_ = (short)(uVar127 >> 0x10);
              auVar212._0_4_ = CONCAT22((short)uVar140,(short)uVar127);
              auVar212._4_12_ = auVar77;
              local_148 = *(undefined8 *)((long)puVar129 + lVar123 + lVar131);
              lVar131 = lVar123 + lVar131;
              uStack_140 = 0;
              auVar330._8_4_ = 0;
              auVar330._0_8_ = uVar101;
              auVar330._12_2_ = (short)(uVar101 >> 0x30);
              auVar330._14_2_ = (short)((ulong)uVar141 >> 0x30);
              auVar329._12_4_ = auVar330._12_4_;
              auVar329._8_2_ = 0;
              auVar329._0_8_ = uVar101;
              auVar329._10_2_ = (short)((ulong)uVar141 >> 0x20);
              auVar328._10_6_ = auVar329._10_6_;
              auVar328._8_2_ = (short)(uVar101 >> 0x20);
              auVar328._0_8_ = uVar101;
              auVar78._4_8_ = auVar328._8_8_;
              auVar78._2_2_ = (short)((ulong)uVar141 >> 0x10);
              auVar78._0_2_ = (short)(uVar101 >> 0x10);
              local_138 = *(ulong *)((long)puVar129 + lVar123 + lVar131);
              auVar231._8_4_ = 0;
              auVar231._0_8_ = uVar110;
              auVar231._12_2_ = (short)(uVar110 >> 0x30);
              auVar231._14_2_ = (short)((ulong)local_148 >> 0x30);
              auVar230._12_4_ = auVar231._12_4_;
              auVar230._8_2_ = 0;
              auVar230._0_8_ = uVar110;
              auVar230._10_2_ = (short)((ulong)local_148 >> 0x20);
              auVar229._10_6_ = auVar230._10_6_;
              auVar229._8_2_ = (short)(uVar110 >> 0x20);
              auVar229._0_8_ = uVar110;
              auVar79._4_8_ = auVar229._8_8_;
              auVar79._2_2_ = (short)((ulong)local_148 >> 0x10);
              auVar79._0_2_ = (short)(uVar110 >> 0x10);
              auVar228._0_4_ = CONCAT22((short)local_148,(short)uVar110);
              auVar228._4_12_ = auVar79;
              uStack_130 = 0;
              local_128 = *(undefined8 *)((long)puVar129 + lVar123 * 2 + lVar131);
              uStack_120 = 0;
              auVar551._8_4_ = 0;
              auVar551._0_8_ = local_138;
              auVar551._12_2_ = (short)(local_138 >> 0x30);
              auVar551._14_2_ = (short)((ulong)local_128 >> 0x30);
              auVar550._12_4_ = auVar551._12_4_;
              auVar550._8_2_ = 0;
              auVar550._0_8_ = local_138;
              auVar550._10_2_ = (short)((ulong)local_128 >> 0x20);
              auVar549._10_6_ = auVar550._10_6_;
              auVar549._8_2_ = (short)(local_138 >> 0x20);
              auVar549._0_8_ = local_138;
              auVar80._4_8_ = auVar549._8_8_;
              auVar80._2_2_ = (short)((ulong)local_128 >> 0x10);
              auVar80._0_2_ = (short)(local_138 >> 0x10);
              auVar429._0_8_ = auVar212._0_8_;
              auVar429._8_4_ = auVar77._0_4_;
              auVar429._12_4_ = auVar78._0_4_;
              local_188 = auVar429._8_8_;
              local_198 = CONCAT44(CONCAT22((short)uVar141,(short)uVar101),auVar212._0_4_);
              auVar216._0_8_ = CONCAT44(auVar328._8_4_,auVar213._8_4_);
              auVar216._8_4_ = auVar214._12_4_;
              auVar216._12_4_ = auVar329._12_4_;
              auVar331._0_8_ = auVar228._0_8_;
              auVar331._8_4_ = auVar79._0_4_;
              auVar331._12_4_ = auVar80._0_4_;
              uStack_180 = auVar331._8_8_;
              uStack_190 = CONCAT44(CONCAT22((short)local_128,(short)local_138),auVar228._0_4_);
              uStack_170 = auVar229._8_4_;
              uStack_16c = auVar549._8_4_;
              local_168 = auVar216._8_8_;
              _local_158 = CONCAT44(auVar550._12_4_,auVar230._12_4_);
              auVar192 = pmaddubsw(local_1d8,local_2f8);
              auVar155 = pmaddubsw(local_1a8,auVar144);
              auVar155 = paddsw(auVar155,auVar192);
              auVar192 = pmaddubsw(local_1c8,local_338);
              auVar155 = paddsw(auVar155,auVar192);
              auVar192 = pmaddubsw(local_1b8,local_308);
              auVar155 = paddsw(auVar155,auVar192);
              auVar192 = pmaddubsw(local_1c8,_DAT_004c7fb0);
              auVar155 = paddsw(auVar192,auVar155);
              puVar129 = puVar129 + 1;
              auVar155 = paddsw(auVar155,_DAT_0050d570);
              auVar708 = psraw(auVar155,7);
              local_178 = auVar216._0_8_;
              uVar140 = (*pcVar10)(local_1d8 + lVar108,local_d8);
              pcVar11 = *(code **)(scale_plane_4_to_3_general_convolve8_func_list +
                                  (ulong)uVar119 * 8);
              uVar141 = (*pcVar11)(local_1d8 + lVar100,local_88);
              auVar69._8_8_ = uStack_190;
              auVar69._0_8_ = local_198;
              auVar71._8_8_ = uStack_180;
              auVar71._0_8_ = local_188;
              auVar155 = pmaddubsw(local_1b8,local_2f8);
              auVar205 = pmaddubsw(local_1a8,local_338);
              auVar192 = pmaddubsw(auVar69,local_308);
              auVar193 = pmaddubsw(auVar71,auVar144);
              auVar155 = paddsw(auVar193,auVar155);
              auVar155 = paddsw(auVar155,auVar205);
              auVar155 = paddsw(auVar155,auVar192);
              auVar192 = pmaddubsw(local_1a8,_DAT_004c7fb0);
              auVar155 = paddsw(auVar192,auVar155);
              auVar155 = paddsw(auVar155,_DAT_0050d570);
              auVar155 = psraw(auVar155,7);
              uVar142 = (*pcVar10)(local_1b8 + lVar108,local_d8);
              uVar143 = (*pcVar11)(local_1b8 + lVar100,local_88);
              local_2d8._0_2_ = auVar708._0_2_;
              local_2d8._2_2_ = auVar708._2_2_;
              local_2d8._4_2_ = auVar708._4_2_;
              local_2d8._6_2_ = auVar708._6_2_;
              local_2d8._8_2_ = auVar708._8_2_;
              local_2d8._10_2_ = auVar708._10_2_;
              local_2d8._12_2_ = auVar708._12_2_;
              local_2d8._14_2_ = auVar708._14_2_;
              local_288._0_2_ = (short)uVar141;
              local_288._2_2_ = (short)((ulong)uVar141 >> 0x10);
              local_288._4_2_ = (short)((ulong)uVar141 >> 0x20);
              local_288._6_2_ = (short)((ulong)uVar141 >> 0x30);
              sStack_280 = (short)extraout_XMM0_Qb_00;
              sStack_27e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
              sStack_27c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
              sStack_27a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
              uVar185 = CONCAT11((0 < (short)local_2d8._2_2_) * ((short)local_2d8._2_2_ < 0x100) *
                                 auVar708[2] - (0xff < (short)local_2d8._2_2_),
                                 (0 < (short)local_2d8._0_2_) * ((short)local_2d8._0_2_ < 0x100) *
                                 auVar708[0] - (0xff < (short)local_2d8._0_2_));
              uVar186 = CONCAT13((0 < (short)local_2d8._6_2_) * ((short)local_2d8._6_2_ < 0x100) *
                                 auVar708[6] - (0xff < (short)local_2d8._6_2_),
                                 CONCAT12((0 < (short)local_2d8._4_2_) *
                                          ((short)local_2d8._4_2_ < 0x100) * auVar708[4] -
                                          (0xff < (short)local_2d8._4_2_),uVar185));
              uVar187 = CONCAT15((0 < (short)local_2d8._10_2_) * ((short)local_2d8._10_2_ < 0x100) *
                                 auVar708[10] - (0xff < (short)local_2d8._10_2_),
                                 CONCAT14((0 < (short)local_2d8._8_2_) *
                                          ((short)local_2d8._8_2_ < 0x100) * auVar708[8] -
                                          (0xff < (short)local_2d8._8_2_),uVar186));
              uVar188 = CONCAT17((0 < (short)local_2d8._14_2_) * ((short)local_2d8._14_2_ < 0x100) *
                                 auVar708[0xe] - (0xff < (short)local_2d8._14_2_),
                                 CONCAT16((0 < (short)local_2d8._12_2_) *
                                          ((short)local_2d8._12_2_ < 0x100) * auVar708[0xc] -
                                          (0xff < (short)local_2d8._12_2_),uVar187));
              auVar189._0_10_ =
                   CONCAT19((0 < local_288._2_2_) * (local_288._2_2_ < 0x100) *
                            (char)((ulong)uVar141 >> 0x10) - (0xff < local_288._2_2_),
                            CONCAT18((0 < (short)local_288) * ((short)local_288 < 0x100) *
                                     (char)uVar141 - (0xff < (short)local_288),uVar188));
              auVar189[10] = (0 < local_288._4_2_) * (local_288._4_2_ < 0x100) *
                             (char)((ulong)uVar141 >> 0x20) - (0xff < local_288._4_2_);
              auVar189[0xb] =
                   (0 < local_288._6_2_) * (local_288._6_2_ < 0x100) *
                   (char)((ulong)uVar141 >> 0x30) - (0xff < local_288._6_2_);
              auVar191[0xc] =
                   (0 < sStack_280) * (sStack_280 < 0x100) * (char)extraout_XMM0_Qb_00 -
                   (0xff < sStack_280);
              auVar191._0_12_ = auVar189;
              auVar191[0xd] =
                   (0 < sStack_27e) * (sStack_27e < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_27e);
              auVar200[0xe] =
                   (0 < sStack_27c) * (sStack_27c < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_27c);
              auVar200._0_14_ = auVar191;
              auVar200[0xf] =
                   (0 < sStack_27a) * (sStack_27a < 0x100) *
                   (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_27a);
              local_2c8 = (short)uVar140;
              sStack_2c6 = (short)((ulong)uVar140 >> 0x10);
              sStack_2c4 = (short)((ulong)uVar140 >> 0x20);
              sStack_2c2 = (short)((ulong)uVar140 >> 0x30);
              sStack_2c0 = (short)extraout_XMM0_Qb;
              sStack_2be = (short)((ulong)extraout_XMM0_Qb >> 0x10);
              sStack_2bc = (short)((ulong)extraout_XMM0_Qb >> 0x20);
              sStack_2ba = (short)((ulong)extraout_XMM0_Qb >> 0x30);
              local_228._0_2_ = auVar155._0_2_;
              local_228._2_2_ = auVar155._2_2_;
              local_228._4_2_ = auVar155._4_2_;
              local_228._6_2_ = auVar155._6_2_;
              uStack_220._0_2_ = auVar155._8_2_;
              uStack_220._2_2_ = auVar155._10_2_;
              uStack_220._4_2_ = auVar155._12_2_;
              uStack_220._6_2_ = auVar155._14_2_;
              uVar166 = CONCAT11((0 < sStack_2c6) * (sStack_2c6 < 0x100) *
                                 (char)((ulong)uVar140 >> 0x10) - (0xff < sStack_2c6),
                                 (0 < local_2c8) * (local_2c8 < 0x100) * (char)uVar140 -
                                 (0xff < local_2c8));
              uVar168 = CONCAT13((0 < sStack_2c2) * (sStack_2c2 < 0x100) *
                                 (char)((ulong)uVar140 >> 0x30) - (0xff < sStack_2c2),
                                 CONCAT12((0 < sStack_2c4) * (sStack_2c4 < 0x100) *
                                          (char)((ulong)uVar140 >> 0x20) - (0xff < sStack_2c4),
                                          uVar166));
              uVar169 = CONCAT15((0 < sStack_2be) * (sStack_2be < 0x100) *
                                 (char)((ulong)extraout_XMM0_Qb >> 0x10) - (0xff < sStack_2be),
                                 CONCAT14((0 < sStack_2c0) * (sStack_2c0 < 0x100) *
                                          (char)extraout_XMM0_Qb - (0xff < sStack_2c0),uVar168));
              uVar140 = CONCAT17((0 < sStack_2ba) * (sStack_2ba < 0x100) *
                                 (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_2ba),
                                 CONCAT16((0 < sStack_2bc) * (sStack_2bc < 0x100) *
                                          (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                                          (0xff < sStack_2bc),uVar169));
              auVar170._0_10_ =
                   CONCAT19((0 < local_228._2_2_) * (local_228._2_2_ < 0x100) * auVar155[2] -
                            (0xff < local_228._2_2_),
                            CONCAT18((0 < (short)local_228) * ((short)local_228 < 0x100) *
                                     auVar155[0] - (0xff < (short)local_228),uVar140));
              auVar170[10] = (0 < local_228._4_2_) * (local_228._4_2_ < 0x100) * auVar155[4] -
                             (0xff < local_228._4_2_);
              auVar170[0xb] =
                   (0 < local_228._6_2_) * (local_228._6_2_ < 0x100) * auVar155[6] -
                   (0xff < local_228._6_2_);
              auVar171[0xc] =
                   (0 < (short)uStack_220) * ((short)uStack_220 < 0x100) * auVar155[8] -
                   (0xff < (short)uStack_220);
              auVar171._0_12_ = auVar170;
              auVar171[0xd] =
                   (0 < uStack_220._2_2_) * (uStack_220._2_2_ < 0x100) * auVar155[10] -
                   (0xff < uStack_220._2_2_);
              auVar176[0xe] =
                   (0 < uStack_220._4_2_) * (uStack_220._4_2_ < 0x100) * auVar155[0xc] -
                   (0xff < uStack_220._4_2_);
              auVar176._0_14_ = auVar171;
              auVar176[0xf] =
                   (0 < uStack_220._6_2_) * (uStack_220._6_2_ < 0x100) * auVar155[0xe] -
                   (0xff < uStack_220._6_2_);
              local_238._0_2_ = (short)uVar142;
              local_238._2_2_ = (short)((ulong)uVar142 >> 0x10);
              local_238._4_2_ = (short)((ulong)uVar142 >> 0x20);
              local_238._6_2_ = (short)((ulong)uVar142 >> 0x30);
              sStack_230 = (short)extraout_XMM0_Qb_01;
              sStack_22e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
              sStack_22c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
              sStack_22a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
              cVar12 = (char)((ulong)uVar142 >> 0x10);
              uVar202 = CONCAT11((0 < local_238._2_2_) * (local_238._2_2_ < 0x100) * cVar12 -
                                 (0xff < local_238._2_2_),
                                 (0 < (short)local_238) * ((short)local_238 < 0x100) * (char)uVar142
                                 - (0xff < (short)local_238));
              cVar60 = (char)((ulong)uVar142 >> 0x20);
              cVar61 = (char)((ulong)uVar142 >> 0x30);
              auVar217._0_4_ =
                   CONCAT13((0 < local_238._6_2_) * (local_238._6_2_ < 0x100) * cVar61 -
                            (0xff < local_238._6_2_),
                            CONCAT12((0 < local_238._4_2_) * (local_238._4_2_ < 0x100) * cVar60 -
                                     (0xff < local_238._4_2_),uVar202));
              auVar218._0_6_ =
                   CONCAT15((0 < sStack_22e) * (sStack_22e < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_22e),
                            CONCAT14((0 < sStack_230) * (sStack_230 < 0x100) *
                                     (char)extraout_XMM0_Qb_01 - (0xff < sStack_230),auVar217._0_4_)
                           );
              auVar219._0_8_ =
                   CONCAT17((0 < sStack_22a) * (sStack_22a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_22a),
                            CONCAT16((0 < sStack_22c) * (sStack_22c < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) -
                                     (0xff < sStack_22c),auVar218._0_6_));
              auVar220._0_10_ =
                   CONCAT19((0 < local_238._2_2_) * (local_238._2_2_ < 0x100) * cVar12 -
                            (0xff < local_238._2_2_),
                            CONCAT18((0 < (short)local_238) * ((short)local_238 < 0x100) *
                                     (char)uVar142 - (0xff < (short)local_238),auVar219._0_8_));
              auVar221[10] = (0 < local_238._4_2_) * (local_238._4_2_ < 0x100) * cVar60 -
                             (0xff < local_238._4_2_);
              auVar221._0_10_ = auVar220._0_10_;
              auVar221[0xb] =
                   (0 < local_238._6_2_) * (local_238._6_2_ < 0x100) * cVar61 -
                   (0xff < local_238._6_2_);
              sVar29 = (short)uVar143;
              sVar42 = (short)((ulong)uVar143 >> 0x10);
              uVar135 = CONCAT11((0 < sVar42) * (sVar42 < 0x100) * (char)((ulong)uVar143 >> 0x10) -
                                 (0xff < sVar42),
                                 (0 < sVar29) * (sVar29 < 0x100) * (char)uVar143 - (0xff < sVar29));
              sVar29 = (short)((ulong)uVar143 >> 0x20);
              sVar42 = (short)((ulong)uVar143 >> 0x30);
              uVar138 = CONCAT13((0 < sVar42) * (sVar42 < 0x100) * (char)((ulong)uVar143 >> 0x30) -
                                 (0xff < sVar42),
                                 CONCAT12((0 < sVar29) * (sVar29 < 0x100) *
                                          (char)((ulong)uVar143 >> 0x20) - (0xff < sVar29),uVar135))
              ;
              sVar29 = (short)extraout_XMM0_Qb_02;
              sVar42 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
              uVar139 = CONCAT15((0 < sVar42) * (sVar42 < 0x100) *
                                 (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sVar42),
                                 CONCAT14((0 < sVar29) * (sVar29 < 0x100) *
                                          (char)extraout_XMM0_Qb_02 - (0xff < sVar29),uVar138));
              sVar29 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
              sVar42 = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
              auVar221._12_2_ = (short)((ulong)auVar219._0_8_ >> 0x30);
              auVar221._14_2_ =
                   (short)(CONCAT17((0 < sVar42) * (sVar42 < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sVar42),
                                    CONCAT16((0 < sVar29) * (sVar29 < 0x100) *
                                             (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) -
                                             (0xff < sVar29),uVar139)) >> 0x30);
              auVar220._12_4_ = auVar221._12_4_;
              auVar220._10_2_ = (short)((uint6)uVar139 >> 0x20);
              auVar219._10_6_ = auVar220._10_6_;
              auVar219._8_2_ = (short)((uint6)auVar218._0_6_ >> 0x20);
              auVar218._8_8_ = auVar219._8_8_;
              auVar218._6_2_ = (short)((uint)uVar138 >> 0x10);
              auVar217._6_10_ = auVar218._6_10_;
              auVar217._4_2_ = (short)((uint)auVar217._0_4_ >> 0x10);
              uVar204 = CONCAT22(uVar135,uVar202);
              auVar154._12_2_ = (short)((ulong)uVar188 >> 0x30);
              auVar154._0_12_ = auVar189;
              auVar154._14_2_ = (short)((ulong)uVar140 >> 0x30);
              auVar153._12_4_ = auVar154._12_4_;
              auVar153._10_2_ = (short)((uint6)uVar169 >> 0x20);
              auVar153._0_10_ = auVar189._0_10_;
              auVar152._10_6_ = auVar153._10_6_;
              auVar152._8_2_ = (short)((uint6)uVar187 >> 0x20);
              auVar152._0_8_ = uVar188;
              auVar151._8_8_ = auVar152._8_8_;
              auVar151._6_2_ = (short)((uint)uVar168 >> 0x10);
              auVar151._0_6_ = uVar187;
              auVar150._6_10_ = auVar151._6_10_;
              auVar150._4_2_ = (short)((uint)uVar186 >> 0x10);
              auVar150._0_4_ = uVar186;
              auVar149._4_12_ = auVar150._4_12_;
              auVar149._0_4_ = CONCAT22(uVar166,uVar185);
              uVar138 = CONCAT22((short)((unkuint10)auVar170._0_10_ >> 0x40),
                                 (short)((unkuint10)auVar189._0_10_ >> 0x40));
              auVar190._0_8_ = CONCAT26(auVar170._10_2_,CONCAT24(auVar189._10_2_,uVar138));
              auVar190._8_2_ = auVar191._12_2_;
              auVar190._10_2_ = auVar171._12_2_;
              auVar201._12_2_ = auVar200._14_2_;
              auVar201._0_12_ = auVar190;
              auVar201._14_2_ = auVar176._14_2_;
              auVar177._0_8_ = auVar149._0_8_;
              auVar177._8_4_ = auVar150._4_4_;
              auVar177._12_4_ = (int)((ulong)auVar190._0_8_ >> 0x20);
              *(ulong *)*pauVar130 = CONCAT44(uVar138,auVar149._0_4_);
              *(undefined4 *)(*pauVar130 + 8) = uVar204;
              *(undefined4 *)(*pauVar130 + 0xc) = uVar204;
              puVar7 = (undefined8 *)(*pauVar130 + lVar122);
              *puVar7 = auVar177._8_8_;
              *(int *)(puVar7 + 2) = auVar217._4_4_;
              *(int *)((long)puVar7 + 0x14) = auVar217._4_4_;
              puVar8 = (undefined4 *)(*pauVar130 + lVar122 * 2);
              *puVar8 = auVar152._8_4_;
              puVar8[1] = auVar190._8_4_;
              puVar8[2] = auVar219._8_4_;
              puVar8[3] = auVar219._8_4_;
              *(undefined4 *)(*pauVar130 + lVar102 + 8) = auVar153._12_4_;
              *(int *)(*pauVar130 + lVar102 + 0xc) = auVar201._12_4_;
              *(undefined4 *)(pauVar130[1] + lVar102) = auVar220._12_4_;
              *(undefined4 *)(pauVar130[1] + lVar102 + 4) = auVar220._12_4_;
              local_1d8._8_8_ = uStack_190;
              local_1d8._0_8_ = local_198;
              local_1c8._8_8_ = uStack_180;
              local_1c8._0_8_ = local_188;
              local_1b8._8_4_ = uStack_170;
              local_1b8._0_8_ = local_178;
              local_1b8._12_4_ = uStack_16c;
              local_1a8._8_8_ = uStack_160;
              local_1a8._0_8_ = local_168;
              pauVar130 = (undefined1 (*) [16])(*pauVar130 + 0xc);
              iVar115 = iVar115 + 6;
            } while (iVar115 != 0);
            puVar129 = (ulong *)((long)puVar129 +
                                (long)(((iVar105 >> 1) - (iVar105 >> 0x1f)) + iVar116 * 8));
            pauVar130 = (undefined1 (*) [16])(*pauVar130 + (long)(iVar99 * 3) + 4);
            local_2e0 = local_2e0 - 8;
          } while (local_2e0 != 0);
          iVar116 = ((iVar132 + 5) / 6) * 6;
          uVar98 = iVar106 + 7U & 0xfffffff8;
          iVar106 = iVar116 * iVar99;
          iVar106 = (int)((ulong)((long)(iVar106 * 2) * 0x55555555) >> 0x20) + iVar106 * -2;
          lVar123 = (long)(iVar99 * 4);
          pauVar130 = local_350;
          do {
            local_1d8 = *pauVar130;
            local_1c8 = *(undefined1 (*) [16])(*pauVar130 + lVar122);
            local_1b8 = *(undefined1 (*) [16])(*pauVar130 + lVar122 * 2);
            local_1a8 = *(undefined1 (*) [16])(*pauVar130 + lVar102);
            iVar105 = ((iVar132 + 5) % 6 - iVar132) + -5;
            do {
              local_198 = *(undefined8 *)(*pauVar130 + lVar123);
              uStack_190 = *(undefined8 *)((long)(*pauVar130 + lVar123) + 8);
              local_188 = *(undefined8 *)(*pauVar130 + lVar123 + lVar122);
              uStack_180 = *(undefined8 *)((long)(*pauVar130 + lVar123 + lVar122) + 8);
              local_178 = *(undefined8 *)(*pauVar130 + lVar122 * 2 + lVar123);
              uVar140 = *(undefined8 *)((long)(*pauVar130 + lVar122 * 2 + lVar123) + 8);
              uStack_170 = (undefined4)uVar140;
              uStack_16c = (undefined4)((ulong)uVar140 >> 0x20);
              local_168 = *(undefined8 *)(*pauVar130 + lVar102 + lVar123);
              uStack_160 = *(undefined8 *)((long)(*pauVar130 + lVar102 + lVar123) + 8);
              pauVar130 = (undefined1 (*) [16])(*pauVar130 + lVar123);
              auVar155 = pmaddubsw(local_1d8,local_2f8);
              auVar205 = pmaddubsw(local_1c8,local_338);
              auVar193 = pmaddubsw(local_1b8,local_308);
              auVar192 = pmaddubsw(local_1a8,auVar144);
              auVar155 = paddsw(auVar192,auVar155);
              auVar155 = paddsw(auVar155,auVar205);
              auVar155 = paddsw(auVar155,auVar193);
              auVar192 = pmaddubsw(local_1c8,_DAT_004c7fb0);
              auVar155 = paddsw(auVar192,auVar155);
              auVar155 = paddsw(auVar155,_DAT_0050d570);
              auVar155 = psraw(auVar155,7);
              sVar29 = auVar155._0_2_;
              sVar42 = auVar155._2_2_;
              sVar30 = auVar155._4_2_;
              sVar31 = auVar155._6_2_;
              sVar32 = auVar155._8_2_;
              sVar33 = auVar155._10_2_;
              sVar34 = auVar155._12_2_;
              sVar35 = auVar155._14_2_;
              local_2d8[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar155[2] - (0xff < sVar42);
              local_2d8[0] = (0 < sVar29) * (sVar29 < 0x100) * auVar155[0] - (0xff < sVar29);
              local_2d8[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar155[4] - (0xff < sVar30);
              local_2d8[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar155[6] - (0xff < sVar31);
              local_2d8[4] = (0 < sVar32) * (sVar32 < 0x100) * auVar155[8] - (0xff < sVar32);
              local_2d8[5] = (0 < sVar33) * (sVar33 < 0x100) * auVar155[10] - (0xff < sVar33);
              local_2d8[6] = (0 < sVar34) * (sVar34 < 0x100) * auVar155[0xc] - (0xff < sVar34);
              local_2d8[7] = (0 < sVar35) * (sVar35 < 0x100) * auVar155[0xe] - (0xff < sVar35);
              local_2d8[8] = (0 < sVar29) * (sVar29 < 0x100) * auVar155[0] - (0xff < sVar29);
              local_2d8[9] = (0 < sVar42) * (sVar42 < 0x100) * auVar155[2] - (0xff < sVar42);
              local_2d8[10] = (0 < sVar30) * (sVar30 < 0x100) * auVar155[4] - (0xff < sVar30);
              local_2d8[0xb] = (0 < sVar31) * (sVar31 < 0x100) * auVar155[6] - (0xff < sVar31);
              local_2d8[0xc] = (0 < sVar32) * (sVar32 < 0x100) * auVar155[8] - (0xff < sVar32);
              local_2d8[0xd] = (0 < sVar33) * (sVar33 < 0x100) * auVar155[10] - (0xff < sVar33);
              local_2d8[0xe] = (0 < sVar34) * (sVar34 < 0x100) * auVar155[0xc] - (0xff < sVar34);
              local_2d8[0xf] = (0 < sVar35) * (sVar35 < 0x100) * auVar155[0xe] - (0xff < sVar35);
              uVar140 = (*pcVar10)(local_1d8 + lVar108,local_d8);
              uVar141 = (*pcVar11)(local_1d8 + lVar100,local_88);
              uStack_220 = extraout_XMM0_Qb_04;
              local_228 = uVar141;
              auVar155 = _local_228;
              auVar70._8_8_ = uStack_190;
              auVar70._0_8_ = local_198;
              auVar72._8_8_ = uStack_180;
              auVar72._0_8_ = local_188;
              auVar192 = pmaddubsw(local_1b8,local_2f8);
              auVar708 = pmaddubsw(local_1a8,local_338);
              auVar193 = pmaddubsw(auVar70,local_308);
              auVar205 = pmaddubsw(auVar72,auVar144);
              auVar192 = paddsw(auVar205,auVar192);
              auVar192 = paddsw(auVar192,auVar708);
              auVar192 = paddsw(auVar192,auVar193);
              auVar193 = pmaddubsw(local_1a8,_DAT_004c7fb0);
              auVar192 = paddsw(auVar193,auVar192);
              auVar192 = paddsw(auVar192,_DAT_0050d570);
              auVar192 = psraw(auVar192,7);
              sVar29 = auVar192._0_2_;
              sVar42 = auVar192._2_2_;
              sVar30 = auVar192._4_2_;
              sVar31 = auVar192._6_2_;
              sVar32 = auVar192._8_2_;
              sVar33 = auVar192._10_2_;
              sVar34 = auVar192._12_2_;
              sVar35 = auVar192._14_2_;
              local_238._0_2_ =
                   CONCAT11((0 < sVar42) * (sVar42 < 0x100) * auVar192[2] - (0xff < sVar42),
                            (0 < sVar29) * (sVar29 < 0x100) * auVar192[0] - (0xff < sVar29));
              local_238 = (uint8_t *)
                          CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar192[0xe] - (0xff < sVar35)
                                   ,CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar192[0xc] -
                                             (0xff < sVar34),
                                             CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar192[10]
                                                      - (0xff < sVar33),
                                                      CONCAT14((0 < sVar32) * (sVar32 < 0x100) *
                                                               auVar192[8] - (0xff < sVar32),
                                                               CONCAT13((0 < sVar31) *
                                                                        (sVar31 < 0x100) *
                                                                        auVar192[6] -
                                                                        (0xff < sVar31),
                                                                        CONCAT12((0 < sVar30) *
                                                                                 (sVar30 < 0x100) *
                                                                                 auVar192[4] -
                                                                                 (0xff < sVar30),
                                                                                 (short)local_238)))
                                                     )));
              uVar142 = (*pcVar10)(local_1b8 + lVar108,local_d8);
              uVar143 = (*pcVar11)(local_1b8 + lVar100,local_88);
              local_228._0_2_ = (short)uVar141;
              local_228._2_2_ = (short)((ulong)uVar141 >> 0x10);
              local_228._4_2_ = (short)((ulong)uVar141 >> 0x20);
              local_228._6_2_ = (short)((ulong)uVar141 >> 0x30);
              uStack_220._0_2_ = (short)extraout_XMM0_Qb_04;
              uStack_220._2_2_ = (short)((ulong)extraout_XMM0_Qb_04 >> 0x10);
              uStack_220._4_2_ = (short)((ulong)extraout_XMM0_Qb_04 >> 0x20);
              uStack_220._6_2_ = (short)((ulong)extraout_XMM0_Qb_04 >> 0x30);
              local_248._0_2_ = (short)uVar142;
              local_248._2_2_ = (short)((ulong)uVar142 >> 0x10);
              local_248._4_2_ = (short)((ulong)uVar142 >> 0x20);
              local_248._6_2_ = (short)((ulong)uVar142 >> 0x30);
              sStack_240 = (short)extraout_XMM0_Qb_05;
              sStack_23e = (short)((ulong)extraout_XMM0_Qb_05 >> 0x10);
              sStack_23c = (short)((ulong)extraout_XMM0_Qb_05 >> 0x20);
              sStack_23a = (short)((ulong)extraout_XMM0_Qb_05 >> 0x30);
              *(undefined8 *)puVar111 = local_2d8._0_8_;
              local_288._0_2_ = (short)uVar140;
              local_288._2_2_ = (short)((ulong)uVar140 >> 0x10);
              local_288._4_2_ = (short)((ulong)uVar140 >> 0x20);
              local_288._6_2_ = (short)((ulong)uVar140 >> 0x30);
              sStack_280 = (short)extraout_XMM0_Qb_03;
              sStack_27e = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
              sStack_27c = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
              sStack_27a = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
              *(ulong *)(puVar111 + iVar117) =
                   CONCAT17((0 < sStack_27a) * (sStack_27a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_03 >> 0x30) - (0xff < sStack_27a),
                            CONCAT16((0 < sStack_27c) * (sStack_27c < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_03 >> 0x20) -
                                     (0xff < sStack_27c),
                                     CONCAT15((0 < sStack_27e) * (sStack_27e < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_03 >> 0x10) -
                                              (0xff < sStack_27e),
                                              CONCAT14((0 < sStack_280) * (sStack_280 < 0x100) *
                                                       (char)extraout_XMM0_Qb_03 -
                                                       (0xff < sStack_280),
                                                       CONCAT13((0 < local_288._6_2_) *
                                                                (local_288._6_2_ < 0x100) *
                                                                (char)((ulong)uVar140 >> 0x30) -
                                                                (0xff < local_288._6_2_),
                                                                CONCAT12((0 < local_288._4_2_) *
                                                                         (local_288._4_2_ < 0x100) *
                                                                         (char)((ulong)uVar140 >>
                                                                               0x20) -
                                                                         (0xff < local_288._4_2_),
                                                                         CONCAT11((0 < local_288.
                                                                                       _2_2_) *
                                                                                  (local_288._2_2_ <
                                                                                  0x100) * (char)((
                                                  ulong)uVar140 >> 0x10) - (0xff < local_288._2_2_),
                                                  (0 < (short)local_288) *
                                                  ((short)local_288 < 0x100) * (char)uVar140 -
                                                  (0xff < (short)local_288))))))));
              *(ulong *)(puVar111 + iVar117 * 2) =
                   CONCAT17((0 < uStack_220._6_2_) * (uStack_220._6_2_ < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_04 >> 0x30) - (0xff < uStack_220._6_2_),
                            CONCAT16((0 < uStack_220._4_2_) * (uStack_220._4_2_ < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_04 >> 0x20) -
                                     (0xff < uStack_220._4_2_),
                                     CONCAT15((0 < uStack_220._2_2_) * (uStack_220._2_2_ < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_04 >> 0x10) -
                                              (0xff < uStack_220._2_2_),
                                              CONCAT14((0 < (short)uStack_220) *
                                                       ((short)uStack_220 < 0x100) *
                                                       (char)extraout_XMM0_Qb_04 -
                                                       (0xff < (short)uStack_220),
                                                       CONCAT13((0 < local_228._6_2_) *
                                                                (local_228._6_2_ < 0x100) *
                                                                (char)((ulong)uVar141 >> 0x30) -
                                                                (0xff < local_228._6_2_),
                                                                CONCAT12((0 < local_228._4_2_) *
                                                                         (local_228._4_2_ < 0x100) *
                                                                         (char)((ulong)uVar141 >>
                                                                               0x20) -
                                                                         (0xff < local_228._4_2_),
                                                                         CONCAT11((0 < local_228.
                                                                                       _2_2_) *
                                                                                  (local_228._2_2_ <
                                                                                  0x100) * (char)((
                                                  ulong)uVar141 >> 0x10) - (0xff < local_228._2_2_),
                                                  (0 < (short)local_228) *
                                                  ((short)local_228 < 0x100) * (char)uVar141 -
                                                  (0xff < (short)local_228))))))));
              *(uint8_t **)(puVar111 + iVar117 * 3) = local_238;
              *(ulong *)(puVar111 + iVar117 * 4) =
                   CONCAT17((0 < sStack_23a) * (sStack_23a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_05 >> 0x30) - (0xff < sStack_23a),
                            CONCAT16((0 < sStack_23c) * (sStack_23c < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_05 >> 0x20) -
                                     (0xff < sStack_23c),
                                     CONCAT15((0 < sStack_23e) * (sStack_23e < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_05 >> 0x10) -
                                              (0xff < sStack_23e),
                                              CONCAT14((0 < sStack_240) * (sStack_240 < 0x100) *
                                                       (char)extraout_XMM0_Qb_05 -
                                                       (0xff < sStack_240),
                                                       CONCAT13((0 < local_248._6_2_) *
                                                                (local_248._6_2_ < 0x100) *
                                                                (char)((ulong)uVar142 >> 0x30) -
                                                                (0xff < local_248._6_2_),
                                                                CONCAT12((0 < local_248._4_2_) *
                                                                         (local_248._4_2_ < 0x100) *
                                                                         (char)((ulong)uVar142 >>
                                                                               0x20) -
                                                                         (0xff < local_248._4_2_),
                                                                         CONCAT11((0 < local_248.
                                                                                       _2_2_) *
                                                                                  (local_248._2_2_ <
                                                                                  0x100) * (char)((
                                                  ulong)uVar142 >> 0x10) - (0xff < local_248._2_2_),
                                                  (0 < (short)local_248) *
                                                  ((short)local_248 < 0x100) * (char)uVar142 -
                                                  (0xff < (short)local_248))))))));
              sVar29 = (short)uVar143;
              sVar42 = (short)((ulong)uVar143 >> 0x10);
              sVar30 = (short)((ulong)uVar143 >> 0x20);
              sVar31 = (short)((ulong)uVar143 >> 0x30);
              sVar32 = (short)extraout_XMM0_Qb_06;
              sVar33 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x10);
              sVar34 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x20);
              sVar35 = (short)((ulong)extraout_XMM0_Qb_06 >> 0x30);
              *(ulong *)(puVar111 + iVar117 * 5) =
                   CONCAT17((0 < sVar35) * (sVar35 < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_06 >> 0x30) - (0xff < sVar35),
                            CONCAT16((0 < sVar34) * (sVar34 < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_06 >> 0x20) - (0xff < sVar34),
                                     CONCAT15((0 < sVar33) * (sVar33 < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_06 >> 0x10) -
                                              (0xff < sVar33),
                                              CONCAT14((0 < sVar32) * (sVar32 < 0x100) *
                                                       (char)extraout_XMM0_Qb_06 - (0xff < sVar32),
                                                       CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                (char)((ulong)uVar143 >> 0x30) -
                                                                (0xff < sVar31),
                                                                CONCAT12((0 < sVar30) *
                                                                         (sVar30 < 0x100) *
                                                                         (char)((ulong)uVar143 >>
                                                                               0x20) -
                                                                         (0xff < sVar30),
                                                                         CONCAT11((0 < sVar42) *
                                                                                  (sVar42 < 0x100) *
                                                                                  (char)((ulong)
                                                  uVar143 >> 0x10) - (0xff < sVar42),
                                                  (0 < sVar29) * (sVar29 < 0x100) * (char)uVar143 -
                                                  (0xff < sVar29))))))));
              local_1d8._8_8_ = uStack_190;
              local_1d8._0_8_ = local_198;
              local_1c8._8_8_ = uStack_180;
              local_1c8._0_8_ = local_188;
              local_1b8._8_4_ = uStack_170;
              local_1b8._0_8_ = local_178;
              local_1b8._12_4_ = uStack_16c;
              local_1a8._8_8_ = uStack_160;
              local_1a8._0_8_ = local_168;
              puVar111 = puVar111 + (long)iVar117 * 6;
              iVar105 = iVar105 + 6;
            } while (iVar105 != 0);
            pauVar130 = (undefined1 (*) [16])(pauVar130[1] + ((iVar106 >> 1) - (iVar106 >> 0x1f)));
            puVar111 = puVar111 + (8 - (long)(iVar116 * iVar117));
            uVar98 = uVar98 - 8;
            _local_228 = auVar155;
          } while (uVar98 != 0);
        }
        else {
          local_350 = (undefined1 (*) [16])
                      malloc((long)(int)(((src->field_2).field_0.y_crop_width * 8 + 8U & 0xfffffff0)
                                         + 0x38 & 0xffffffc0));
          if (local_350 == (undefined1 (*) [16])0x0) goto LAB_003eac04;
          local_238 = src->store_buf_adr[uVar118 - 4];
          lVar122 = (long)*(int *)((long)src->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          local_288 = dst->store_buf_adr[uVar118 - 4];
          lVar102 = (long)*(int *)((long)dst->store_buf_adr + ((ulong)((uint)bVar134 * 4) - 0x28));
          auVar155 = *(undefined1 (*) [16])(pIVar107->filter_ptr + 0x40);
          uVar98 = iVar116 + 7U & 0xfffffff8;
          auVar144 = pshufb(auVar155,_DAT_0050d5a0);
          auVar192 = pshufb(auVar155,_DAT_0050d5f0);
          auVar193 = pshufb(auVar155,_DAT_0050d5c0);
          auVar155 = pshufb(auVar155,_DAT_0050d600);
          local_338._0_8_ = local_238 + lVar122 * -3;
          lVar123 = 0;
          do {
            uVar127 = *(ulong *)(local_338._0_8_ + lVar123 + -3);
            uVar140 = *(undefined8 *)(local_338._0_8_ + lVar123 + -2);
            auVar712._8_6_ = 0;
            auVar712._0_8_ = uVar127;
            auVar712[0xe] = (char)(uVar127 >> 0x38);
            auVar712[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar711._14_2_ = auVar712._14_2_;
            auVar711._8_5_ = 0;
            auVar711._0_8_ = uVar127;
            auVar711[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar718._13_3_ = auVar711._13_3_;
            auVar718._8_4_ = 0;
            auVar718._0_8_ = uVar127;
            auVar718[0xc] = (char)(uVar127 >> 0x30);
            auVar731._12_4_ = auVar718._12_4_;
            auVar731._8_3_ = 0;
            auVar731._0_8_ = uVar127;
            auVar731[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar728._11_5_ = auVar731._11_5_;
            auVar728._8_2_ = 0;
            auVar728._0_8_ = uVar127;
            auVar728[10] = (char)(uVar127 >> 0x28);
            auVar205._10_6_ = auVar728._10_6_;
            auVar205[8] = 0;
            auVar205._0_8_ = uVar127;
            auVar205[9] = (char)((ulong)uVar140 >> 0x20);
            auVar709._9_7_ = auVar205._9_7_;
            auVar709[8] = (char)(uVar127 >> 0x20);
            auVar709._0_8_ = uVar127;
            auVar708._8_8_ = auVar709._8_8_;
            auVar708[7] = (char)((ulong)uVar140 >> 0x18);
            auVar708[6] = (char)(uVar127 >> 0x18);
            auVar708[5] = (char)((ulong)uVar140 >> 0x10);
            auVar708[4] = (char)(uVar127 >> 0x10);
            auVar708[3] = (char)((ulong)uVar140 >> 8);
            auVar708[2] = (char)(uVar127 >> 8);
            auVar708[0] = (undefined1)uVar127;
            auVar708[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_338._0_8_ + lVar123 + -1);
            uVar140 = *(undefined8 *)(local_338._0_8_ + lVar123);
            auVar343._8_6_ = 0;
            auVar343._0_8_ = uVar127;
            auVar343[0xe] = (char)(uVar127 >> 0x38);
            auVar343[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar342._14_2_ = auVar343._14_2_;
            auVar342._8_5_ = 0;
            auVar342._0_8_ = uVar127;
            auVar342[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar341._13_3_ = auVar342._13_3_;
            auVar341._8_4_ = 0;
            auVar341._0_8_ = uVar127;
            auVar341[0xc] = (char)(uVar127 >> 0x30);
            auVar723._12_4_ = auVar341._12_4_;
            auVar723._8_3_ = 0;
            auVar723._0_8_ = uVar127;
            auVar723[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar340._11_5_ = auVar723._11_5_;
            auVar340._8_2_ = 0;
            auVar340._0_8_ = uVar127;
            auVar340[10] = (char)(uVar127 >> 0x28);
            auVar339._10_6_ = auVar340._10_6_;
            auVar339[8] = 0;
            auVar339._0_8_ = uVar127;
            auVar339[9] = (char)((ulong)uVar140 >> 0x20);
            auVar338._9_7_ = auVar339._9_7_;
            auVar338[8] = (char)(uVar127 >> 0x20);
            auVar338._0_8_ = uVar127;
            auVar337._8_8_ = auVar338._8_8_;
            auVar337[7] = (char)((ulong)uVar140 >> 0x18);
            auVar337[6] = (char)(uVar127 >> 0x18);
            auVar337[5] = (char)((ulong)uVar140 >> 0x10);
            auVar337[4] = (char)(uVar127 >> 0x10);
            auVar337[3] = (char)((ulong)uVar140 >> 8);
            auVar337[2] = (char)(uVar127 >> 8);
            auVar337[0] = (undefined1)uVar127;
            auVar337[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_338._0_8_ + lVar123 + 1);
            uVar140 = *(undefined8 *)(local_338._0_8_ + lVar123 + 2);
            auVar452._8_6_ = 0;
            auVar452._0_8_ = uVar127;
            auVar452[0xe] = (char)(uVar127 >> 0x38);
            auVar452[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar451._14_2_ = auVar452._14_2_;
            auVar451._8_5_ = 0;
            auVar451._0_8_ = uVar127;
            auVar451[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar450._13_3_ = auVar451._13_3_;
            auVar450._8_4_ = 0;
            auVar450._0_8_ = uVar127;
            auVar450[0xc] = (char)(uVar127 >> 0x30);
            auVar449._12_4_ = auVar450._12_4_;
            auVar449._8_3_ = 0;
            auVar449._0_8_ = uVar127;
            auVar449[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar448._11_5_ = auVar449._11_5_;
            auVar448._8_2_ = 0;
            auVar448._0_8_ = uVar127;
            auVar448[10] = (char)(uVar127 >> 0x28);
            auVar447._10_6_ = auVar448._10_6_;
            auVar447[8] = 0;
            auVar447._0_8_ = uVar127;
            auVar447[9] = (char)((ulong)uVar140 >> 0x20);
            auVar446._9_7_ = auVar447._9_7_;
            auVar446[8] = (char)(uVar127 >> 0x20);
            auVar446._0_8_ = uVar127;
            auVar445._8_8_ = auVar446._8_8_;
            auVar445[7] = (char)((ulong)uVar140 >> 0x18);
            auVar445[6] = (char)(uVar127 >> 0x18);
            auVar445[5] = (char)((ulong)uVar140 >> 0x10);
            auVar445[4] = (char)(uVar127 >> 0x10);
            auVar445[3] = (char)((ulong)uVar140 >> 8);
            auVar445[2] = (char)(uVar127 >> 8);
            auVar445[0] = (undefined1)uVar127;
            auVar445[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_338._0_8_ + lVar123 + 3);
            uVar140 = *(undefined8 *)(local_338._0_8_ + lVar123 + 4);
            auVar568._8_6_ = 0;
            auVar568._0_8_ = uVar127;
            auVar568[0xe] = (char)(uVar127 >> 0x38);
            auVar568[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar567._14_2_ = auVar568._14_2_;
            auVar567._8_5_ = 0;
            auVar567._0_8_ = uVar127;
            auVar567[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar566._13_3_ = auVar567._13_3_;
            auVar566._8_4_ = 0;
            auVar566._0_8_ = uVar127;
            auVar566[0xc] = (char)(uVar127 >> 0x30);
            auVar565._12_4_ = auVar566._12_4_;
            auVar565._8_3_ = 0;
            auVar565._0_8_ = uVar127;
            auVar565[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar564._11_5_ = auVar565._11_5_;
            auVar564._8_2_ = 0;
            auVar564._0_8_ = uVar127;
            auVar564[10] = (char)(uVar127 >> 0x28);
            auVar563._10_6_ = auVar564._10_6_;
            auVar563[8] = 0;
            auVar563._0_8_ = uVar127;
            auVar563[9] = (char)((ulong)uVar140 >> 0x20);
            auVar562._9_7_ = auVar563._9_7_;
            auVar562[8] = (char)(uVar127 >> 0x20);
            auVar562._0_8_ = uVar127;
            auVar561._8_8_ = auVar562._8_8_;
            auVar561[7] = (char)((ulong)uVar140 >> 0x18);
            auVar561[6] = (char)(uVar127 >> 0x18);
            auVar561[5] = (char)((ulong)uVar140 >> 0x10);
            auVar561[4] = (char)(uVar127 >> 0x10);
            auVar561[3] = (char)((ulong)uVar140 >> 8);
            auVar561[2] = (char)(uVar127 >> 8);
            auVar561[0] = (undefined1)uVar127;
            auVar561[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar708,auVar144);
            auVar708 = pmaddubsw(auVar337,auVar192);
            auVar709 = pmaddubsw(auVar445,auVar193);
            auVar728 = pmaddubsw(auVar561,auVar155);
            auVar569._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar569._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar569._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar569._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar569._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar569._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar569._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar569._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar453._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar453._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar453._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar453._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar453._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar453._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar453._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar453._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar453,auVar569);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*local_350 + lVar123) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar123 = lVar123 + 8;
          } while (uVar98 != (uint)lVar123);
          puVar111 = local_238 + lVar122 * -2;
          lVar123 = 0;
          do {
            uVar127 = *(ulong *)(puVar111 + lVar123 + -3);
            uVar140 = *(undefined8 *)(puVar111 + lVar123 + -2);
            auVar246._8_6_ = 0;
            auVar246._0_8_ = uVar127;
            auVar246[0xe] = (char)(uVar127 >> 0x38);
            auVar246[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar245._14_2_ = auVar246._14_2_;
            auVar245._8_5_ = 0;
            auVar245._0_8_ = uVar127;
            auVar245[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar244._13_3_ = auVar245._13_3_;
            auVar244._8_4_ = 0;
            auVar244._0_8_ = uVar127;
            auVar244[0xc] = (char)(uVar127 >> 0x30);
            auVar243._12_4_ = auVar244._12_4_;
            auVar243._8_3_ = 0;
            auVar243._0_8_ = uVar127;
            auVar243[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar242._11_5_ = auVar243._11_5_;
            auVar242._8_2_ = 0;
            auVar242._0_8_ = uVar127;
            auVar242[10] = (char)(uVar127 >> 0x28);
            auVar241._10_6_ = auVar242._10_6_;
            auVar241[8] = 0;
            auVar241._0_8_ = uVar127;
            auVar241[9] = (char)((ulong)uVar140 >> 0x20);
            auVar240._9_7_ = auVar241._9_7_;
            auVar240[8] = (char)(uVar127 >> 0x20);
            auVar240._0_8_ = uVar127;
            auVar239._8_8_ = auVar240._8_8_;
            auVar239[7] = (char)((ulong)uVar140 >> 0x18);
            auVar239[6] = (char)(uVar127 >> 0x18);
            auVar239[5] = (char)((ulong)uVar140 >> 0x10);
            auVar239[4] = (char)(uVar127 >> 0x10);
            auVar239[3] = (char)((ulong)uVar140 >> 8);
            auVar239[2] = (char)(uVar127 >> 8);
            auVar239[0] = (undefined1)uVar127;
            auVar239[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar111 + lVar123 + -1);
            uVar140 = *(undefined8 *)(puVar111 + lVar123);
            auVar351._8_6_ = 0;
            auVar351._0_8_ = uVar127;
            auVar351[0xe] = (char)(uVar127 >> 0x38);
            auVar351[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar350._14_2_ = auVar351._14_2_;
            auVar350._8_5_ = 0;
            auVar350._0_8_ = uVar127;
            auVar350[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar349._13_3_ = auVar350._13_3_;
            auVar349._8_4_ = 0;
            auVar349._0_8_ = uVar127;
            auVar349[0xc] = (char)(uVar127 >> 0x30);
            auVar348._12_4_ = auVar349._12_4_;
            auVar348._8_3_ = 0;
            auVar348._0_8_ = uVar127;
            auVar348[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar347._11_5_ = auVar348._11_5_;
            auVar347._8_2_ = 0;
            auVar347._0_8_ = uVar127;
            auVar347[10] = (char)(uVar127 >> 0x28);
            auVar346._10_6_ = auVar347._10_6_;
            auVar346[8] = 0;
            auVar346._0_8_ = uVar127;
            auVar346[9] = (char)((ulong)uVar140 >> 0x20);
            auVar345._9_7_ = auVar346._9_7_;
            auVar345[8] = (char)(uVar127 >> 0x20);
            auVar345._0_8_ = uVar127;
            auVar344._8_8_ = auVar345._8_8_;
            auVar344[7] = (char)((ulong)uVar140 >> 0x18);
            auVar344[6] = (char)(uVar127 >> 0x18);
            auVar344[5] = (char)((ulong)uVar140 >> 0x10);
            auVar344[4] = (char)(uVar127 >> 0x10);
            auVar344[3] = (char)((ulong)uVar140 >> 8);
            auVar344[2] = (char)(uVar127 >> 8);
            auVar344[0] = (undefined1)uVar127;
            auVar344[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar111 + lVar123 + 1);
            uVar140 = *(undefined8 *)(puVar111 + lVar123 + 2);
            auVar461._8_6_ = 0;
            auVar461._0_8_ = uVar127;
            auVar461[0xe] = (char)(uVar127 >> 0x38);
            auVar461[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar460._14_2_ = auVar461._14_2_;
            auVar460._8_5_ = 0;
            auVar460._0_8_ = uVar127;
            auVar460[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar459._13_3_ = auVar460._13_3_;
            auVar459._8_4_ = 0;
            auVar459._0_8_ = uVar127;
            auVar459[0xc] = (char)(uVar127 >> 0x30);
            auVar458._12_4_ = auVar459._12_4_;
            auVar458._8_3_ = 0;
            auVar458._0_8_ = uVar127;
            auVar458[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar457._11_5_ = auVar458._11_5_;
            auVar457._8_2_ = 0;
            auVar457._0_8_ = uVar127;
            auVar457[10] = (char)(uVar127 >> 0x28);
            auVar456._10_6_ = auVar457._10_6_;
            auVar456[8] = 0;
            auVar456._0_8_ = uVar127;
            auVar456[9] = (char)((ulong)uVar140 >> 0x20);
            auVar455._9_7_ = auVar456._9_7_;
            auVar455[8] = (char)(uVar127 >> 0x20);
            auVar455._0_8_ = uVar127;
            auVar454._8_8_ = auVar455._8_8_;
            auVar454[7] = (char)((ulong)uVar140 >> 0x18);
            auVar454[6] = (char)(uVar127 >> 0x18);
            auVar454[5] = (char)((ulong)uVar140 >> 0x10);
            auVar454[4] = (char)(uVar127 >> 0x10);
            auVar454[3] = (char)((ulong)uVar140 >> 8);
            auVar454[2] = (char)(uVar127 >> 8);
            auVar454[0] = (undefined1)uVar127;
            auVar454[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar111 + lVar123 + 3);
            uVar140 = *(undefined8 *)(puVar111 + lVar123 + 4);
            auVar577._8_6_ = 0;
            auVar577._0_8_ = uVar127;
            auVar577[0xe] = (char)(uVar127 >> 0x38);
            auVar577[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar576._14_2_ = auVar577._14_2_;
            auVar576._8_5_ = 0;
            auVar576._0_8_ = uVar127;
            auVar576[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar575._13_3_ = auVar576._13_3_;
            auVar575._8_4_ = 0;
            auVar575._0_8_ = uVar127;
            auVar575[0xc] = (char)(uVar127 >> 0x30);
            auVar574._12_4_ = auVar575._12_4_;
            auVar574._8_3_ = 0;
            auVar574._0_8_ = uVar127;
            auVar574[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar573._11_5_ = auVar574._11_5_;
            auVar573._8_2_ = 0;
            auVar573._0_8_ = uVar127;
            auVar573[10] = (char)(uVar127 >> 0x28);
            auVar572._10_6_ = auVar573._10_6_;
            auVar572[8] = 0;
            auVar572._0_8_ = uVar127;
            auVar572[9] = (char)((ulong)uVar140 >> 0x20);
            auVar571._9_7_ = auVar572._9_7_;
            auVar571[8] = (char)(uVar127 >> 0x20);
            auVar571._0_8_ = uVar127;
            auVar570._8_8_ = auVar571._8_8_;
            auVar570[7] = (char)((ulong)uVar140 >> 0x18);
            auVar570[6] = (char)(uVar127 >> 0x18);
            auVar570[5] = (char)((ulong)uVar140 >> 0x10);
            auVar570[4] = (char)(uVar127 >> 0x10);
            auVar570[3] = (char)((ulong)uVar140 >> 8);
            auVar570[2] = (char)(uVar127 >> 8);
            auVar570[0] = (undefined1)uVar127;
            auVar570[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar239,auVar144);
            auVar708 = pmaddubsw(auVar344,auVar192);
            auVar709 = pmaddubsw(auVar454,auVar193);
            auVar728 = pmaddubsw(auVar570,auVar155);
            auVar578._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar578._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar578._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar578._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar578._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar578._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar578._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar578._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar462._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar462._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar462._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar462._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar462._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar462._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar462._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar462._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar462,auVar578);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*(undefined1 (*) [16])(*local_350 + (int)uVar98) + lVar123) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar123 = lVar123 + 8;
          } while (uVar98 != (uint)lVar123);
          lVar123 = (long)local_238 - lVar122;
          lVar131 = 0;
          do {
            uVar127 = *(ulong *)(lVar123 + -3 + lVar131);
            uVar140 = *(undefined8 *)(lVar123 + -2 + lVar131);
            auVar254._8_6_ = 0;
            auVar254._0_8_ = uVar127;
            auVar254[0xe] = (char)(uVar127 >> 0x38);
            auVar254[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar253._14_2_ = auVar254._14_2_;
            auVar253._8_5_ = 0;
            auVar253._0_8_ = uVar127;
            auVar253[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar252._13_3_ = auVar253._13_3_;
            auVar252._8_4_ = 0;
            auVar252._0_8_ = uVar127;
            auVar252[0xc] = (char)(uVar127 >> 0x30);
            auVar251._12_4_ = auVar252._12_4_;
            auVar251._8_3_ = 0;
            auVar251._0_8_ = uVar127;
            auVar251[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar250._11_5_ = auVar251._11_5_;
            auVar250._8_2_ = 0;
            auVar250._0_8_ = uVar127;
            auVar250[10] = (char)(uVar127 >> 0x28);
            auVar249._10_6_ = auVar250._10_6_;
            auVar249[8] = 0;
            auVar249._0_8_ = uVar127;
            auVar249[9] = (char)((ulong)uVar140 >> 0x20);
            auVar248._9_7_ = auVar249._9_7_;
            auVar248[8] = (char)(uVar127 >> 0x20);
            auVar248._0_8_ = uVar127;
            auVar247._8_8_ = auVar248._8_8_;
            auVar247[7] = (char)((ulong)uVar140 >> 0x18);
            auVar247[6] = (char)(uVar127 >> 0x18);
            auVar247[5] = (char)((ulong)uVar140 >> 0x10);
            auVar247[4] = (char)(uVar127 >> 0x10);
            auVar247[3] = (char)((ulong)uVar140 >> 8);
            auVar247[2] = (char)(uVar127 >> 8);
            auVar247[0] = (undefined1)uVar127;
            auVar247[1] = (char)uVar140;
            uVar127 = *(ulong *)(lVar123 + -1 + lVar131);
            uVar140 = *(undefined8 *)(lVar123 + lVar131);
            auVar359._8_6_ = 0;
            auVar359._0_8_ = uVar127;
            auVar359[0xe] = (char)(uVar127 >> 0x38);
            auVar359[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar358._14_2_ = auVar359._14_2_;
            auVar358._8_5_ = 0;
            auVar358._0_8_ = uVar127;
            auVar358[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar357._13_3_ = auVar358._13_3_;
            auVar357._8_4_ = 0;
            auVar357._0_8_ = uVar127;
            auVar357[0xc] = (char)(uVar127 >> 0x30);
            auVar356._12_4_ = auVar357._12_4_;
            auVar356._8_3_ = 0;
            auVar356._0_8_ = uVar127;
            auVar356[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar355._11_5_ = auVar356._11_5_;
            auVar355._8_2_ = 0;
            auVar355._0_8_ = uVar127;
            auVar355[10] = (char)(uVar127 >> 0x28);
            auVar354._10_6_ = auVar355._10_6_;
            auVar354[8] = 0;
            auVar354._0_8_ = uVar127;
            auVar354[9] = (char)((ulong)uVar140 >> 0x20);
            auVar353._9_7_ = auVar354._9_7_;
            auVar353[8] = (char)(uVar127 >> 0x20);
            auVar353._0_8_ = uVar127;
            auVar352._8_8_ = auVar353._8_8_;
            auVar352[7] = (char)((ulong)uVar140 >> 0x18);
            auVar352[6] = (char)(uVar127 >> 0x18);
            auVar352[5] = (char)((ulong)uVar140 >> 0x10);
            auVar352[4] = (char)(uVar127 >> 0x10);
            auVar352[3] = (char)((ulong)uVar140 >> 8);
            auVar352[2] = (char)(uVar127 >> 8);
            auVar352[0] = (undefined1)uVar127;
            auVar352[1] = (char)uVar140;
            uVar127 = *(ulong *)(lVar123 + 1 + lVar131);
            uVar140 = *(undefined8 *)(lVar123 + 2 + lVar131);
            auVar470._8_6_ = 0;
            auVar470._0_8_ = uVar127;
            auVar470[0xe] = (char)(uVar127 >> 0x38);
            auVar470[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar469._14_2_ = auVar470._14_2_;
            auVar469._8_5_ = 0;
            auVar469._0_8_ = uVar127;
            auVar469[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar468._13_3_ = auVar469._13_3_;
            auVar468._8_4_ = 0;
            auVar468._0_8_ = uVar127;
            auVar468[0xc] = (char)(uVar127 >> 0x30);
            auVar467._12_4_ = auVar468._12_4_;
            auVar467._8_3_ = 0;
            auVar467._0_8_ = uVar127;
            auVar467[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar466._11_5_ = auVar467._11_5_;
            auVar466._8_2_ = 0;
            auVar466._0_8_ = uVar127;
            auVar466[10] = (char)(uVar127 >> 0x28);
            auVar465._10_6_ = auVar466._10_6_;
            auVar465[8] = 0;
            auVar465._0_8_ = uVar127;
            auVar465[9] = (char)((ulong)uVar140 >> 0x20);
            auVar464._9_7_ = auVar465._9_7_;
            auVar464[8] = (char)(uVar127 >> 0x20);
            auVar464._0_8_ = uVar127;
            auVar463._8_8_ = auVar464._8_8_;
            auVar463[7] = (char)((ulong)uVar140 >> 0x18);
            auVar463[6] = (char)(uVar127 >> 0x18);
            auVar463[5] = (char)((ulong)uVar140 >> 0x10);
            auVar463[4] = (char)(uVar127 >> 0x10);
            auVar463[3] = (char)((ulong)uVar140 >> 8);
            auVar463[2] = (char)(uVar127 >> 8);
            auVar463[0] = (undefined1)uVar127;
            auVar463[1] = (char)uVar140;
            uVar127 = *(ulong *)(lVar123 + 3 + lVar131);
            uVar140 = *(undefined8 *)(lVar123 + 4 + lVar131);
            auVar586._8_6_ = 0;
            auVar586._0_8_ = uVar127;
            auVar586[0xe] = (char)(uVar127 >> 0x38);
            auVar586[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar585._14_2_ = auVar586._14_2_;
            auVar585._8_5_ = 0;
            auVar585._0_8_ = uVar127;
            auVar585[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar584._13_3_ = auVar585._13_3_;
            auVar584._8_4_ = 0;
            auVar584._0_8_ = uVar127;
            auVar584[0xc] = (char)(uVar127 >> 0x30);
            auVar583._12_4_ = auVar584._12_4_;
            auVar583._8_3_ = 0;
            auVar583._0_8_ = uVar127;
            auVar583[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar582._11_5_ = auVar583._11_5_;
            auVar582._8_2_ = 0;
            auVar582._0_8_ = uVar127;
            auVar582[10] = (char)(uVar127 >> 0x28);
            auVar581._10_6_ = auVar582._10_6_;
            auVar581[8] = 0;
            auVar581._0_8_ = uVar127;
            auVar581[9] = (char)((ulong)uVar140 >> 0x20);
            auVar580._9_7_ = auVar581._9_7_;
            auVar580[8] = (char)(uVar127 >> 0x20);
            auVar580._0_8_ = uVar127;
            auVar579._8_8_ = auVar580._8_8_;
            auVar579[7] = (char)((ulong)uVar140 >> 0x18);
            auVar579[6] = (char)(uVar127 >> 0x18);
            auVar579[5] = (char)((ulong)uVar140 >> 0x10);
            auVar579[4] = (char)(uVar127 >> 0x10);
            auVar579[3] = (char)((ulong)uVar140 >> 8);
            auVar579[2] = (char)(uVar127 >> 8);
            auVar579[0] = (undefined1)uVar127;
            auVar579[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar247,auVar144);
            auVar708 = pmaddubsw(auVar352,auVar192);
            auVar709 = pmaddubsw(auVar463,auVar193);
            auVar728 = pmaddubsw(auVar579,auVar155);
            auVar587._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar587._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar587._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar587._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar587._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar587._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar587._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar587._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar471._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar471._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar471._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar471._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar471._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar471._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar471._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar471._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar471,auVar587);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*(undefined1 (*) [16])(*local_350 + (int)(uVar98 * 2)) + lVar131) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar131 = lVar131 + 8;
          } while (uVar98 != (uint)lVar131);
          lVar131 = 0;
          do {
            uVar127 = *(ulong *)(local_238 + lVar131 + -3);
            uVar140 = *(undefined8 *)(local_238 + lVar131 + -2);
            auVar262._8_6_ = 0;
            auVar262._0_8_ = uVar127;
            auVar262[0xe] = (char)(uVar127 >> 0x38);
            auVar262[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar261._14_2_ = auVar262._14_2_;
            auVar261._8_5_ = 0;
            auVar261._0_8_ = uVar127;
            auVar261[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar260._13_3_ = auVar261._13_3_;
            auVar260._8_4_ = 0;
            auVar260._0_8_ = uVar127;
            auVar260[0xc] = (char)(uVar127 >> 0x30);
            auVar259._12_4_ = auVar260._12_4_;
            auVar259._8_3_ = 0;
            auVar259._0_8_ = uVar127;
            auVar259[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar258._11_5_ = auVar259._11_5_;
            auVar258._8_2_ = 0;
            auVar258._0_8_ = uVar127;
            auVar258[10] = (char)(uVar127 >> 0x28);
            auVar257._10_6_ = auVar258._10_6_;
            auVar257[8] = 0;
            auVar257._0_8_ = uVar127;
            auVar257[9] = (char)((ulong)uVar140 >> 0x20);
            auVar256._9_7_ = auVar257._9_7_;
            auVar256[8] = (char)(uVar127 >> 0x20);
            auVar256._0_8_ = uVar127;
            auVar255._8_8_ = auVar256._8_8_;
            auVar255[7] = (char)((ulong)uVar140 >> 0x18);
            auVar255[6] = (char)(uVar127 >> 0x18);
            auVar255[5] = (char)((ulong)uVar140 >> 0x10);
            auVar255[4] = (char)(uVar127 >> 0x10);
            auVar255[3] = (char)((ulong)uVar140 >> 8);
            auVar255[2] = (char)(uVar127 >> 8);
            auVar255[0] = (undefined1)uVar127;
            auVar255[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_238 + lVar131 + -1);
            uVar140 = *(undefined8 *)(local_238 + lVar131);
            auVar367._8_6_ = 0;
            auVar367._0_8_ = uVar127;
            auVar367[0xe] = (char)(uVar127 >> 0x38);
            auVar367[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar366._14_2_ = auVar367._14_2_;
            auVar366._8_5_ = 0;
            auVar366._0_8_ = uVar127;
            auVar366[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar365._13_3_ = auVar366._13_3_;
            auVar365._8_4_ = 0;
            auVar365._0_8_ = uVar127;
            auVar365[0xc] = (char)(uVar127 >> 0x30);
            auVar364._12_4_ = auVar365._12_4_;
            auVar364._8_3_ = 0;
            auVar364._0_8_ = uVar127;
            auVar364[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar363._11_5_ = auVar364._11_5_;
            auVar363._8_2_ = 0;
            auVar363._0_8_ = uVar127;
            auVar363[10] = (char)(uVar127 >> 0x28);
            auVar362._10_6_ = auVar363._10_6_;
            auVar362[8] = 0;
            auVar362._0_8_ = uVar127;
            auVar362[9] = (char)((ulong)uVar140 >> 0x20);
            auVar361._9_7_ = auVar362._9_7_;
            auVar361[8] = (char)(uVar127 >> 0x20);
            auVar361._0_8_ = uVar127;
            auVar360._8_8_ = auVar361._8_8_;
            auVar360[7] = (char)((ulong)uVar140 >> 0x18);
            auVar360[6] = (char)(uVar127 >> 0x18);
            auVar360[5] = (char)((ulong)uVar140 >> 0x10);
            auVar360[4] = (char)(uVar127 >> 0x10);
            auVar360[3] = (char)((ulong)uVar140 >> 8);
            auVar360[2] = (char)(uVar127 >> 8);
            auVar360[0] = (undefined1)uVar127;
            auVar360[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_238 + lVar131 + 1);
            uVar140 = *(undefined8 *)(local_238 + lVar131 + 2);
            auVar479._8_6_ = 0;
            auVar479._0_8_ = uVar127;
            auVar479[0xe] = (char)(uVar127 >> 0x38);
            auVar479[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar478._14_2_ = auVar479._14_2_;
            auVar478._8_5_ = 0;
            auVar478._0_8_ = uVar127;
            auVar478[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar477._13_3_ = auVar478._13_3_;
            auVar477._8_4_ = 0;
            auVar477._0_8_ = uVar127;
            auVar477[0xc] = (char)(uVar127 >> 0x30);
            auVar476._12_4_ = auVar477._12_4_;
            auVar476._8_3_ = 0;
            auVar476._0_8_ = uVar127;
            auVar476[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar475._11_5_ = auVar476._11_5_;
            auVar475._8_2_ = 0;
            auVar475._0_8_ = uVar127;
            auVar475[10] = (char)(uVar127 >> 0x28);
            auVar474._10_6_ = auVar475._10_6_;
            auVar474[8] = 0;
            auVar474._0_8_ = uVar127;
            auVar474[9] = (char)((ulong)uVar140 >> 0x20);
            auVar473._9_7_ = auVar474._9_7_;
            auVar473[8] = (char)(uVar127 >> 0x20);
            auVar473._0_8_ = uVar127;
            auVar472._8_8_ = auVar473._8_8_;
            auVar472[7] = (char)((ulong)uVar140 >> 0x18);
            auVar472[6] = (char)(uVar127 >> 0x18);
            auVar472[5] = (char)((ulong)uVar140 >> 0x10);
            auVar472[4] = (char)(uVar127 >> 0x10);
            auVar472[3] = (char)((ulong)uVar140 >> 8);
            auVar472[2] = (char)(uVar127 >> 8);
            auVar472[0] = (undefined1)uVar127;
            auVar472[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_238 + lVar131 + 3);
            uVar140 = *(undefined8 *)(local_238 + lVar131 + 4);
            auVar595._8_6_ = 0;
            auVar595._0_8_ = uVar127;
            auVar595[0xe] = (char)(uVar127 >> 0x38);
            auVar595[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar594._14_2_ = auVar595._14_2_;
            auVar594._8_5_ = 0;
            auVar594._0_8_ = uVar127;
            auVar594[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar593._13_3_ = auVar594._13_3_;
            auVar593._8_4_ = 0;
            auVar593._0_8_ = uVar127;
            auVar593[0xc] = (char)(uVar127 >> 0x30);
            auVar592._12_4_ = auVar593._12_4_;
            auVar592._8_3_ = 0;
            auVar592._0_8_ = uVar127;
            auVar592[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar591._11_5_ = auVar592._11_5_;
            auVar591._8_2_ = 0;
            auVar591._0_8_ = uVar127;
            auVar591[10] = (char)(uVar127 >> 0x28);
            auVar590._10_6_ = auVar591._10_6_;
            auVar590[8] = 0;
            auVar590._0_8_ = uVar127;
            auVar590[9] = (char)((ulong)uVar140 >> 0x20);
            auVar589._9_7_ = auVar590._9_7_;
            auVar589[8] = (char)(uVar127 >> 0x20);
            auVar589._0_8_ = uVar127;
            auVar588._8_8_ = auVar589._8_8_;
            auVar588[7] = (char)((ulong)uVar140 >> 0x18);
            auVar588[6] = (char)(uVar127 >> 0x18);
            auVar588[5] = (char)((ulong)uVar140 >> 0x10);
            auVar588[4] = (char)(uVar127 >> 0x10);
            auVar588[3] = (char)((ulong)uVar140 >> 8);
            auVar588[2] = (char)(uVar127 >> 8);
            auVar588[0] = (undefined1)uVar127;
            auVar588[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar255,auVar144);
            auVar708 = pmaddubsw(auVar360,auVar192);
            auVar709 = pmaddubsw(auVar472,auVar193);
            auVar728 = pmaddubsw(auVar588,auVar155);
            auVar596._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar596._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar596._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar596._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar596._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar596._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar596._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar596._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar480._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar480._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar480._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar480._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar480._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar480._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar480._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar480._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar480,auVar596);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*local_350 + (int)(uVar98 * 3) + lVar131) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar131 = lVar131 + 8;
          } while (uVar98 != (uint)lVar131);
          local_2d8._0_8_ = *local_350 + (int)(uVar98 * 3);
          local_248 = local_238 + lVar122;
          lVar131 = 0;
          do {
            uVar127 = *(ulong *)(local_248 + lVar131 + -3);
            uVar140 = *(undefined8 *)(local_248 + lVar131 + -2);
            auVar270._8_6_ = 0;
            auVar270._0_8_ = uVar127;
            auVar270[0xe] = (char)(uVar127 >> 0x38);
            auVar270[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar269._14_2_ = auVar270._14_2_;
            auVar269._8_5_ = 0;
            auVar269._0_8_ = uVar127;
            auVar269[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar268._13_3_ = auVar269._13_3_;
            auVar268._8_4_ = 0;
            auVar268._0_8_ = uVar127;
            auVar268[0xc] = (char)(uVar127 >> 0x30);
            auVar267._12_4_ = auVar268._12_4_;
            auVar267._8_3_ = 0;
            auVar267._0_8_ = uVar127;
            auVar267[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar266._11_5_ = auVar267._11_5_;
            auVar266._8_2_ = 0;
            auVar266._0_8_ = uVar127;
            auVar266[10] = (char)(uVar127 >> 0x28);
            auVar265._10_6_ = auVar266._10_6_;
            auVar265[8] = 0;
            auVar265._0_8_ = uVar127;
            auVar265[9] = (char)((ulong)uVar140 >> 0x20);
            auVar264._9_7_ = auVar265._9_7_;
            auVar264[8] = (char)(uVar127 >> 0x20);
            auVar264._0_8_ = uVar127;
            auVar263._8_8_ = auVar264._8_8_;
            auVar263[7] = (char)((ulong)uVar140 >> 0x18);
            auVar263[6] = (char)(uVar127 >> 0x18);
            auVar263[5] = (char)((ulong)uVar140 >> 0x10);
            auVar263[4] = (char)(uVar127 >> 0x10);
            auVar263[3] = (char)((ulong)uVar140 >> 8);
            auVar263[2] = (char)(uVar127 >> 8);
            auVar263[0] = (undefined1)uVar127;
            auVar263[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_248 + lVar131 + -1);
            uVar140 = *(undefined8 *)(local_248 + lVar131);
            auVar375._8_6_ = 0;
            auVar375._0_8_ = uVar127;
            auVar375[0xe] = (char)(uVar127 >> 0x38);
            auVar375[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar374._14_2_ = auVar375._14_2_;
            auVar374._8_5_ = 0;
            auVar374._0_8_ = uVar127;
            auVar374[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar373._13_3_ = auVar374._13_3_;
            auVar373._8_4_ = 0;
            auVar373._0_8_ = uVar127;
            auVar373[0xc] = (char)(uVar127 >> 0x30);
            auVar372._12_4_ = auVar373._12_4_;
            auVar372._8_3_ = 0;
            auVar372._0_8_ = uVar127;
            auVar372[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar371._11_5_ = auVar372._11_5_;
            auVar371._8_2_ = 0;
            auVar371._0_8_ = uVar127;
            auVar371[10] = (char)(uVar127 >> 0x28);
            auVar370._10_6_ = auVar371._10_6_;
            auVar370[8] = 0;
            auVar370._0_8_ = uVar127;
            auVar370[9] = (char)((ulong)uVar140 >> 0x20);
            auVar369._9_7_ = auVar370._9_7_;
            auVar369[8] = (char)(uVar127 >> 0x20);
            auVar369._0_8_ = uVar127;
            auVar368._8_8_ = auVar369._8_8_;
            auVar368[7] = (char)((ulong)uVar140 >> 0x18);
            auVar368[6] = (char)(uVar127 >> 0x18);
            auVar368[5] = (char)((ulong)uVar140 >> 0x10);
            auVar368[4] = (char)(uVar127 >> 0x10);
            auVar368[3] = (char)((ulong)uVar140 >> 8);
            auVar368[2] = (char)(uVar127 >> 8);
            auVar368[0] = (undefined1)uVar127;
            auVar368[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_248 + lVar131 + 1);
            uVar140 = *(undefined8 *)(local_248 + lVar131 + 2);
            auVar488._8_6_ = 0;
            auVar488._0_8_ = uVar127;
            auVar488[0xe] = (char)(uVar127 >> 0x38);
            auVar488[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar487._14_2_ = auVar488._14_2_;
            auVar487._8_5_ = 0;
            auVar487._0_8_ = uVar127;
            auVar487[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar486._13_3_ = auVar487._13_3_;
            auVar486._8_4_ = 0;
            auVar486._0_8_ = uVar127;
            auVar486[0xc] = (char)(uVar127 >> 0x30);
            auVar485._12_4_ = auVar486._12_4_;
            auVar485._8_3_ = 0;
            auVar485._0_8_ = uVar127;
            auVar485[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar484._11_5_ = auVar485._11_5_;
            auVar484._8_2_ = 0;
            auVar484._0_8_ = uVar127;
            auVar484[10] = (char)(uVar127 >> 0x28);
            auVar483._10_6_ = auVar484._10_6_;
            auVar483[8] = 0;
            auVar483._0_8_ = uVar127;
            auVar483[9] = (char)((ulong)uVar140 >> 0x20);
            auVar482._9_7_ = auVar483._9_7_;
            auVar482[8] = (char)(uVar127 >> 0x20);
            auVar482._0_8_ = uVar127;
            auVar481._8_8_ = auVar482._8_8_;
            auVar481[7] = (char)((ulong)uVar140 >> 0x18);
            auVar481[6] = (char)(uVar127 >> 0x18);
            auVar481[5] = (char)((ulong)uVar140 >> 0x10);
            auVar481[4] = (char)(uVar127 >> 0x10);
            auVar481[3] = (char)((ulong)uVar140 >> 8);
            auVar481[2] = (char)(uVar127 >> 8);
            auVar481[0] = (undefined1)uVar127;
            auVar481[1] = (char)uVar140;
            uVar127 = *(ulong *)(local_248 + lVar131 + 3);
            uVar140 = *(undefined8 *)(local_248 + lVar131 + 4);
            auVar604._8_6_ = 0;
            auVar604._0_8_ = uVar127;
            auVar604[0xe] = (char)(uVar127 >> 0x38);
            auVar604[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar603._14_2_ = auVar604._14_2_;
            auVar603._8_5_ = 0;
            auVar603._0_8_ = uVar127;
            auVar603[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar602._13_3_ = auVar603._13_3_;
            auVar602._8_4_ = 0;
            auVar602._0_8_ = uVar127;
            auVar602[0xc] = (char)(uVar127 >> 0x30);
            auVar601._12_4_ = auVar602._12_4_;
            auVar601._8_3_ = 0;
            auVar601._0_8_ = uVar127;
            auVar601[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar600._11_5_ = auVar601._11_5_;
            auVar600._8_2_ = 0;
            auVar600._0_8_ = uVar127;
            auVar600[10] = (char)(uVar127 >> 0x28);
            auVar599._10_6_ = auVar600._10_6_;
            auVar599[8] = 0;
            auVar599._0_8_ = uVar127;
            auVar599[9] = (char)((ulong)uVar140 >> 0x20);
            auVar598._9_7_ = auVar599._9_7_;
            auVar598[8] = (char)(uVar127 >> 0x20);
            auVar598._0_8_ = uVar127;
            auVar597._8_8_ = auVar598._8_8_;
            auVar597[7] = (char)((ulong)uVar140 >> 0x18);
            auVar597[6] = (char)(uVar127 >> 0x18);
            auVar597[5] = (char)((ulong)uVar140 >> 0x10);
            auVar597[4] = (char)(uVar127 >> 0x10);
            auVar597[3] = (char)((ulong)uVar140 >> 8);
            auVar597[2] = (char)(uVar127 >> 8);
            auVar597[0] = (undefined1)uVar127;
            auVar597[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar263,auVar144);
            auVar708 = pmaddubsw(auVar368,auVar192);
            auVar709 = pmaddubsw(auVar481,auVar193);
            auVar728 = pmaddubsw(auVar597,auVar155);
            auVar605._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar605._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar605._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar605._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar605._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar605._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar605._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar605._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar489._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar489._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar489._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar489._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar489._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar489._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar489._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar489._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar489,auVar605);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*local_350 + (int)(uVar98 * 4) + lVar131) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar131 = lVar131 + 8;
          } while (uVar98 != (uint)lVar131);
          puVar125 = local_238 + lVar122 * 2;
          lVar131 = 0;
          do {
            uVar127 = *(ulong *)(puVar125 + lVar131 + -3);
            uVar140 = *(undefined8 *)(puVar125 + lVar131 + -2);
            auVar278._8_6_ = 0;
            auVar278._0_8_ = uVar127;
            auVar278[0xe] = (char)(uVar127 >> 0x38);
            auVar278[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar277._14_2_ = auVar278._14_2_;
            auVar277._8_5_ = 0;
            auVar277._0_8_ = uVar127;
            auVar277[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar276._13_3_ = auVar277._13_3_;
            auVar276._8_4_ = 0;
            auVar276._0_8_ = uVar127;
            auVar276[0xc] = (char)(uVar127 >> 0x30);
            auVar275._12_4_ = auVar276._12_4_;
            auVar275._8_3_ = 0;
            auVar275._0_8_ = uVar127;
            auVar275[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar274._11_5_ = auVar275._11_5_;
            auVar274._8_2_ = 0;
            auVar274._0_8_ = uVar127;
            auVar274[10] = (char)(uVar127 >> 0x28);
            auVar273._10_6_ = auVar274._10_6_;
            auVar273[8] = 0;
            auVar273._0_8_ = uVar127;
            auVar273[9] = (char)((ulong)uVar140 >> 0x20);
            auVar272._9_7_ = auVar273._9_7_;
            auVar272[8] = (char)(uVar127 >> 0x20);
            auVar272._0_8_ = uVar127;
            auVar271._8_8_ = auVar272._8_8_;
            auVar271[7] = (char)((ulong)uVar140 >> 0x18);
            auVar271[6] = (char)(uVar127 >> 0x18);
            auVar271[5] = (char)((ulong)uVar140 >> 0x10);
            auVar271[4] = (char)(uVar127 >> 0x10);
            auVar271[3] = (char)((ulong)uVar140 >> 8);
            auVar271[2] = (char)(uVar127 >> 8);
            auVar271[0] = (undefined1)uVar127;
            auVar271[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar125 + lVar131 + -1);
            uVar140 = *(undefined8 *)(puVar125 + lVar131);
            auVar383._8_6_ = 0;
            auVar383._0_8_ = uVar127;
            auVar383[0xe] = (char)(uVar127 >> 0x38);
            auVar383[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar382._14_2_ = auVar383._14_2_;
            auVar382._8_5_ = 0;
            auVar382._0_8_ = uVar127;
            auVar382[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar381._13_3_ = auVar382._13_3_;
            auVar381._8_4_ = 0;
            auVar381._0_8_ = uVar127;
            auVar381[0xc] = (char)(uVar127 >> 0x30);
            auVar380._12_4_ = auVar381._12_4_;
            auVar380._8_3_ = 0;
            auVar380._0_8_ = uVar127;
            auVar380[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar379._11_5_ = auVar380._11_5_;
            auVar379._8_2_ = 0;
            auVar379._0_8_ = uVar127;
            auVar379[10] = (char)(uVar127 >> 0x28);
            auVar378._10_6_ = auVar379._10_6_;
            auVar378[8] = 0;
            auVar378._0_8_ = uVar127;
            auVar378[9] = (char)((ulong)uVar140 >> 0x20);
            auVar377._9_7_ = auVar378._9_7_;
            auVar377[8] = (char)(uVar127 >> 0x20);
            auVar377._0_8_ = uVar127;
            auVar376._8_8_ = auVar377._8_8_;
            auVar376[7] = (char)((ulong)uVar140 >> 0x18);
            auVar376[6] = (char)(uVar127 >> 0x18);
            auVar376[5] = (char)((ulong)uVar140 >> 0x10);
            auVar376[4] = (char)(uVar127 >> 0x10);
            auVar376[3] = (char)((ulong)uVar140 >> 8);
            auVar376[2] = (char)(uVar127 >> 8);
            auVar376[0] = (undefined1)uVar127;
            auVar376[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar125 + lVar131 + 1);
            uVar140 = *(undefined8 *)(puVar125 + lVar131 + 2);
            auVar497._8_6_ = 0;
            auVar497._0_8_ = uVar127;
            auVar497[0xe] = (char)(uVar127 >> 0x38);
            auVar497[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar496._14_2_ = auVar497._14_2_;
            auVar496._8_5_ = 0;
            auVar496._0_8_ = uVar127;
            auVar496[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar495._13_3_ = auVar496._13_3_;
            auVar495._8_4_ = 0;
            auVar495._0_8_ = uVar127;
            auVar495[0xc] = (char)(uVar127 >> 0x30);
            auVar494._12_4_ = auVar495._12_4_;
            auVar494._8_3_ = 0;
            auVar494._0_8_ = uVar127;
            auVar494[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar493._11_5_ = auVar494._11_5_;
            auVar493._8_2_ = 0;
            auVar493._0_8_ = uVar127;
            auVar493[10] = (char)(uVar127 >> 0x28);
            auVar492._10_6_ = auVar493._10_6_;
            auVar492[8] = 0;
            auVar492._0_8_ = uVar127;
            auVar492[9] = (char)((ulong)uVar140 >> 0x20);
            auVar491._9_7_ = auVar492._9_7_;
            auVar491[8] = (char)(uVar127 >> 0x20);
            auVar491._0_8_ = uVar127;
            auVar490._8_8_ = auVar491._8_8_;
            auVar490[7] = (char)((ulong)uVar140 >> 0x18);
            auVar490[6] = (char)(uVar127 >> 0x18);
            auVar490[5] = (char)((ulong)uVar140 >> 0x10);
            auVar490[4] = (char)(uVar127 >> 0x10);
            auVar490[3] = (char)((ulong)uVar140 >> 8);
            auVar490[2] = (char)(uVar127 >> 8);
            auVar490[0] = (undefined1)uVar127;
            auVar490[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar125 + lVar131 + 3);
            uVar140 = *(undefined8 *)(puVar125 + lVar131 + 4);
            auVar613._8_6_ = 0;
            auVar613._0_8_ = uVar127;
            auVar613[0xe] = (char)(uVar127 >> 0x38);
            auVar613[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar612._14_2_ = auVar613._14_2_;
            auVar612._8_5_ = 0;
            auVar612._0_8_ = uVar127;
            auVar612[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar611._13_3_ = auVar612._13_3_;
            auVar611._8_4_ = 0;
            auVar611._0_8_ = uVar127;
            auVar611[0xc] = (char)(uVar127 >> 0x30);
            auVar610._12_4_ = auVar611._12_4_;
            auVar610._8_3_ = 0;
            auVar610._0_8_ = uVar127;
            auVar610[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar609._11_5_ = auVar610._11_5_;
            auVar609._8_2_ = 0;
            auVar609._0_8_ = uVar127;
            auVar609[10] = (char)(uVar127 >> 0x28);
            auVar608._10_6_ = auVar609._10_6_;
            auVar608[8] = 0;
            auVar608._0_8_ = uVar127;
            auVar608[9] = (char)((ulong)uVar140 >> 0x20);
            auVar607._9_7_ = auVar608._9_7_;
            auVar607[8] = (char)(uVar127 >> 0x20);
            auVar607._0_8_ = uVar127;
            auVar606._8_8_ = auVar607._8_8_;
            auVar606[7] = (char)((ulong)uVar140 >> 0x18);
            auVar606[6] = (char)(uVar127 >> 0x18);
            auVar606[5] = (char)((ulong)uVar140 >> 0x10);
            auVar606[4] = (char)(uVar127 >> 0x10);
            auVar606[3] = (char)((ulong)uVar140 >> 8);
            auVar606[2] = (char)(uVar127 >> 8);
            auVar606[0] = (undefined1)uVar127;
            auVar606[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar271,auVar144);
            auVar708 = pmaddubsw(auVar376,auVar192);
            auVar709 = pmaddubsw(auVar490,auVar193);
            auVar728 = pmaddubsw(auVar606,auVar155);
            auVar614._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar614._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar614._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar614._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar614._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar614._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar614._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar614._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar498._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar498._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar498._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar498._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar498._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar498._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar498._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar498._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar498,auVar614);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*local_350 + (int)(uVar98 * 5) + lVar131) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar131 = lVar131 + 8;
          } while (uVar98 != (uint)lVar131);
          local_308._0_8_ = *local_350 + (int)(uVar98 * 5);
          puVar121 = local_238 + lVar122 * 3;
          lVar131 = 0;
          do {
            uVar127 = *(ulong *)(puVar121 + lVar131 + -3);
            uVar140 = *(undefined8 *)(puVar121 + lVar131 + -2);
            auVar286._8_6_ = 0;
            auVar286._0_8_ = uVar127;
            auVar286[0xe] = (char)(uVar127 >> 0x38);
            auVar286[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar285._14_2_ = auVar286._14_2_;
            auVar285._8_5_ = 0;
            auVar285._0_8_ = uVar127;
            auVar285[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar284._13_3_ = auVar285._13_3_;
            auVar284._8_4_ = 0;
            auVar284._0_8_ = uVar127;
            auVar284[0xc] = (char)(uVar127 >> 0x30);
            auVar283._12_4_ = auVar284._12_4_;
            auVar283._8_3_ = 0;
            auVar283._0_8_ = uVar127;
            auVar283[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar282._11_5_ = auVar283._11_5_;
            auVar282._8_2_ = 0;
            auVar282._0_8_ = uVar127;
            auVar282[10] = (char)(uVar127 >> 0x28);
            auVar281._10_6_ = auVar282._10_6_;
            auVar281[8] = 0;
            auVar281._0_8_ = uVar127;
            auVar281[9] = (char)((ulong)uVar140 >> 0x20);
            auVar280._9_7_ = auVar281._9_7_;
            auVar280[8] = (char)(uVar127 >> 0x20);
            auVar280._0_8_ = uVar127;
            auVar279._8_8_ = auVar280._8_8_;
            auVar279[7] = (char)((ulong)uVar140 >> 0x18);
            auVar279[6] = (char)(uVar127 >> 0x18);
            auVar279[5] = (char)((ulong)uVar140 >> 0x10);
            auVar279[4] = (char)(uVar127 >> 0x10);
            auVar279[3] = (char)((ulong)uVar140 >> 8);
            auVar279[2] = (char)(uVar127 >> 8);
            auVar279[0] = (undefined1)uVar127;
            auVar279[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar121 + lVar131 + -1);
            uVar140 = *(undefined8 *)(puVar121 + lVar131);
            auVar391._8_6_ = 0;
            auVar391._0_8_ = uVar127;
            auVar391[0xe] = (char)(uVar127 >> 0x38);
            auVar391[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar390._14_2_ = auVar391._14_2_;
            auVar390._8_5_ = 0;
            auVar390._0_8_ = uVar127;
            auVar390[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar389._13_3_ = auVar390._13_3_;
            auVar389._8_4_ = 0;
            auVar389._0_8_ = uVar127;
            auVar389[0xc] = (char)(uVar127 >> 0x30);
            auVar388._12_4_ = auVar389._12_4_;
            auVar388._8_3_ = 0;
            auVar388._0_8_ = uVar127;
            auVar388[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar387._11_5_ = auVar388._11_5_;
            auVar387._8_2_ = 0;
            auVar387._0_8_ = uVar127;
            auVar387[10] = (char)(uVar127 >> 0x28);
            auVar386._10_6_ = auVar387._10_6_;
            auVar386[8] = 0;
            auVar386._0_8_ = uVar127;
            auVar386[9] = (char)((ulong)uVar140 >> 0x20);
            auVar385._9_7_ = auVar386._9_7_;
            auVar385[8] = (char)(uVar127 >> 0x20);
            auVar385._0_8_ = uVar127;
            auVar384._8_8_ = auVar385._8_8_;
            auVar384[7] = (char)((ulong)uVar140 >> 0x18);
            auVar384[6] = (char)(uVar127 >> 0x18);
            auVar384[5] = (char)((ulong)uVar140 >> 0x10);
            auVar384[4] = (char)(uVar127 >> 0x10);
            auVar384[3] = (char)((ulong)uVar140 >> 8);
            auVar384[2] = (char)(uVar127 >> 8);
            auVar384[0] = (undefined1)uVar127;
            auVar384[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar121 + lVar131 + 1);
            uVar140 = *(undefined8 *)(puVar121 + lVar131 + 2);
            auVar506._8_6_ = 0;
            auVar506._0_8_ = uVar127;
            auVar506[0xe] = (char)(uVar127 >> 0x38);
            auVar506[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar505._14_2_ = auVar506._14_2_;
            auVar505._8_5_ = 0;
            auVar505._0_8_ = uVar127;
            auVar505[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar504._13_3_ = auVar505._13_3_;
            auVar504._8_4_ = 0;
            auVar504._0_8_ = uVar127;
            auVar504[0xc] = (char)(uVar127 >> 0x30);
            auVar503._12_4_ = auVar504._12_4_;
            auVar503._8_3_ = 0;
            auVar503._0_8_ = uVar127;
            auVar503[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar502._11_5_ = auVar503._11_5_;
            auVar502._8_2_ = 0;
            auVar502._0_8_ = uVar127;
            auVar502[10] = (char)(uVar127 >> 0x28);
            auVar501._10_6_ = auVar502._10_6_;
            auVar501[8] = 0;
            auVar501._0_8_ = uVar127;
            auVar501[9] = (char)((ulong)uVar140 >> 0x20);
            auVar500._9_7_ = auVar501._9_7_;
            auVar500[8] = (char)(uVar127 >> 0x20);
            auVar500._0_8_ = uVar127;
            auVar499._8_8_ = auVar500._8_8_;
            auVar499[7] = (char)((ulong)uVar140 >> 0x18);
            auVar499[6] = (char)(uVar127 >> 0x18);
            auVar499[5] = (char)((ulong)uVar140 >> 0x10);
            auVar499[4] = (char)(uVar127 >> 0x10);
            auVar499[3] = (char)((ulong)uVar140 >> 8);
            auVar499[2] = (char)(uVar127 >> 8);
            auVar499[0] = (undefined1)uVar127;
            auVar499[1] = (char)uVar140;
            uVar127 = *(ulong *)(puVar121 + lVar131 + 3);
            uVar140 = *(undefined8 *)(puVar121 + lVar131 + 4);
            auVar622._8_6_ = 0;
            auVar622._0_8_ = uVar127;
            auVar622[0xe] = (char)(uVar127 >> 0x38);
            auVar622[0xf] = (char)((ulong)uVar140 >> 0x38);
            auVar621._14_2_ = auVar622._14_2_;
            auVar621._8_5_ = 0;
            auVar621._0_8_ = uVar127;
            auVar621[0xd] = (char)((ulong)uVar140 >> 0x30);
            auVar620._13_3_ = auVar621._13_3_;
            auVar620._8_4_ = 0;
            auVar620._0_8_ = uVar127;
            auVar620[0xc] = (char)(uVar127 >> 0x30);
            auVar619._12_4_ = auVar620._12_4_;
            auVar619._8_3_ = 0;
            auVar619._0_8_ = uVar127;
            auVar619[0xb] = (char)((ulong)uVar140 >> 0x28);
            auVar618._11_5_ = auVar619._11_5_;
            auVar618._8_2_ = 0;
            auVar618._0_8_ = uVar127;
            auVar618[10] = (char)(uVar127 >> 0x28);
            auVar617._10_6_ = auVar618._10_6_;
            auVar617[8] = 0;
            auVar617._0_8_ = uVar127;
            auVar617[9] = (char)((ulong)uVar140 >> 0x20);
            auVar616._9_7_ = auVar617._9_7_;
            auVar616[8] = (char)(uVar127 >> 0x20);
            auVar616._0_8_ = uVar127;
            auVar615._8_8_ = auVar616._8_8_;
            auVar615[7] = (char)((ulong)uVar140 >> 0x18);
            auVar615[6] = (char)(uVar127 >> 0x18);
            auVar615[5] = (char)((ulong)uVar140 >> 0x10);
            auVar615[4] = (char)(uVar127 >> 0x10);
            auVar615[3] = (char)((ulong)uVar140 >> 8);
            auVar615[2] = (char)(uVar127 >> 8);
            auVar615[0] = (undefined1)uVar127;
            auVar615[1] = (char)uVar140;
            auVar205 = pmaddubsw(auVar279,auVar144);
            auVar708 = pmaddubsw(auVar384,auVar192);
            auVar709 = pmaddubsw(auVar499,auVar193);
            auVar728 = pmaddubsw(auVar615,auVar155);
            auVar623._0_2_ = auVar728._0_2_ + auVar708._0_2_;
            auVar623._2_2_ = auVar728._2_2_ + auVar708._2_2_;
            auVar623._4_2_ = auVar728._4_2_ + auVar708._4_2_;
            auVar623._6_2_ = auVar728._6_2_ + auVar708._6_2_;
            auVar623._8_2_ = auVar728._8_2_ + auVar708._8_2_;
            auVar623._10_2_ = auVar728._10_2_ + auVar708._10_2_;
            auVar623._12_2_ = auVar728._12_2_ + auVar708._12_2_;
            auVar623._14_2_ = auVar728._14_2_ + auVar708._14_2_;
            auVar507._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
            auVar507._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
            auVar507._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
            auVar507._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
            auVar507._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
            auVar507._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
            auVar507._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
            auVar507._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
            auVar205 = paddsw(auVar507,auVar623);
            auVar205 = psraw(auVar205,7);
            sVar29 = auVar205._0_2_;
            sVar42 = auVar205._2_2_;
            sVar30 = auVar205._4_2_;
            sVar31 = auVar205._6_2_;
            sVar32 = auVar205._8_2_;
            sVar33 = auVar205._10_2_;
            sVar34 = auVar205._12_2_;
            sVar35 = auVar205._14_2_;
            *(ulong *)(*local_350 + (int)(uVar98 * 6) + lVar131) =
                 CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                          CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] - (0xff < sVar34)
                                   ,CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                             (0xff < sVar33),
                                             CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                      - (0xff < sVar32),
                                                      CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                               auVar205[6] - (0xff < sVar31),
                                                               CONCAT12((0 < sVar30) *
                                                                        (sVar30 < 0x100) *
                                                                        auVar205[4] -
                                                                        (0xff < sVar30),
                                                                        CONCAT11((0 < sVar42) *
                                                                                 (sVar42 < 0x100) *
                                                                                 auVar205[2] -
                                                                                 (0xff < sVar42),
                                                                                 (0 < sVar29) *
                                                                                 (sVar29 < 0x100) *
                                                                                 auVar205[0] -
                                                                                 (0xff < sVar29)))))
                                            )));
            lVar131 = lVar131 + 8;
          } while (uVar98 != (uint)lVar131);
          local_2f8._0_8_ = *local_350 + (int)(uVar98 * 6);
          local_228 = (long)puVar121;
          puVar124 = local_238 + lVar122 * 4 + -3;
          puVar121 = local_288 + lVar102;
          lVar102 = lVar102 * 2;
          puVar103 = local_238 + lVar122 * 4;
          pauVar114 = (undefined1 (*) [16])(*local_350 + (int)(uVar98 * 7));
          pauVar120 = local_350;
          pauVar130 = (undefined1 (*) [16])(*local_350 + (int)(uVar98 * 2));
          puVar128 = *local_350 + (int)(uVar98 * 4);
          pauVar133 = (undefined1 (*) [16])(*local_350 + (int)uVar98);
          do {
            pauVar126 = pauVar130;
            pauVar130 = (undefined1 (*) [16])local_2d8._0_8_;
            local_2d8._0_8_ = puVar128;
            lVar131 = 0;
            do {
              uVar127 = *(ulong *)(puVar124 + lVar131);
              uVar140 = *(undefined8 *)(puVar124 + lVar131 + 1);
              auVar294._8_6_ = 0;
              auVar294._0_8_ = uVar127;
              auVar294[0xe] = (char)(uVar127 >> 0x38);
              auVar294[0xf] = (char)((ulong)uVar140 >> 0x38);
              auVar293._14_2_ = auVar294._14_2_;
              auVar293._8_5_ = 0;
              auVar293._0_8_ = uVar127;
              auVar293[0xd] = (char)((ulong)uVar140 >> 0x30);
              auVar292._13_3_ = auVar293._13_3_;
              auVar292._8_4_ = 0;
              auVar292._0_8_ = uVar127;
              auVar292[0xc] = (char)(uVar127 >> 0x30);
              auVar291._12_4_ = auVar292._12_4_;
              auVar291._8_3_ = 0;
              auVar291._0_8_ = uVar127;
              auVar291[0xb] = (char)((ulong)uVar140 >> 0x28);
              auVar290._11_5_ = auVar291._11_5_;
              auVar290._8_2_ = 0;
              auVar290._0_8_ = uVar127;
              auVar290[10] = (char)(uVar127 >> 0x28);
              auVar289._10_6_ = auVar290._10_6_;
              auVar289[8] = 0;
              auVar289._0_8_ = uVar127;
              auVar289[9] = (char)((ulong)uVar140 >> 0x20);
              auVar288._9_7_ = auVar289._9_7_;
              auVar288[8] = (char)(uVar127 >> 0x20);
              auVar288._0_8_ = uVar127;
              auVar287._8_8_ = auVar288._8_8_;
              auVar287[7] = (char)((ulong)uVar140 >> 0x18);
              auVar287[6] = (char)(uVar127 >> 0x18);
              auVar287[5] = (char)((ulong)uVar140 >> 0x10);
              auVar287[4] = (char)(uVar127 >> 0x10);
              auVar287[3] = (char)((ulong)uVar140 >> 8);
              auVar287[2] = (char)(uVar127 >> 8);
              auVar287[0] = (undefined1)uVar127;
              auVar287[1] = (char)uVar140;
              uVar127 = *(ulong *)(puVar124 + lVar131 + 2);
              uVar140 = *(undefined8 *)(puVar124 + lVar131 + 3);
              auVar399._8_6_ = 0;
              auVar399._0_8_ = uVar127;
              auVar399[0xe] = (char)(uVar127 >> 0x38);
              auVar399[0xf] = (char)((ulong)uVar140 >> 0x38);
              auVar398._14_2_ = auVar399._14_2_;
              auVar398._8_5_ = 0;
              auVar398._0_8_ = uVar127;
              auVar398[0xd] = (char)((ulong)uVar140 >> 0x30);
              auVar397._13_3_ = auVar398._13_3_;
              auVar397._8_4_ = 0;
              auVar397._0_8_ = uVar127;
              auVar397[0xc] = (char)(uVar127 >> 0x30);
              auVar396._12_4_ = auVar397._12_4_;
              auVar396._8_3_ = 0;
              auVar396._0_8_ = uVar127;
              auVar396[0xb] = (char)((ulong)uVar140 >> 0x28);
              auVar395._11_5_ = auVar396._11_5_;
              auVar395._8_2_ = 0;
              auVar395._0_8_ = uVar127;
              auVar395[10] = (char)(uVar127 >> 0x28);
              auVar394._10_6_ = auVar395._10_6_;
              auVar394[8] = 0;
              auVar394._0_8_ = uVar127;
              auVar394[9] = (char)((ulong)uVar140 >> 0x20);
              auVar393._9_7_ = auVar394._9_7_;
              auVar393[8] = (char)(uVar127 >> 0x20);
              auVar393._0_8_ = uVar127;
              auVar392._8_8_ = auVar393._8_8_;
              auVar392[7] = (char)((ulong)uVar140 >> 0x18);
              auVar392[6] = (char)(uVar127 >> 0x18);
              auVar392[5] = (char)((ulong)uVar140 >> 0x10);
              auVar392[4] = (char)(uVar127 >> 0x10);
              auVar392[3] = (char)((ulong)uVar140 >> 8);
              auVar392[2] = (char)(uVar127 >> 8);
              auVar392[0] = (undefined1)uVar127;
              auVar392[1] = (char)uVar140;
              uVar127 = *(ulong *)(puVar124 + lVar131 + 4);
              uVar140 = *(undefined8 *)(puVar124 + lVar131 + 5);
              auVar515._8_6_ = 0;
              auVar515._0_8_ = uVar127;
              auVar515[0xe] = (char)(uVar127 >> 0x38);
              auVar515[0xf] = (char)((ulong)uVar140 >> 0x38);
              auVar514._14_2_ = auVar515._14_2_;
              auVar514._8_5_ = 0;
              auVar514._0_8_ = uVar127;
              auVar514[0xd] = (char)((ulong)uVar140 >> 0x30);
              auVar513._13_3_ = auVar514._13_3_;
              auVar513._8_4_ = 0;
              auVar513._0_8_ = uVar127;
              auVar513[0xc] = (char)(uVar127 >> 0x30);
              auVar512._12_4_ = auVar513._12_4_;
              auVar512._8_3_ = 0;
              auVar512._0_8_ = uVar127;
              auVar512[0xb] = (char)((ulong)uVar140 >> 0x28);
              auVar511._11_5_ = auVar512._11_5_;
              auVar511._8_2_ = 0;
              auVar511._0_8_ = uVar127;
              auVar511[10] = (char)(uVar127 >> 0x28);
              auVar510._10_6_ = auVar511._10_6_;
              auVar510[8] = 0;
              auVar510._0_8_ = uVar127;
              auVar510[9] = (char)((ulong)uVar140 >> 0x20);
              auVar509._9_7_ = auVar510._9_7_;
              auVar509[8] = (char)(uVar127 >> 0x20);
              auVar509._0_8_ = uVar127;
              auVar508._8_8_ = auVar509._8_8_;
              auVar508[7] = (char)((ulong)uVar140 >> 0x18);
              auVar508[6] = (char)(uVar127 >> 0x18);
              auVar508[5] = (char)((ulong)uVar140 >> 0x10);
              auVar508[4] = (char)(uVar127 >> 0x10);
              auVar508[3] = (char)((ulong)uVar140 >> 8);
              auVar508[2] = (char)(uVar127 >> 8);
              auVar508[0] = (undefined1)uVar127;
              auVar508[1] = (char)uVar140;
              uVar127 = *(ulong *)(puVar124 + lVar131 + 6);
              uVar140 = *(undefined8 *)(puVar124 + lVar131 + 7);
              auVar631._8_6_ = 0;
              auVar631._0_8_ = uVar127;
              auVar631[0xe] = (char)(uVar127 >> 0x38);
              auVar631[0xf] = (char)((ulong)uVar140 >> 0x38);
              auVar630._14_2_ = auVar631._14_2_;
              auVar630._8_5_ = 0;
              auVar630._0_8_ = uVar127;
              auVar630[0xd] = (char)((ulong)uVar140 >> 0x30);
              auVar629._13_3_ = auVar630._13_3_;
              auVar629._8_4_ = 0;
              auVar629._0_8_ = uVar127;
              auVar629[0xc] = (char)(uVar127 >> 0x30);
              auVar628._12_4_ = auVar629._12_4_;
              auVar628._8_3_ = 0;
              auVar628._0_8_ = uVar127;
              auVar628[0xb] = (char)((ulong)uVar140 >> 0x28);
              auVar627._11_5_ = auVar628._11_5_;
              auVar627._8_2_ = 0;
              auVar627._0_8_ = uVar127;
              auVar627[10] = (char)(uVar127 >> 0x28);
              auVar626._10_6_ = auVar627._10_6_;
              auVar626[8] = 0;
              auVar626._0_8_ = uVar127;
              auVar626[9] = (char)((ulong)uVar140 >> 0x20);
              auVar625._9_7_ = auVar626._9_7_;
              auVar625[8] = (char)(uVar127 >> 0x20);
              auVar625._0_8_ = uVar127;
              auVar624._8_8_ = auVar625._8_8_;
              auVar624[7] = (char)((ulong)uVar140 >> 0x18);
              auVar624[6] = (char)(uVar127 >> 0x18);
              auVar624[5] = (char)((ulong)uVar140 >> 0x10);
              auVar624[4] = (char)(uVar127 >> 0x10);
              auVar624[3] = (char)((ulong)uVar140 >> 8);
              auVar624[2] = (char)(uVar127 >> 8);
              auVar624[0] = (undefined1)uVar127;
              auVar624[1] = (char)uVar140;
              auVar205 = pmaddubsw(auVar287,auVar144);
              auVar708 = pmaddubsw(auVar392,auVar192);
              auVar709 = pmaddubsw(auVar508,auVar193);
              auVar728 = pmaddubsw(auVar624,auVar155);
              auVar632._0_2_ = auVar728._0_2_ + auVar708._0_2_;
              auVar632._2_2_ = auVar728._2_2_ + auVar708._2_2_;
              auVar632._4_2_ = auVar728._4_2_ + auVar708._4_2_;
              auVar632._6_2_ = auVar728._6_2_ + auVar708._6_2_;
              auVar632._8_2_ = auVar728._8_2_ + auVar708._8_2_;
              auVar632._10_2_ = auVar728._10_2_ + auVar708._10_2_;
              auVar632._12_2_ = auVar728._12_2_ + auVar708._12_2_;
              auVar632._14_2_ = auVar728._14_2_ + auVar708._14_2_;
              auVar516._0_2_ = auVar709._0_2_ + auVar205._0_2_ + 0x40;
              auVar516._2_2_ = auVar709._2_2_ + auVar205._2_2_ + 0x40;
              auVar516._4_2_ = auVar709._4_2_ + auVar205._4_2_ + 0x40;
              auVar516._6_2_ = auVar709._6_2_ + auVar205._6_2_ + 0x40;
              auVar516._8_2_ = auVar709._8_2_ + auVar205._8_2_ + 0x40;
              auVar516._10_2_ = auVar709._10_2_ + auVar205._10_2_ + 0x40;
              auVar516._12_2_ = auVar709._12_2_ + auVar205._12_2_ + 0x40;
              auVar516._14_2_ = auVar709._14_2_ + auVar205._14_2_ + 0x40;
              auVar205 = paddsw(auVar516,auVar632);
              auVar205 = psraw(auVar205,7);
              sVar29 = auVar205._0_2_;
              sVar42 = auVar205._2_2_;
              sVar30 = auVar205._4_2_;
              sVar31 = auVar205._6_2_;
              sVar32 = auVar205._8_2_;
              sVar33 = auVar205._10_2_;
              sVar34 = auVar205._12_2_;
              sVar35 = auVar205._14_2_;
              *(ulong *)(*pauVar114 + lVar131) =
                   CONCAT17((0 < sVar35) * (sVar35 < 0x100) * auVar205[0xe] - (0xff < sVar35),
                            CONCAT16((0 < sVar34) * (sVar34 < 0x100) * auVar205[0xc] -
                                     (0xff < sVar34),
                                     CONCAT15((0 < sVar33) * (sVar33 < 0x100) * auVar205[10] -
                                              (0xff < sVar33),
                                              CONCAT14((0 < sVar32) * (sVar32 < 0x100) * auVar205[8]
                                                       - (0xff < sVar32),
                                                       CONCAT13((0 < sVar31) * (sVar31 < 0x100) *
                                                                auVar205[6] - (0xff < sVar31),
                                                                CONCAT12((0 < sVar30) *
                                                                         (sVar30 < 0x100) *
                                                                         auVar205[4] -
                                                                         (0xff < sVar30),
                                                                         CONCAT11((0 < sVar42) *
                                                                                  (sVar42 < 0x100) *
                                                                                  auVar205[2] -
                                                                                  (0xff < sVar42),
                                                                                  (0 < sVar29) *
                                                                                  (sVar29 < 0x100) *
                                                                                  auVar205[0] -
                                                                                  (0xff < sVar29))))
                                                      ))));
              lVar131 = lVar131 + 8;
            } while (uVar98 != (uint)lVar131);
            uVar140 = local_308._0_8_;
            if (0 < (int)uVar98) {
              lVar131 = 0;
              do {
                uVar127 = *(ulong *)(local_238 + lVar131);
                uVar141 = *(undefined8 *)(*pauVar130 + lVar131);
                auVar302._8_6_ = 0;
                auVar302._0_8_ = uVar127;
                auVar302[0xe] = (char)(uVar127 >> 0x38);
                auVar302[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar301._14_2_ = auVar302._14_2_;
                auVar301._8_5_ = 0;
                auVar301._0_8_ = uVar127;
                auVar301[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar300._13_3_ = auVar301._13_3_;
                auVar300._8_4_ = 0;
                auVar300._0_8_ = uVar127;
                auVar300[0xc] = (char)(uVar127 >> 0x30);
                auVar299._12_4_ = auVar300._12_4_;
                auVar299._8_3_ = 0;
                auVar299._0_8_ = uVar127;
                auVar299[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar298._11_5_ = auVar299._11_5_;
                auVar298._8_2_ = 0;
                auVar298._0_8_ = uVar127;
                auVar298[10] = (char)(uVar127 >> 0x28);
                auVar297._10_6_ = auVar298._10_6_;
                auVar297[8] = 0;
                auVar297._0_8_ = uVar127;
                auVar297[9] = (char)((ulong)uVar141 >> 0x20);
                auVar296._9_7_ = auVar297._9_7_;
                auVar296[8] = (char)(uVar127 >> 0x20);
                auVar296._0_8_ = uVar127;
                auVar295._8_8_ = auVar296._8_8_;
                auVar295[7] = (char)((ulong)uVar141 >> 0x18);
                auVar295[6] = (char)(uVar127 >> 0x18);
                auVar295[5] = (char)((ulong)uVar141 >> 0x10);
                auVar295[4] = (char)(uVar127 >> 0x10);
                auVar295[3] = (char)((ulong)uVar141 >> 8);
                auVar295[2] = (char)(uVar127 >> 8);
                auVar295[0] = (undefined1)uVar127;
                auVar295[1] = (char)uVar141;
                *(undefined1 (*) [16])(local_288 + lVar131 * 2) = auVar295;
                uVar127 = *(ulong *)(local_338._0_8_ + lVar131);
                uVar141 = *(undefined8 *)(puVar111 + lVar131);
                auVar407._8_6_ = 0;
                auVar407._0_8_ = uVar127;
                auVar407[0xe] = (char)(uVar127 >> 0x38);
                auVar407[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar406._14_2_ = auVar407._14_2_;
                auVar406._8_5_ = 0;
                auVar406._0_8_ = uVar127;
                auVar406[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar405._13_3_ = auVar406._13_3_;
                auVar405._8_4_ = 0;
                auVar405._0_8_ = uVar127;
                auVar405[0xc] = (char)(uVar127 >> 0x30);
                auVar404._12_4_ = auVar405._12_4_;
                auVar404._8_3_ = 0;
                auVar404._0_8_ = uVar127;
                auVar404[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar403._11_5_ = auVar404._11_5_;
                auVar403._8_2_ = 0;
                auVar403._0_8_ = uVar127;
                auVar403[10] = (char)(uVar127 >> 0x28);
                auVar402._10_6_ = auVar403._10_6_;
                auVar402[8] = 0;
                auVar402._0_8_ = uVar127;
                auVar402[9] = (char)((ulong)uVar141 >> 0x20);
                auVar401._9_7_ = auVar402._9_7_;
                auVar401[8] = (char)(uVar127 >> 0x20);
                auVar401._0_8_ = uVar127;
                auVar400._8_8_ = auVar401._8_8_;
                auVar400[7] = (char)((ulong)uVar141 >> 0x18);
                auVar400[6] = (char)(uVar127 >> 0x18);
                auVar400[5] = (char)((ulong)uVar141 >> 0x10);
                auVar400[4] = (char)(uVar127 >> 0x10);
                auVar400[3] = (char)((ulong)uVar141 >> 8);
                auVar400[2] = (char)(uVar127 >> 8);
                auVar400[0] = (undefined1)uVar127;
                auVar400[1] = (char)uVar141;
                uVar127 = *(ulong *)(lVar123 + lVar131);
                uVar141 = *(undefined8 *)(local_238 + lVar131);
                auVar524._8_6_ = 0;
                auVar524._0_8_ = uVar127;
                auVar524[0xe] = (char)(uVar127 >> 0x38);
                auVar524[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar523._14_2_ = auVar524._14_2_;
                auVar523._8_5_ = 0;
                auVar523._0_8_ = uVar127;
                auVar523[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar522._13_3_ = auVar523._13_3_;
                auVar522._8_4_ = 0;
                auVar522._0_8_ = uVar127;
                auVar522[0xc] = (char)(uVar127 >> 0x30);
                auVar521._12_4_ = auVar522._12_4_;
                auVar521._8_3_ = 0;
                auVar521._0_8_ = uVar127;
                auVar521[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar520._11_5_ = auVar521._11_5_;
                auVar520._8_2_ = 0;
                auVar520._0_8_ = uVar127;
                auVar520[10] = (char)(uVar127 >> 0x28);
                auVar519._10_6_ = auVar520._10_6_;
                auVar519[8] = 0;
                auVar519._0_8_ = uVar127;
                auVar519[9] = (char)((ulong)uVar141 >> 0x20);
                auVar518._9_7_ = auVar519._9_7_;
                auVar518[8] = (char)(uVar127 >> 0x20);
                auVar518._0_8_ = uVar127;
                auVar517._8_8_ = auVar518._8_8_;
                auVar517[7] = (char)((ulong)uVar141 >> 0x18);
                auVar517[6] = (char)(uVar127 >> 0x18);
                auVar517[5] = (char)((ulong)uVar141 >> 0x10);
                auVar517[4] = (char)(uVar127 >> 0x10);
                auVar517[3] = (char)((ulong)uVar141 >> 8);
                auVar517[2] = (char)(uVar127 >> 8);
                auVar517[0] = (undefined1)uVar127;
                auVar517[1] = (char)uVar141;
                uVar127 = *(ulong *)(local_248 + lVar131);
                uVar141 = *(undefined8 *)(puVar125 + lVar131);
                auVar310._8_6_ = 0;
                auVar310._0_8_ = uVar127;
                auVar310[0xe] = (char)(uVar127 >> 0x38);
                auVar310[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar309._14_2_ = auVar310._14_2_;
                auVar309._8_5_ = 0;
                auVar309._0_8_ = uVar127;
                auVar309[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar308._13_3_ = auVar309._13_3_;
                auVar308._8_4_ = 0;
                auVar308._0_8_ = uVar127;
                auVar308[0xc] = (char)(uVar127 >> 0x30);
                auVar307._12_4_ = auVar308._12_4_;
                auVar307._8_3_ = 0;
                auVar307._0_8_ = uVar127;
                auVar307[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar306._11_5_ = auVar307._11_5_;
                auVar306._8_2_ = 0;
                auVar306._0_8_ = uVar127;
                auVar306[10] = (char)(uVar127 >> 0x28);
                auVar305._10_6_ = auVar306._10_6_;
                auVar305[8] = 0;
                auVar305._0_8_ = uVar127;
                auVar305[9] = (char)((ulong)uVar141 >> 0x20);
                auVar304._9_7_ = auVar305._9_7_;
                auVar304[8] = (char)(uVar127 >> 0x20);
                auVar304._0_8_ = uVar127;
                auVar303._8_8_ = auVar304._8_8_;
                auVar303[7] = (char)((ulong)uVar141 >> 0x18);
                auVar303[6] = (char)(uVar127 >> 0x18);
                auVar303[5] = (char)((ulong)uVar141 >> 0x10);
                auVar303[4] = (char)(uVar127 >> 0x10);
                auVar303[3] = (char)((ulong)uVar141 >> 8);
                auVar303[2] = (char)(uVar127 >> 8);
                auVar303[0] = (undefined1)uVar127;
                auVar303[1] = (char)uVar141;
                uVar127 = *(ulong *)(local_228 + lVar131);
                uVar141 = *(undefined8 *)(puVar103 + lVar131);
                auVar640._8_6_ = 0;
                auVar640._0_8_ = uVar127;
                auVar640[0xe] = (char)(uVar127 >> 0x38);
                auVar640[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar639._14_2_ = auVar640._14_2_;
                auVar639._8_5_ = 0;
                auVar639._0_8_ = uVar127;
                auVar639[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar638._13_3_ = auVar639._13_3_;
                auVar638._8_4_ = 0;
                auVar638._0_8_ = uVar127;
                auVar638[0xc] = (char)(uVar127 >> 0x30);
                auVar637._12_4_ = auVar638._12_4_;
                auVar637._8_3_ = 0;
                auVar637._0_8_ = uVar127;
                auVar637[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar636._11_5_ = auVar637._11_5_;
                auVar636._8_2_ = 0;
                auVar636._0_8_ = uVar127;
                auVar636[10] = (char)(uVar127 >> 0x28);
                auVar635._10_6_ = auVar636._10_6_;
                auVar635[8] = 0;
                auVar635._0_8_ = uVar127;
                auVar635[9] = (char)((ulong)uVar141 >> 0x20);
                auVar634._9_7_ = auVar635._9_7_;
                auVar634[8] = (char)(uVar127 >> 0x20);
                auVar634._0_8_ = uVar127;
                auVar633._8_8_ = auVar634._8_8_;
                auVar633[7] = (char)((ulong)uVar141 >> 0x18);
                auVar633[6] = (char)(uVar127 >> 0x18);
                auVar633[5] = (char)((ulong)uVar141 >> 0x10);
                auVar633[4] = (char)(uVar127 >> 0x10);
                auVar633[3] = (char)((ulong)uVar141 >> 8);
                auVar633[2] = (char)(uVar127 >> 8);
                auVar633[0] = (undefined1)uVar127;
                auVar633[1] = (char)uVar141;
                auVar708 = pmaddubsw(auVar400,auVar144);
                auVar709 = pmaddubsw(auVar517,auVar192);
                auVar205 = pmaddubsw(auVar303,auVar193);
                auVar728 = pmaddubsw(auVar633,auVar155);
                auVar641._0_2_ = auVar728._0_2_ + auVar709._0_2_;
                auVar641._2_2_ = auVar728._2_2_ + auVar709._2_2_;
                auVar641._4_2_ = auVar728._4_2_ + auVar709._4_2_;
                auVar641._6_2_ = auVar728._6_2_ + auVar709._6_2_;
                auVar641._8_2_ = auVar728._8_2_ + auVar709._8_2_;
                auVar641._10_2_ = auVar728._10_2_ + auVar709._10_2_;
                auVar641._12_2_ = auVar728._12_2_ + auVar709._12_2_;
                auVar641._14_2_ = auVar728._14_2_ + auVar709._14_2_;
                auVar311._0_2_ = auVar205._0_2_ + auVar708._0_2_ + 0x40;
                auVar311._2_2_ = auVar205._2_2_ + auVar708._2_2_ + 0x40;
                auVar311._4_2_ = auVar205._4_2_ + auVar708._4_2_ + 0x40;
                auVar311._6_2_ = auVar205._6_2_ + auVar708._6_2_ + 0x40;
                auVar311._8_2_ = auVar205._8_2_ + auVar708._8_2_ + 0x40;
                auVar311._10_2_ = auVar205._10_2_ + auVar708._10_2_ + 0x40;
                auVar311._12_2_ = auVar205._12_2_ + auVar708._12_2_ + 0x40;
                auVar311._14_2_ = auVar205._14_2_ + auVar708._14_2_ + 0x40;
                auVar205 = paddsw(auVar311,auVar641);
                auVar205 = psraw(auVar205,7);
                sVar29 = auVar205._0_2_;
                sVar30 = auVar205._2_2_;
                sVar32 = auVar205._4_2_;
                sVar34 = auVar205._6_2_;
                sVar36 = auVar205._8_2_;
                sVar38 = auVar205._10_2_;
                sVar40 = auVar205._12_2_;
                sVar43 = auVar205._14_2_;
                uVar127 = *(ulong *)(*pauVar120 + lVar131);
                uVar141 = *(undefined8 *)(*pauVar133 + lVar131);
                auVar415._8_6_ = 0;
                auVar415._0_8_ = uVar127;
                auVar415[0xe] = (char)(uVar127 >> 0x38);
                auVar415[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar414._14_2_ = auVar415._14_2_;
                auVar414._8_5_ = 0;
                auVar414._0_8_ = uVar127;
                auVar414[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar413._13_3_ = auVar414._13_3_;
                auVar413._8_4_ = 0;
                auVar413._0_8_ = uVar127;
                auVar413[0xc] = (char)(uVar127 >> 0x30);
                auVar412._12_4_ = auVar413._12_4_;
                auVar412._8_3_ = 0;
                auVar412._0_8_ = uVar127;
                auVar412[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar411._11_5_ = auVar412._11_5_;
                auVar411._8_2_ = 0;
                auVar411._0_8_ = uVar127;
                auVar411[10] = (char)(uVar127 >> 0x28);
                auVar410._10_6_ = auVar411._10_6_;
                auVar410[8] = 0;
                auVar410._0_8_ = uVar127;
                auVar410[9] = (char)((ulong)uVar141 >> 0x20);
                auVar409._9_7_ = auVar410._9_7_;
                auVar409[8] = (char)(uVar127 >> 0x20);
                auVar409._0_8_ = uVar127;
                auVar408._8_8_ = auVar409._8_8_;
                auVar408[7] = (char)((ulong)uVar141 >> 0x18);
                auVar408[6] = (char)(uVar127 >> 0x18);
                auVar408[5] = (char)((ulong)uVar141 >> 0x10);
                auVar408[4] = (char)(uVar127 >> 0x10);
                auVar408[3] = (char)((ulong)uVar141 >> 8);
                auVar408[2] = (char)(uVar127 >> 8);
                auVar408[0] = (undefined1)uVar127;
                auVar408[1] = (char)uVar141;
                uVar127 = *(ulong *)(*pauVar126 + lVar131);
                uVar141 = *(undefined8 *)(*pauVar130 + lVar131);
                auVar532._8_6_ = 0;
                auVar532._0_8_ = uVar127;
                auVar532[0xe] = (char)(uVar127 >> 0x38);
                auVar532[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar531._14_2_ = auVar532._14_2_;
                auVar531._8_5_ = 0;
                auVar531._0_8_ = uVar127;
                auVar531[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar530._13_3_ = auVar531._13_3_;
                auVar530._8_4_ = 0;
                auVar530._0_8_ = uVar127;
                auVar530[0xc] = (char)(uVar127 >> 0x30);
                auVar529._12_4_ = auVar530._12_4_;
                auVar529._8_3_ = 0;
                auVar529._0_8_ = uVar127;
                auVar529[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar528._11_5_ = auVar529._11_5_;
                auVar528._8_2_ = 0;
                auVar528._0_8_ = uVar127;
                auVar528[10] = (char)(uVar127 >> 0x28);
                auVar527._10_6_ = auVar528._10_6_;
                auVar527[8] = 0;
                auVar527._0_8_ = uVar127;
                auVar527[9] = (char)((ulong)uVar141 >> 0x20);
                auVar526._9_7_ = auVar527._9_7_;
                auVar526[8] = (char)(uVar127 >> 0x20);
                auVar526._0_8_ = uVar127;
                auVar525._8_8_ = auVar526._8_8_;
                auVar525[7] = (char)((ulong)uVar141 >> 0x18);
                auVar525[6] = (char)(uVar127 >> 0x18);
                auVar525[5] = (char)((ulong)uVar141 >> 0x10);
                auVar525[4] = (char)(uVar127 >> 0x10);
                auVar525[3] = (char)((ulong)uVar141 >> 8);
                auVar525[2] = (char)(uVar127 >> 8);
                auVar525[0] = (undefined1)uVar127;
                auVar525[1] = (char)uVar141;
                uVar127 = *(ulong *)(puVar128 + lVar131);
                uVar141 = *(undefined8 *)(local_308._0_8_ + lVar131);
                auVar649._8_6_ = 0;
                auVar649._0_8_ = uVar127;
                auVar649[0xe] = (char)(uVar127 >> 0x38);
                auVar649[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar648._14_2_ = auVar649._14_2_;
                auVar648._8_5_ = 0;
                auVar648._0_8_ = uVar127;
                auVar648[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar647._13_3_ = auVar648._13_3_;
                auVar647._8_4_ = 0;
                auVar647._0_8_ = uVar127;
                auVar647[0xc] = (char)(uVar127 >> 0x30);
                auVar646._12_4_ = auVar647._12_4_;
                auVar646._8_3_ = 0;
                auVar646._0_8_ = uVar127;
                auVar646[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar645._11_5_ = auVar646._11_5_;
                auVar645._8_2_ = 0;
                auVar645._0_8_ = uVar127;
                auVar645[10] = (char)(uVar127 >> 0x28);
                auVar644._10_6_ = auVar645._10_6_;
                auVar644[8] = 0;
                auVar644._0_8_ = uVar127;
                auVar644[9] = (char)((ulong)uVar141 >> 0x20);
                auVar643._9_7_ = auVar644._9_7_;
                auVar643[8] = (char)(uVar127 >> 0x20);
                auVar643._0_8_ = uVar127;
                auVar642._8_8_ = auVar643._8_8_;
                auVar642[7] = (char)((ulong)uVar141 >> 0x18);
                auVar642[6] = (char)(uVar127 >> 0x18);
                auVar642[5] = (char)((ulong)uVar141 >> 0x10);
                auVar642[4] = (char)(uVar127 >> 0x10);
                auVar642[3] = (char)((ulong)uVar141 >> 8);
                auVar642[2] = (char)(uVar127 >> 8);
                auVar642[0] = (undefined1)uVar127;
                auVar642[1] = (char)uVar141;
                uVar127 = *(ulong *)(local_2f8._0_8_ + lVar131);
                uVar141 = *(undefined8 *)(*pauVar114 + lVar131);
                auVar681._8_6_ = 0;
                auVar681._0_8_ = uVar127;
                auVar681[0xe] = (char)(uVar127 >> 0x38);
                auVar681[0xf] = (char)((ulong)uVar141 >> 0x38);
                auVar680._14_2_ = auVar681._14_2_;
                auVar680._8_5_ = 0;
                auVar680._0_8_ = uVar127;
                auVar680[0xd] = (char)((ulong)uVar141 >> 0x30);
                auVar679._13_3_ = auVar680._13_3_;
                auVar679._8_4_ = 0;
                auVar679._0_8_ = uVar127;
                auVar679[0xc] = (char)(uVar127 >> 0x30);
                auVar678._12_4_ = auVar679._12_4_;
                auVar678._8_3_ = 0;
                auVar678._0_8_ = uVar127;
                auVar678[0xb] = (char)((ulong)uVar141 >> 0x28);
                auVar677._11_5_ = auVar678._11_5_;
                auVar677._8_2_ = 0;
                auVar677._0_8_ = uVar127;
                auVar677[10] = (char)(uVar127 >> 0x28);
                auVar676._10_6_ = auVar677._10_6_;
                auVar676[8] = 0;
                auVar676._0_8_ = uVar127;
                auVar676[9] = (char)((ulong)uVar141 >> 0x20);
                auVar675._9_7_ = auVar676._9_7_;
                auVar675[8] = (char)(uVar127 >> 0x20);
                auVar675._0_8_ = uVar127;
                auVar674._8_8_ = auVar675._8_8_;
                auVar674[7] = (char)((ulong)uVar141 >> 0x18);
                auVar674[6] = (char)(uVar127 >> 0x18);
                auVar674[5] = (char)((ulong)uVar141 >> 0x10);
                auVar674[4] = (char)(uVar127 >> 0x10);
                auVar674[3] = (char)((ulong)uVar141 >> 8);
                auVar674[2] = (char)(uVar127 >> 8);
                auVar674[0] = (undefined1)uVar127;
                auVar674[1] = (char)uVar141;
                auVar708 = pmaddubsw(auVar408,auVar144);
                auVar709 = pmaddubsw(auVar525,auVar192);
                auVar728 = pmaddubsw(auVar642,auVar193);
                auVar731 = pmaddubsw(auVar674,auVar155);
                auVar682._0_2_ = auVar731._0_2_ + auVar709._0_2_;
                auVar682._2_2_ = auVar731._2_2_ + auVar709._2_2_;
                auVar682._4_2_ = auVar731._4_2_ + auVar709._4_2_;
                auVar682._6_2_ = auVar731._6_2_ + auVar709._6_2_;
                auVar682._8_2_ = auVar731._8_2_ + auVar709._8_2_;
                auVar682._10_2_ = auVar731._10_2_ + auVar709._10_2_;
                auVar682._12_2_ = auVar731._12_2_ + auVar709._12_2_;
                auVar682._14_2_ = auVar731._14_2_ + auVar709._14_2_;
                auVar650._0_2_ = auVar728._0_2_ + auVar708._0_2_ + 0x40;
                auVar650._2_2_ = auVar728._2_2_ + auVar708._2_2_ + 0x40;
                auVar650._4_2_ = auVar728._4_2_ + auVar708._4_2_ + 0x40;
                auVar650._6_2_ = auVar728._6_2_ + auVar708._6_2_ + 0x40;
                auVar650._8_2_ = auVar728._8_2_ + auVar708._8_2_ + 0x40;
                auVar650._10_2_ = auVar728._10_2_ + auVar708._10_2_ + 0x40;
                auVar650._12_2_ = auVar728._12_2_ + auVar708._12_2_ + 0x40;
                auVar650._14_2_ = auVar728._14_2_ + auVar708._14_2_ + 0x40;
                auVar708 = paddsw(auVar650,auVar682);
                auVar708 = psraw(auVar708,7);
                sVar42 = auVar708._0_2_;
                sVar31 = auVar708._2_2_;
                sVar33 = auVar708._4_2_;
                sVar35 = auVar708._6_2_;
                sVar37 = auVar708._8_2_;
                sVar39 = auVar708._10_2_;
                sVar41 = auVar708._12_2_;
                sVar44 = auVar708._14_2_;
                puVar2 = puVar121 + lVar131 * 2;
                *puVar2 = (0 < sVar29) * (sVar29 < 0x100) * auVar205[0] - (0xff < sVar29);
                puVar2[1] = (0 < sVar42) * (sVar42 < 0x100) * auVar708[0] - (0xff < sVar42);
                puVar2[2] = (0 < sVar30) * (sVar30 < 0x100) * auVar205[2] - (0xff < sVar30);
                puVar2[3] = (0 < sVar31) * (sVar31 < 0x100) * auVar708[2] - (0xff < sVar31);
                puVar2[4] = (0 < sVar32) * (sVar32 < 0x100) * auVar205[4] - (0xff < sVar32);
                puVar2[5] = (0 < sVar33) * (sVar33 < 0x100) * auVar708[4] - (0xff < sVar33);
                puVar2[6] = (0 < sVar34) * (sVar34 < 0x100) * auVar205[6] - (0xff < sVar34);
                puVar2[7] = (0 < sVar35) * (sVar35 < 0x100) * auVar708[6] - (0xff < sVar35);
                puVar2[8] = (0 < sVar36) * (sVar36 < 0x100) * auVar205[8] - (0xff < sVar36);
                puVar2[9] = (0 < sVar37) * (sVar37 < 0x100) * auVar708[8] - (0xff < sVar37);
                puVar2[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar205[10] - (0xff < sVar38);
                puVar2[0xb] = (0 < sVar39) * (sVar39 < 0x100) * auVar708[10] - (0xff < sVar39);
                puVar2[0xc] = (0 < sVar40) * (sVar40 < 0x100) * auVar205[0xc] - (0xff < sVar40);
                puVar2[0xd] = (0 < sVar41) * (sVar41 < 0x100) * auVar708[0xc] - (0xff < sVar41);
                puVar2[0xe] = (0 < sVar43) * (sVar43 < 0x100) * auVar205[0xe] - (0xff < sVar43);
                puVar2[0xf] = (0 < sVar44) * (sVar44 < 0x100) * auVar708[0xe] - (0xff < sVar44);
                lVar131 = lVar131 + 8;
              } while (lVar131 < (int)uVar98);
            }
            local_238 = local_238 + lVar122;
            local_288 = local_288 + lVar102;
            puVar124 = puVar124 + lVar122;
            puVar121 = puVar121 + lVar102;
            puVar103 = puVar103 + lVar122;
            local_228 = local_228 + lVar122;
            puVar125 = puVar125 + lVar122;
            local_248 = local_248 + lVar122;
            lVar123 = lVar123 + lVar122;
            puVar111 = puVar111 + lVar122;
            local_338._0_8_ = local_338._0_8_ + lVar122;
            local_308._0_8_ = local_2f8._0_8_;
            local_2f8._0_8_ = pauVar114;
            iVar117 = iVar117 + -1;
            pauVar114 = pauVar120;
            pauVar120 = pauVar133;
            puVar128 = (undefined1 *)uVar140;
            pauVar133 = pauVar126;
          } while (iVar117 != 0);
        }
LAB_003ea65c:
        free(local_350);
        uVar127 = local_e0;
        auVar155 = _DAT_0050d570;
      }
    }
    uVar118 = uVar118 + 1;
  } while (uVar118 != uVar127);
LAB_003eabf6:
  aom_extend_frame_borders_c(dst,num_planes);
  return;
}

Assistant:

void av1_resize_and_extend_frame_ssse3(const YV12_BUFFER_CONFIG *src,
                                       YV12_BUFFER_CONFIG *dst,
                                       const InterpFilter filter,
                                       const int phase, const int num_planes) {
  bool has_normative_scaler =
      has_normative_scaler_ssse3(src->y_crop_width, src->y_crop_height,
                                 dst->y_crop_width, dst->y_crop_height);

  if (num_planes > 1) {
    has_normative_scaler =
        has_normative_scaler &&
        has_normative_scaler_ssse3(src->uv_crop_width, src->uv_crop_height,
                                   dst->uv_crop_width, dst->uv_crop_height);
  }

  if (!has_normative_scaler) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
    return;
  }

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  int malloc_failed = 0;
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const int src_y_w = (src->crop_widths[0] + 1) & ~1;
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    const int dst_y_w = (dst->crop_widths[0] + 1) & ~1;
    const int dst_y_h = (dst->crop_heights[0] + 1) & ~1;

    if (2 * dst_w == src_w && 2 * dst_h == src_h) {
      // 2 to 1
      if (phase == 0) {
        scale_plane_2_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_2_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 3) & ~3;
        const int buffer_height = (2 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_2_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == src_w && 4 * dst_h == src_h) {
      // 4 to 1
      if (phase == 0) {
        scale_plane_4_to_1_phase_0(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h);
      } else if (filter == BILINEAR) {
        const int16_t c0 = av1_bilinear_filters[phase][3];
        const int16_t c1 = av1_bilinear_filters[phase][4];
        const __m128i c0c1 = _mm_set1_epi16(c0 | (c1 << 8));  // c0 and c1 >= 0
        scale_plane_4_to_1_bilinear(src->buffers[i], src->strides[is_uv],
                                    dst->buffers[i], dst->strides[is_uv], dst_w,
                                    dst_h, c0c1);
      } else {
        const int buffer_stride = (dst_y_w + 1) & ~1;
        const int buffer_height = (4 * dst_y_h + SUBPEL_TAPS - 2 + 7) & ~7;
        // When dst_w is 1 or 2, we need extra padding to avoid heap read
        // overflow
        const int extra_padding = 16;
        uint8_t *const temp_buffer =
            (uint8_t *)malloc(buffer_stride * buffer_height + extra_padding);
        if (!temp_buffer) {
          malloc_failed = 1;
          break;
        }
        const InterpKernel *interp_kernel =
            (const InterpKernel *)av1_interp_filter_params_list[filter]
                .filter_ptr;
        scale_plane_4_to_1_general(src->buffers[i], src->strides[is_uv],
                                   dst->buffers[i], dst->strides[is_uv], dst_w,
                                   dst_h, interp_kernel[phase], temp_buffer);
        free(temp_buffer);
      }
    } else if (4 * dst_w == 3 * src_w && 4 * dst_h == 3 * src_h) {
      // 4 to 3
      const int buffer_stride_hor = (dst_y_w + 5) - ((dst_y_w + 5) % 6) + 2;
      const int buffer_stride_ver = (dst_y_w + 7) & ~7;
      const int buffer_height = (4 * dst_y_h / 3 + SUBPEL_TAPS - 1 + 7) & ~7;
      // When the vertical filter reads more pixels than the horizontal filter
      // generated in each row, we need extra padding to avoid heap read
      // overflow. For example, the horizontal filter generates 18 pixels but
      // the vertical filter reads 24 pixels in a row. The difference is
      // multiplied by 2 since two rows are interlaced together in the
      // optimization.
      const int extra_padding =
          (buffer_stride_ver > buffer_stride_hor)
              ? 2 * (buffer_stride_ver - buffer_stride_hor)
              : 0;
      const int buffer_size = buffer_stride_hor * buffer_height + extra_padding;
      uint8_t *const temp_buffer = (uint8_t *)malloc(buffer_size);
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_4_to_3_general(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], dst_w,
                                 dst_h, interp_kernel, phase, temp_buffer);
      free(temp_buffer);
    } else {
      assert(dst_w == src_w * 2 && dst_h == src_h * 2);
      // 1 to 2
      uint8_t *const temp_buffer = (uint8_t *)malloc(8 * ((src_y_w + 7) & ~7));
      if (!temp_buffer) {
        malloc_failed = 1;
        break;
      }
      const InterpKernel *interp_kernel =
          (const InterpKernel *)av1_interp_filter_params_list[filter]
              .filter_ptr;
      scale_plane_1_to_2_phase_0(src->buffers[i], src->strides[is_uv],
                                 dst->buffers[i], dst->strides[is_uv], src_w,
                                 src_h, interp_kernel[8], temp_buffer);
      free(temp_buffer);
    }
  }

  if (malloc_failed) {
    av1_resize_and_extend_frame_c(src, dst, filter, phase, num_planes);
  } else {
    aom_extend_frame_borders(dst, num_planes);
  }
}